

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# is_distinct_from.cpp
# Opt level: O1

idx_t duckdb::TemplatedDistinctSelectOperation<duckdb::DistinctGreaterThanNullsFirst>
                (Vector *left,Vector *right,optional_ptr<const_duckdb::SelectionVector,_true> sel,
                idx_t count,optional_ptr<duckdb::SelectionVector,_true> true_sel,
                optional_ptr<duckdb::SelectionVector,_true> false_sel,
                optional_ptr<duckdb::ValidityMask,_true> null_mask)

{
  SelectionVector *pSVar1;
  PhysicalType PVar2;
  VectorType VVar3;
  VectorType VVar4;
  unsigned_long *puVar5;
  uint *puVar6;
  short *psVar7;
  ushort *puVar8;
  byte *pbVar9;
  ulong *puVar10;
  data_ptr_t pdVar11;
  _Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_> _Var12;
  data_ptr_t pdVar13;
  unsigned_long *puVar14;
  byte bVar15;
  undefined1 auVar16 [16];
  undefined8 uVar17;
  element_type *peVar18;
  undefined1 auVar19 [8];
  undefined8 uVar20;
  ulong uVar21;
  Vector *pVVar22;
  idx_t iVar23;
  element_type *peVar24;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var25;
  TemplatedValidityData<unsigned_long> *pTVar26;
  reference pvVar27;
  type pVVar28;
  idx_t iVar29;
  NotImplementedException *this_01;
  InternalException *this_02;
  optional_ptr<duckdb::SelectionVector,_true> oVar30;
  ulong uVar31;
  optional_ptr<duckdb::ValidityMask,_true> oVar32;
  sel_t *psVar33;
  idx_t iVar34;
  idx_t iVar35;
  idx_t idx_in_entry;
  long *plVar36;
  ulong *puVar37;
  float *pfVar38;
  double *pdVar39;
  string_t *psVar40;
  uhugeint_t *puVar41;
  int iVar42;
  idx_t pos;
  int *piVar43;
  sel_t sVar44;
  undefined4 uVar45;
  size_type __n;
  UnifiedVectorFormat *slice_sel_00;
  optional_ptr<const_duckdb::SelectionVector,_true> oVar46;
  long lVar47;
  ulong uVar48;
  long lVar49;
  ulong uVar50;
  long lVar51;
  sel_t *psVar52;
  interval_t *input;
  ulong uVar53;
  long lVar54;
  int *piVar55;
  int iVar56;
  idx_t pos_1;
  sel_t *psVar57;
  sel_t *psVar58;
  sel_t *psVar59;
  ulong uVar60;
  ulong uVar61;
  float *pfVar62;
  double *pdVar63;
  string_t *psVar64;
  uhugeint_t *puVar65;
  long lVar66;
  long lVar67;
  bool bVar68;
  bool bVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  interval_t *input_1;
  UnifiedVectorFormat lvdata;
  UnifiedVectorFormat rvdata;
  SelectionVector lcursor;
  SelectionVector slice_sel;
  SelectionVector rcursor;
  SelectionVector true_sel_2;
  SelectionVector maybe_vec;
  Vector rchild;
  SelectionVector false_sel_1;
  SelectionVector true_sel_1;
  Vector lchild;
  UnifiedVectorFormat rvdata_1;
  OptionalSelection false_opt;
  UnifiedVectorFormat lvdata_1;
  OptionalSelection true_opt;
  SelectionVector false_vec;
  SelectionVector true_vec;
  Vector l_not_null;
  Vector r_not_null;
  optional_ptr<duckdb::ValidityMask,_true> local_4d8;
  sel_t *local_4d0;
  long local_4c8;
  sel_t *local_4b8;
  long local_4b0;
  undefined1 local_4a8 [8];
  LogicalType LStack_4a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_488;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_470;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_468;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_458;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_448;
  undefined1 local_438 [8];
  LogicalType LStack_430;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_418;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_400;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3d8;
  sel_t *local_3c8;
  optional_ptr<duckdb::ValidityMask,_true> local_3c0;
  SelectionVector local_3b8;
  SelectionVector local_3a0;
  sel_t *local_388;
  SelectionVector local_380;
  undefined1 local_368 [56];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_330;
  undefined1 local_328 [8];
  LogicalType aLStack_320 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c8;
  SelectionVector local_2b8;
  SelectionVector local_2a0;
  Vector local_288;
  optional_ptr<duckdb::SelectionVector,_true> local_218;
  optional_ptr<duckdb::SelectionVector,_true> local_210;
  optional_ptr<const_duckdb::SelectionVector,_true> local_208;
  UnifiedVectorFormat local_200;
  OptionalSelection local_1b8;
  UnifiedVectorFormat local_198;
  OptionalSelection local_150;
  SelectionVector local_130;
  SelectionVector local_118;
  Vector local_100;
  Vector local_98;
  
  PVar2 = (left->type).physical_type_;
  if (199 < PVar2) {
    if (PVar2 == VARCHAR) {
      local_328 = (undefined1  [8])null_mask.ptr;
      if (sel.ptr == (SelectionVector *)0x0) {
        sel.ptr = FlatVector::IncrementalSelectionVector();
      }
      if (local_328 != (undefined1  [8])0x0) {
        optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                  ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
        UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
        optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                  ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
        UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
      }
      VVar3 = left->vector_type;
      VVar4 = right->vector_type;
      if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar5 == (unsigned_long *)0x0) {
          bVar68 = false;
        }
        else {
          bVar68 = (*puVar5 & 1) == 0;
        }
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar5 == (unsigned_long *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = (*puVar5 & 1) == 0;
        }
        if ((bVar69 | bVar68) == 1) {
          bVar68 = (bool)(bVar68 ^ 1);
        }
        else {
          bVar68 = string_t::StringComparisonOperators::GreaterThan
                             ((string_t *)left->data,(string_t *)right->data);
        }
        if (bVar68 == false) {
          if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
            return (idx_t)(sel_t *)0x0;
          }
          psVar58 = (sel.ptr)->sel_vector;
          psVar33 = (false_sel.ptr)->sel_vector;
          iVar34 = 0;
          do {
            sVar44 = (sel_t)iVar34;
            if (psVar58 != (sel_t *)0x0) {
              sVar44 = psVar58[iVar34];
            }
            psVar33[iVar34] = sVar44;
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
          return (idx_t)(sel_t *)0x0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          psVar33 = (true_sel.ptr)->sel_vector;
          iVar34 = 0;
          do {
            sVar44 = (sel_t)iVar34;
            if (psVar58 != (sel_t *)0x0) {
              sVar44 = psVar58[iVar34];
            }
            psVar33[iVar34] = sVar44;
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
          return count;
        }
        return count;
      }
      if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
        psVar40 = (string_t *)left->data;
        psVar64 = (string_t *)right->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
          local_288._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_438,(unsigned_long *)&local_288);
          peVar18 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_438;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_430._0_8_;
          _local_438 = (undefined1  [16])0x0;
          LStack_4a0._0_8_ = auVar19;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
          }
          pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar26->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          local_4a8 = (undefined1  [8])
                      _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar47 = 0;
            if (count != 0) {
              uVar48 = 0;
              do {
                uVar31 = uVar48;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  uVar31 = (ulong)(sel.ptr)->sel_vector[uVar48];
                }
                if (local_4a8 == (undefined1  [8])0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (bool)(*(byte *)local_4a8 & 1);
                }
                puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
                }
                if (bVar68 == true && !bVar69) {
                  bVar68 = string_t::StringComparisonOperators::GreaterThan(psVar40,psVar64);
                }
                (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar31;
                lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
                uVar48 = uVar48 + 1;
                psVar64 = psVar64 + 1;
              } while (count != uVar48);
            }
            goto LAB_00b5e956;
          }
          if (count != 0) {
            uVar48 = 0;
            local_4d0 = (sel_t *)0x0;
            do {
              uVar31 = uVar48;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar31 = (ulong)(sel.ptr)->sel_vector[uVar48];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_4a8 & 1);
              }
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = string_t::StringComparisonOperators::GreaterThan(psVar40,psVar64);
              }
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar31;
              local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
              uVar48 = uVar48 + 1;
              psVar64 = psVar64 + 1;
              local_488._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_4a0.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar48);
            goto LAB_00b60c62;
          }
        }
        else if (count != 0) {
          lVar47 = 0;
          local_4d0 = (sel_t *)0x0;
          uVar48 = 0;
          do {
            uVar31 = uVar48;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar31 = (ulong)(sel.ptr)->sel_vector[uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = string_t::StringComparisonOperators::GreaterThan(psVar40,psVar64);
            }
            (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar31;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar31;
            lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
            uVar48 = uVar48 + 1;
            psVar64 = psVar64 + 1;
            local_488._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_4a0.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar48);
          goto LAB_00b60c62;
        }
      }
      else {
        if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
          if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
            psVar40 = (string_t *)left->data;
            psVar64 = (string_t *)right->data;
            FlatVector::VerifyFlatVector(left);
            FlatVector::VerifyFlatVector(right);
            if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
              if (count == 0) {
                return (idx_t)(sel_t *)0x0;
              }
              lVar47 = 0;
              local_4d0 = (sel_t *)0x0;
              uVar48 = 0;
              do {
                uVar31 = uVar48;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  uVar31 = (ulong)(sel.ptr)->sel_vector[uVar48];
                }
                puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
                }
                puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
                }
                if (bVar68 == true && !bVar69) {
                  bVar68 = string_t::StringComparisonOperators::GreaterThan(psVar40,psVar64);
                }
                (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar31;
                local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
                (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar31;
                lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
                uVar48 = uVar48 + 1;
                psVar40 = psVar40 + 1;
                psVar64 = psVar64 + 1;
              } while (count != uVar48);
              return (idx_t)local_4d0;
            }
            if (true_sel.ptr != (SelectionVector *)0x0) {
              if (count == 0) {
                return (idx_t)(sel_t *)0x0;
              }
              uVar48 = 0;
              local_4d0 = (sel_t *)0x0;
              do {
                uVar31 = uVar48;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  uVar31 = (ulong)(sel.ptr)->sel_vector[uVar48];
                }
                puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
                }
                puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
                }
                if (bVar68 == true && !bVar69) {
                  bVar68 = string_t::StringComparisonOperators::GreaterThan(psVar40,psVar64);
                }
                (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar31;
                local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
                uVar48 = uVar48 + 1;
                psVar40 = psVar40 + 1;
                psVar64 = psVar64 + 1;
              } while (count != uVar48);
              return (idx_t)local_4d0;
            }
            if (count != 0) {
              lVar47 = 0;
              uVar48 = 0;
              do {
                uVar31 = uVar48;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  uVar31 = (ulong)(sel.ptr)->sel_vector[uVar48];
                }
                puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
                }
                puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
                }
                if (bVar68 == true && !bVar69) {
                  bVar68 = string_t::StringComparisonOperators::GreaterThan(psVar40,psVar64);
                }
                (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar31;
                lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
                uVar48 = uVar48 + 1;
                psVar40 = psVar40 + 1;
                psVar64 = psVar64 + 1;
              } while (count != uVar48);
              goto LAB_00b63ebe;
            }
            goto LAB_00b629ee;
          }
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
          Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
          Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
          uVar17 = LStack_4a0._0_8_;
          uVar20 = LStack_430._0_8_;
          if (LStack_430.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0 &&
              LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
              if (true_sel.ptr == (SelectionVector *)0x0) {
                if (count == 0) goto LAB_00b63ca7;
                psVar58 = (sel.ptr)->sel_vector;
                lVar47 = *(long *)local_4a8;
                psVar33 = *(sel_t **)local_438;
                lVar49 = 0;
                iVar34 = 0;
                do {
                  iVar23 = iVar34;
                  if (psVar58 != (sel_t *)0x0) {
                    iVar23 = (idx_t)psVar58[iVar34];
                  }
                  iVar29 = iVar34;
                  if (lVar47 != 0) {
                    iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                  }
                  iVar35 = iVar34;
                  if (psVar33 != (sel_t *)0x0) {
                    iVar35 = (idx_t)psVar33[iVar34];
                  }
                  bVar68 = string_t::StringComparisonOperators::GreaterThan
                                     ((string_t *)(uVar17 + iVar29 * 0x10),
                                      (string_t *)(uVar20 + iVar35 * 0x10));
                  if (!bVar68) {
                    (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                    lVar49 = lVar49 + 1;
                  }
                  iVar34 = iVar34 + 1;
                } while (count != iVar34);
                goto LAB_00b63ca9;
              }
              if (count == 0) goto LAB_00b61f3a;
              psVar58 = (sel.ptr)->sel_vector;
              lVar47 = *(long *)local_4a8;
              psVar33 = *(sel_t **)local_438;
              iVar34 = 0;
              local_4d0 = (sel_t *)0x0;
              do {
                iVar23 = iVar34;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar34];
                }
                iVar29 = iVar34;
                if (lVar47 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar33 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar33[iVar34];
                }
                bVar68 = string_t::StringComparisonOperators::GreaterThan
                                   ((string_t *)(uVar17 + iVar29 * 0x10),
                                    (string_t *)(uVar20 + iVar35 * 0x10));
                if (bVar68) {
                  (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
                  local_4d0 = (sel_t *)((long)local_4d0 + 1);
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
            }
            else {
              if (count == 0) goto LAB_00b61f3a;
              psVar58 = (sel.ptr)->sel_vector;
              lVar47 = *(long *)local_4a8;
              psVar33 = *(sel_t **)local_438;
              local_4d0 = (sel_t *)0x0;
              iVar34 = 0;
              psVar59 = (sel_t *)0x0;
              do {
                iVar23 = iVar34;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar34];
                }
                iVar29 = iVar34;
                if (lVar47 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar33 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar33[iVar34];
                }
                bVar68 = string_t::StringComparisonOperators::GreaterThan
                                   ((string_t *)(uVar17 + iVar29 * 0x10),
                                    (string_t *)(uVar20 + iVar35 * 0x10));
                if (bVar68) {
                  psVar57 = local_4d0;
                  oVar30.ptr = true_sel.ptr;
                  psVar52 = psVar59;
                  local_4d0 = (sel_t *)((long)local_4d0 + 1);
                }
                else {
                  psVar52 = (sel_t *)((long)psVar59 + 1);
                  psVar57 = psVar59;
                  oVar30.ptr = false_sel.ptr;
                }
                (oVar30.ptr)->sel_vector[(long)psVar57] = (sel_t)iVar23;
                iVar34 = iVar34 + 1;
                psVar59 = psVar52;
              } while (count != iVar34);
            }
          }
          else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0
                  ) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_00b63ca7;
              psVar58 = (sel.ptr)->sel_vector;
              lVar47 = *(long *)local_4a8;
              psVar33 = *(sel_t **)local_438;
              lVar49 = 0;
              iVar34 = 0;
              do {
                iVar23 = iVar34;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar34];
                }
                iVar29 = iVar34;
                if (lVar47 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar33 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar33[iVar34];
                }
                if (LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) !=
                           0;
                }
                if (LStack_430.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f)
                           & 1) == 0;
                }
                if (bVar68 == true && !bVar69) {
                  bVar68 = string_t::StringComparisonOperators::GreaterThan
                                     ((string_t *)(uVar17 + iVar29 * 0x10),
                                      (string_t *)(uVar20 + iVar35 * 0x10));
                }
                if (bVar68 == false) {
                  (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                  lVar49 = lVar49 + 1;
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
              goto LAB_00b63ca9;
            }
            if (count == 0) goto LAB_00b61f3a;
            psVar58 = (sel.ptr)->sel_vector;
            lVar47 = *(long *)local_4a8;
            psVar33 = *(sel_t **)local_438;
            iVar34 = 0;
            local_4d0 = (sel_t *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar34];
              }
              iVar29 = iVar34;
              if (lVar47 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar33 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar33[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) != 0
                ;
              }
              if (LStack_430.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) &
                         1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = string_t::StringComparisonOperators::GreaterThan
                                   ((string_t *)(uVar17 + iVar29 * 0x10),
                                    (string_t *)(uVar20 + iVar35 * 0x10));
              }
              if (bVar68 != false) {
                (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
          }
          else {
            if (count == 0) goto LAB_00b61f3a;
            psVar58 = (sel.ptr)->sel_vector;
            lVar47 = *(long *)local_4a8;
            psVar33 = *(sel_t **)local_438;
            local_4d0 = (sel_t *)0x0;
            iVar34 = 0;
            psVar59 = (sel_t *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar34];
              }
              iVar29 = iVar34;
              if (lVar47 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar33 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar33[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) != 0
                ;
              }
              if (LStack_430.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) &
                         1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = string_t::StringComparisonOperators::GreaterThan
                                   ((string_t *)(uVar17 + iVar29 * 0x10),
                                    (string_t *)(uVar20 + iVar35 * 0x10));
              }
              if (bVar68 == false) {
                psVar52 = (sel_t *)((long)psVar59 + 1);
                psVar57 = psVar59;
                oVar30.ptr = false_sel.ptr;
              }
              else {
                psVar57 = local_4d0;
                oVar30.ptr = true_sel.ptr;
                psVar52 = psVar59;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              (oVar30.ptr)->sel_vector[(long)psVar57] = (sel_t)iVar23;
              iVar34 = iVar34 + 1;
              psVar59 = psVar52;
            } while (count != iVar34);
          }
          goto LAB_00b63cb6;
        }
        psVar40 = (string_t *)left->data;
        psVar64 = (string_t *)right->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
          local_288._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_438,(unsigned_long *)&local_288);
          peVar18 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_438;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_430._0_8_;
          _local_438 = (undefined1  [16])0x0;
          LStack_4a0._0_8_ = auVar19;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
          }
          pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar26->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          local_4a8 = (undefined1  [8])
                      _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b60c4d;
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar31 = uVar48;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar31 = (ulong)(sel.ptr)->sel_vector[uVar48];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_4a8 & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = string_t::StringComparisonOperators::GreaterThan(psVar40,psVar64);
              }
              (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar31;
              lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
              uVar48 = uVar48 + 1;
              psVar40 = psVar40 + 1;
            } while (count != uVar48);
            goto LAB_00b60c50;
          }
          if (count != 0) {
            uVar48 = 0;
            local_4d0 = (sel_t *)0x0;
            do {
              uVar31 = uVar48;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar31 = (ulong)(sel.ptr)->sel_vector[uVar48];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_4a8 & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = string_t::StringComparisonOperators::GreaterThan(psVar40,psVar64);
              }
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar31;
              local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
              uVar48 = uVar48 + 1;
              psVar40 = psVar40 + 1;
              local_488._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_4a0.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar48);
            goto LAB_00b60c62;
          }
        }
        else if (count != 0) {
          lVar47 = 0;
          local_4d0 = (sel_t *)0x0;
          uVar48 = 0;
          do {
            uVar31 = uVar48;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar31 = (ulong)(sel.ptr)->sel_vector[uVar48];
            }
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = string_t::StringComparisonOperators::GreaterThan(psVar40,psVar64);
            }
            (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar31;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar31;
            lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
            uVar48 = uVar48 + 1;
            psVar40 = psVar40 + 1;
            local_488._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_4a0.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar48);
          goto LAB_00b60c62;
        }
      }
    }
    else {
      if (PVar2 != UINT128) {
        if (PVar2 != INT128) goto switchD_00b54a14_caseD_a;
        local_328 = (undefined1  [8])null_mask.ptr;
        if (sel.ptr == (SelectionVector *)0x0) {
          sel.ptr = FlatVector::IncrementalSelectionVector();
        }
        if (local_328 != (undefined1  [8])0x0) {
          optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                    ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
          UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
          optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                    ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
          UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
        }
        VVar3 = left->vector_type;
        VVar4 = right->vector_type;
        if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar5 == (unsigned_long *)0x0) {
            bVar68 = false;
          }
          else {
            bVar68 = (*puVar5 & 1) == 0;
          }
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar5 == (unsigned_long *)0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = (*puVar5 & 1) == 0;
          }
          if ((bool)(bVar69 | bVar68)) {
            bVar68 = (bool)(bVar68 ^ 1);
          }
          else {
            uVar48 = *(ulong *)((long)left->data + 8);
            uVar31 = *(ulong *)((long)right->data + 8);
            bVar68 = *(ulong *)right->data < *(ulong *)left->data && uVar48 == uVar31 ||
                     uVar48 != uVar31 && (long)uVar31 <= (long)uVar48;
          }
          if (!bVar68) {
            if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            psVar33 = (false_sel.ptr)->sel_vector;
            iVar34 = 0;
            do {
              sVar44 = (sel_t)iVar34;
              if (psVar58 != (sel_t *)0x0) {
                sVar44 = psVar58[iVar34];
              }
              psVar33[iVar34] = sVar44;
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            return (idx_t)(sel_t *)0x0;
          }
          if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
            psVar58 = (sel.ptr)->sel_vector;
            psVar33 = (true_sel.ptr)->sel_vector;
            iVar34 = 0;
            do {
              sVar44 = (sel_t)iVar34;
              if (psVar58 != (sel_t *)0x0) {
                sVar44 = psVar58[iVar34];
              }
              psVar33[iVar34] = sVar44;
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            return count;
          }
          return count;
        }
        if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          puVar10 = (ulong *)left->data;
          pdVar11 = right->data;
          _local_4a8 = (undefined1  [16])0x0;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
            local_288._0_8_ = 0x800;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)local_438,(unsigned_long *)&local_288);
            peVar18 = LStack_4a0.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            auVar19 = local_438;
            LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)LStack_430._0_8_;
            _local_438 = (undefined1  [16])0x0;
            LStack_4a0._0_8_ = auVar19;
            if (peVar18 != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
            }
            pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                 (local_4a8 + 8));
            _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                 (pTVar26->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
            local_4a8 = (undefined1  [8])
                        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                 0xfffffffffffffffe;
          }
          FlatVector::VerifyFlatVector(right);
          local_118.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               LStack_4a0.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_00b60d2a;
              psVar58 = (sel.ptr)->sel_vector;
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              psVar33 = (false_sel.ptr)->sel_vector;
              puVar37 = (ulong *)(pdVar11 + 8);
              lVar47 = 0;
              uVar48 = 0;
              do {
                uVar31 = uVar48;
                if (psVar58 != (sel_t *)0x0) {
                  uVar31 = (ulong)psVar58[uVar48];
                }
                if (local_4a8 == (undefined1  [8])0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (bool)(*(byte *)local_4a8 & 1);
                }
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
                }
                if (bVar68 == true && !bVar69) {
                  uVar61 = puVar10[1];
                  uVar60 = *puVar37;
                  bVar68 = puVar37[-1] < *puVar10 && uVar61 == uVar60 ||
                           uVar61 != uVar60 && (long)uVar60 <= (long)uVar61;
                }
                psVar33[lVar47] = (sel_t)uVar31;
                lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
                uVar48 = uVar48 + 1;
                puVar37 = puVar37 + 2;
              } while (count != uVar48);
              goto LAB_00b60d2c;
            }
            if (count != 0) {
              psVar58 = (sel.ptr)->sel_vector;
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              psVar33 = (true_sel.ptr)->sel_vector;
              puVar37 = (ulong *)(pdVar11 + 8);
              uVar48 = 0;
              local_4d0 = (sel_t *)0x0;
              do {
                uVar31 = uVar48;
                if (psVar58 != (sel_t *)0x0) {
                  uVar31 = (ulong)psVar58[uVar48];
                }
                if (local_4a8 == (undefined1  [8])0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (bool)(*(byte *)local_4a8 & 1);
                }
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
                }
                if (bVar68 == true && !bVar69) {
                  uVar61 = puVar10[1];
                  uVar60 = *puVar37;
                  bVar68 = puVar37[-1] < *puVar10 && uVar61 == uVar60 ||
                           uVar61 != uVar60 && (long)uVar60 <= (long)uVar61;
                }
                psVar33[(long)local_4d0] = (sel_t)uVar31;
                local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
                uVar48 = uVar48 + 1;
                puVar37 = puVar37 + 2;
              } while (count != uVar48);
              goto LAB_00b60d3c;
            }
          }
          else if (count != 0) {
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar33 = (true_sel.ptr)->sel_vector;
            psVar59 = (false_sel.ptr)->sel_vector;
            puVar37 = (ulong *)(pdVar11 + 8);
            lVar47 = 0;
            local_4d0 = (sel_t *)0x0;
            uVar48 = 0;
            do {
              uVar31 = uVar48;
              if (psVar58 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar58[uVar48];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_4a8 & 1);
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                uVar61 = puVar10[1];
                uVar60 = *puVar37;
                bVar68 = puVar37[-1] < *puVar10 && uVar61 == uVar60 ||
                         uVar61 != uVar60 && (long)uVar60 <= (long)uVar61;
              }
              psVar33[(long)local_4d0] = (sel_t)uVar31;
              local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
              psVar59[lVar47] = (sel_t)uVar31;
              lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
              uVar48 = uVar48 + 1;
              puVar37 = puVar37 + 2;
            } while (count != uVar48);
            goto LAB_00b60d3c;
          }
        }
        else {
          if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
            if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
              pdVar11 = left->data;
              pdVar13 = right->data;
              FlatVector::VerifyFlatVector(left);
              FlatVector::VerifyFlatVector(right);
              if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0)
              {
                if (count == 0) {
                  return (idx_t)(sel_t *)0x0;
                }
                psVar33 = (sel.ptr)->sel_vector;
                puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                ;
                psVar59 = (true_sel.ptr)->sel_vector;
                psVar57 = (false_sel.ptr)->sel_vector;
                lVar47 = 8;
                lVar49 = 0;
                psVar58 = (sel_t *)0x0;
                uVar48 = 0;
                do {
                  uVar31 = uVar48;
                  if (psVar33 != (sel_t *)0x0) {
                    uVar31 = (ulong)psVar33[uVar48];
                  }
                  if (puVar5 == (unsigned_long *)0x0) {
                    bVar68 = true;
                  }
                  else {
                    bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
                  }
                  if (puVar14 == (unsigned_long *)0x0) {
                    bVar69 = false;
                  }
                  else {
                    bVar69 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
                  }
                  if (bVar68 == true && !bVar69) {
                    lVar51 = *(long *)(pdVar11 + lVar47);
                    lVar54 = *(long *)(pdVar13 + lVar47);
                    bVar68 = *(ulong *)(pdVar13 + lVar47 + -8) < *(ulong *)(pdVar11 + lVar47 + -8)
                             && lVar51 == lVar54 || lVar51 != lVar54 && lVar54 <= lVar51;
                  }
                  psVar59[(long)psVar58] = (sel_t)uVar31;
                  psVar58 = (sel_t *)((ulong)bVar68 + (long)psVar58);
                  psVar57[lVar49] = (sel_t)uVar31;
                  lVar49 = lVar49 + (ulong)(bVar68 ^ 1);
                  uVar48 = uVar48 + 1;
                  lVar47 = lVar47 + 0x10;
                } while (count != uVar48);
                return (idx_t)psVar58;
              }
              if (true_sel.ptr != (SelectionVector *)0x0) {
                if (count == 0) {
                  return (idx_t)(sel_t *)0x0;
                }
                psVar58 = (sel.ptr)->sel_vector;
                puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                ;
                psVar33 = (true_sel.ptr)->sel_vector;
                lVar47 = 8;
                uVar48 = 0;
                psVar59 = (sel_t *)0x0;
                do {
                  uVar31 = uVar48;
                  if (psVar58 != (sel_t *)0x0) {
                    uVar31 = (ulong)psVar58[uVar48];
                  }
                  if (puVar5 == (unsigned_long *)0x0) {
                    bVar68 = true;
                  }
                  else {
                    bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
                  }
                  if (puVar14 == (unsigned_long *)0x0) {
                    bVar69 = false;
                  }
                  else {
                    bVar69 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
                  }
                  if (bVar68 == true && !bVar69) {
                    lVar49 = *(long *)(pdVar11 + lVar47);
                    lVar51 = *(long *)(pdVar13 + lVar47);
                    bVar68 = *(ulong *)(pdVar13 + lVar47 + -8) < *(ulong *)(pdVar11 + lVar47 + -8)
                             && lVar49 == lVar51 || lVar49 != lVar51 && lVar51 <= lVar49;
                  }
                  psVar33[(long)psVar59] = (sel_t)uVar31;
                  psVar59 = (sel_t *)((long)psVar59 + (ulong)bVar68);
                  uVar48 = uVar48 + 1;
                  lVar47 = lVar47 + 0x10;
                } while (count != uVar48);
                return (idx_t)psVar59;
              }
              if (count != 0) {
                psVar58 = (sel.ptr)->sel_vector;
                puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                ;
                psVar33 = (false_sel.ptr)->sel_vector;
                lVar49 = 8;
                lVar47 = 0;
                uVar48 = 0;
                do {
                  uVar31 = uVar48;
                  if (psVar58 != (sel_t *)0x0) {
                    uVar31 = (ulong)psVar58[uVar48];
                  }
                  if (puVar5 == (unsigned_long *)0x0) {
                    bVar68 = true;
                  }
                  else {
                    bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
                  }
                  if (puVar14 == (unsigned_long *)0x0) {
                    bVar69 = false;
                  }
                  else {
                    bVar69 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
                  }
                  if (bVar68 == true && !bVar69) {
                    lVar51 = *(long *)(pdVar11 + lVar49);
                    lVar54 = *(long *)(pdVar13 + lVar49);
                    bVar68 = *(ulong *)(pdVar13 + lVar49 + -8) < *(ulong *)(pdVar11 + lVar49 + -8)
                             && lVar51 == lVar54 || lVar51 != lVar54 && lVar54 <= lVar51;
                  }
                  psVar33[lVar47] = (sel_t)uVar31;
                  lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
                  uVar48 = uVar48 + 1;
                  lVar49 = lVar49 + 0x10;
                } while (count != uVar48);
                goto LAB_00b62ac8;
              }
              goto LAB_00b62ac6;
            }
            UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
            UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
            Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
            Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0 &&
                LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
              {
                if (true_sel.ptr == (SelectionVector *)0x0) {
                  if (count == 0) goto LAB_00b63d82;
                  psVar58 = (sel.ptr)->sel_vector;
                  lVar47 = *(long *)local_4a8;
                  psVar33 = *(sel_t **)local_438;
                  lVar49 = 0;
                  iVar34 = 0;
                  do {
                    iVar23 = iVar34;
                    if (psVar58 != (sel_t *)0x0) {
                      iVar23 = (idx_t)psVar58[iVar34];
                    }
                    iVar29 = iVar34;
                    if (lVar47 != 0) {
                      iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                    }
                    iVar35 = iVar34;
                    if (psVar33 != (sel_t *)0x0) {
                      iVar35 = (idx_t)psVar33[iVar34];
                    }
                    if ((*(long *)(LStack_4a0._0_8_ + (iVar29 * 2 + 1) * 8) <=
                         *(long *)(LStack_430._0_8_ + iVar35 * 0x10 + 8)) &&
                       (*(ulong *)(LStack_4a0._0_8_ + iVar29 * 0x10) <=
                        *(ulong *)(LStack_430._0_8_ + iVar35 * 0x10) ||
                        *(long *)(LStack_4a0._0_8_ + (iVar29 * 2 + 1) * 8) !=
                        *(long *)(LStack_430._0_8_ + iVar35 * 0x10 + 8))) {
                      (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                      lVar49 = lVar49 + 1;
                    }
                    iVar34 = iVar34 + 1;
                  } while (count != iVar34);
                  goto LAB_00b63e71;
                }
                if (count == 0) goto LAB_00b620d9;
                psVar58 = (sel.ptr)->sel_vector;
                lVar47 = *(long *)local_4a8;
                psVar33 = *(sel_t **)local_438;
                iVar34 = 0;
                local_4d0 = (sel_t *)0x0;
                do {
                  iVar23 = iVar34;
                  if (psVar58 != (sel_t *)0x0) {
                    iVar23 = (idx_t)psVar58[iVar34];
                  }
                  iVar29 = iVar34;
                  if (lVar47 != 0) {
                    iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                  }
                  iVar35 = iVar34;
                  if (psVar33 != (sel_t *)0x0) {
                    iVar35 = (idx_t)psVar33[iVar34];
                  }
                  if ((*(long *)(LStack_430._0_8_ + iVar35 * 0x10 + 8) <
                       *(long *)(LStack_4a0._0_8_ + (iVar29 * 2 + 1) * 8)) ||
                     (*(ulong *)(LStack_430._0_8_ + iVar35 * 0x10) <
                      *(ulong *)(LStack_4a0._0_8_ + iVar29 * 0x10) &&
                      *(long *)(LStack_4a0._0_8_ + (iVar29 * 2 + 1) * 8) ==
                      *(long *)(LStack_430._0_8_ + iVar35 * 0x10 + 8))) {
                    (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
                    local_4d0 = (sel_t *)((long)local_4d0 + 1);
                  }
                  iVar34 = iVar34 + 1;
                } while (count != iVar34);
              }
              else {
                if (count == 0) goto LAB_00b620d9;
                psVar58 = (sel.ptr)->sel_vector;
                lVar47 = *(long *)local_4a8;
                psVar33 = *(sel_t **)local_438;
                iVar34 = 0;
                psVar59 = (sel_t *)0x0;
                psVar57 = (sel_t *)0x0;
                do {
                  iVar23 = iVar34;
                  if (psVar58 != (sel_t *)0x0) {
                    iVar23 = (idx_t)psVar58[iVar34];
                  }
                  iVar29 = iVar34;
                  if (lVar47 != 0) {
                    iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                  }
                  iVar35 = iVar34;
                  if (psVar33 != (sel_t *)0x0) {
                    iVar35 = (idx_t)psVar33[iVar34];
                  }
                  if ((*(long *)(LStack_430._0_8_ + iVar35 * 0x10 + 8) <
                       *(long *)(LStack_4a0._0_8_ + (iVar29 * 2 + 1) * 8)) ||
                     (*(ulong *)(LStack_430._0_8_ + iVar35 * 0x10) <
                      *(ulong *)(LStack_4a0._0_8_ + iVar29 * 0x10) &&
                      *(long *)(LStack_4a0._0_8_ + (iVar29 * 2 + 1) * 8) ==
                      *(long *)(LStack_430._0_8_ + iVar35 * 0x10 + 8))) {
                    local_4d0 = (sel_t *)((long)psVar57 + 1);
                    oVar30.ptr = true_sel.ptr;
                    psVar52 = psVar59;
                    psVar59 = psVar57;
                  }
                  else {
                    oVar30.ptr = false_sel.ptr;
                    psVar52 = (sel_t *)((long)psVar59 + 1);
                    local_4d0 = psVar57;
                  }
                  (oVar30.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
                  iVar34 = iVar34 + 1;
                  psVar59 = psVar52;
                  psVar57 = local_4d0;
                } while (count != iVar34);
              }
            }
            else if (false_sel.ptr == (SelectionVector *)0x0 ||
                     true_sel.ptr == (SelectionVector *)0x0) {
              if (true_sel.ptr == (SelectionVector *)0x0) {
                if (count == 0) goto LAB_00b63e6c;
                psVar58 = (sel.ptr)->sel_vector;
                lVar47 = *(long *)local_4a8;
                psVar33 = *(sel_t **)local_438;
                lVar49 = 0;
                iVar34 = 0;
                do {
                  iVar23 = iVar34;
                  if (psVar58 != (sel_t *)0x0) {
                    iVar23 = (idx_t)psVar58[iVar34];
                  }
                  iVar29 = iVar34;
                  if (lVar47 != 0) {
                    iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                  }
                  iVar35 = iVar34;
                  if (psVar33 != (sel_t *)0x0) {
                    iVar35 = (idx_t)psVar33[iVar34];
                  }
                  if (LStack_4a0.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      == (element_type *)0x0) {
                    bVar68 = true;
                  }
                  else {
                    bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1)
                             != 0;
                  }
                  if (LStack_430.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      == (element_type *)0x0) {
                    bVar69 = false;
                  }
                  else {
                    bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >>
                              (iVar35 & 0x3f) & 1) == 0;
                  }
                  if (bVar68 && !bVar69) {
                    uVar48 = ((ulong *)(LStack_4a0._0_8_ + iVar29 * 0x10))[1];
                    uVar31 = ((ulong *)(LStack_430._0_8_ + iVar35 * 0x10))[1];
                    bVar68 = *(ulong *)(LStack_430._0_8_ + iVar35 * 0x10) <
                             *(ulong *)(LStack_4a0._0_8_ + iVar29 * 0x10) && uVar48 == uVar31 ||
                             uVar48 != uVar31 && (long)uVar31 <= (long)uVar48;
                  }
                  if (!bVar68) {
                    (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                    lVar49 = lVar49 + 1;
                  }
                  iVar34 = iVar34 + 1;
                } while (count != iVar34);
                goto LAB_00b63e71;
              }
              if (count == 0) goto LAB_00b620d9;
              psVar58 = (sel.ptr)->sel_vector;
              lVar47 = *(long *)local_4a8;
              psVar33 = *(sel_t **)local_438;
              iVar34 = 0;
              local_4d0 = (sel_t *)0x0;
              do {
                iVar23 = iVar34;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar34];
                }
                iVar29 = iVar34;
                if (lVar47 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar33 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar33[iVar34];
                }
                if (LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) !=
                           0;
                }
                if (LStack_430.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f)
                           & 1) == 0;
                }
                if (bVar68 && !bVar69) {
                  uVar48 = ((ulong *)(LStack_4a0._0_8_ + iVar29 * 0x10))[1];
                  uVar31 = ((ulong *)(LStack_430._0_8_ + iVar35 * 0x10))[1];
                  bVar68 = *(ulong *)(LStack_430._0_8_ + iVar35 * 0x10) <
                           *(ulong *)(LStack_4a0._0_8_ + iVar29 * 0x10) && uVar48 == uVar31 ||
                           uVar48 != uVar31 && (long)uVar31 <= (long)uVar48;
                }
                if (bVar68) {
                  (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
                  local_4d0 = (sel_t *)((long)local_4d0 + 1);
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
            }
            else {
              if (count == 0) goto LAB_00b620d9;
              psVar58 = (sel.ptr)->sel_vector;
              lVar47 = *(long *)local_4a8;
              psVar33 = *(sel_t **)local_438;
              iVar34 = 0;
              psVar59 = (sel_t *)0x0;
              psVar57 = (sel_t *)0x0;
              do {
                iVar23 = iVar34;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar34];
                }
                iVar29 = iVar34;
                if (lVar47 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar33 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar33[iVar34];
                }
                if (LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) !=
                           0;
                }
                if (LStack_430.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f)
                           & 1) == 0;
                }
                if (bVar68 && !bVar69) {
                  uVar48 = ((ulong *)(LStack_4a0._0_8_ + iVar29 * 0x10))[1];
                  uVar31 = ((ulong *)(LStack_430._0_8_ + iVar35 * 0x10))[1];
                  bVar68 = *(ulong *)(LStack_430._0_8_ + iVar35 * 0x10) <
                           *(ulong *)(LStack_4a0._0_8_ + iVar29 * 0x10) && uVar48 == uVar31 ||
                           uVar48 != uVar31 && (long)uVar31 <= (long)uVar48;
                }
                if (bVar68) {
                  psVar52 = psVar59;
                  local_4d0 = (sel_t *)((long)psVar57 + 1);
                  psVar59 = psVar57;
                  oVar30.ptr = true_sel.ptr;
                }
                else {
                  psVar52 = (sel_t *)((long)psVar59 + 1);
                  local_4d0 = psVar57;
                  oVar30.ptr = false_sel.ptr;
                }
                (oVar30.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
                iVar34 = iVar34 + 1;
                psVar59 = psVar52;
                psVar57 = local_4d0;
              } while (count != iVar34);
            }
            goto LAB_00b63e74;
          }
          pdVar11 = left->data;
          puVar10 = (ulong *)right->data;
          _local_4a8 = (undefined1  [16])0x0;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
            local_288._0_8_ = 0x800;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)local_438,(unsigned_long *)&local_288);
            peVar18 = LStack_4a0.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            auVar19 = local_438;
            LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)LStack_430._0_8_;
            _local_438 = (undefined1  [16])0x0;
            LStack_4a0._0_8_ = auVar19;
            if (peVar18 != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
            }
            pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                 (local_4a8 + 8));
            _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                 (pTVar26->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
            local_4a8 = (undefined1  [8])
                        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                 0xfffffffffffffffe;
          }
          FlatVector::VerifyFlatVector(left);
          local_118.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               LStack_4a0.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_00b60d2a;
              psVar58 = (sel.ptr)->sel_vector;
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              psVar33 = (false_sel.ptr)->sel_vector;
              puVar37 = (ulong *)(pdVar11 + 8);
              lVar47 = 0;
              uVar48 = 0;
              do {
                uVar31 = uVar48;
                if (psVar58 != (sel_t *)0x0) {
                  uVar31 = (ulong)psVar58[uVar48];
                }
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
                }
                if (local_4a8 == (undefined1  [8])0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (*(byte *)local_4a8 & 1) == 0;
                }
                if (bVar68 == true && !bVar69) {
                  uVar61 = *puVar37;
                  uVar60 = puVar10[1];
                  bVar68 = *puVar10 < puVar37[-1] && uVar61 == uVar60 ||
                           uVar61 != uVar60 && (long)uVar60 <= (long)uVar61;
                }
                psVar33[lVar47] = (sel_t)uVar31;
                lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
                uVar48 = uVar48 + 1;
                puVar37 = puVar37 + 2;
              } while (count != uVar48);
              goto LAB_00b60d2c;
            }
            if (count != 0) {
              psVar58 = (sel.ptr)->sel_vector;
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              psVar33 = (true_sel.ptr)->sel_vector;
              puVar37 = (ulong *)(pdVar11 + 8);
              uVar48 = 0;
              local_4d0 = (sel_t *)0x0;
              do {
                uVar31 = uVar48;
                if (psVar58 != (sel_t *)0x0) {
                  uVar31 = (ulong)psVar58[uVar48];
                }
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
                }
                if (local_4a8 == (undefined1  [8])0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (*(byte *)local_4a8 & 1) == 0;
                }
                if (bVar68 == true && !bVar69) {
                  uVar61 = *puVar37;
                  uVar60 = puVar10[1];
                  bVar68 = *puVar10 < puVar37[-1] && uVar61 == uVar60 ||
                           uVar61 != uVar60 && (long)uVar60 <= (long)uVar61;
                }
                psVar33[(long)local_4d0] = (sel_t)uVar31;
                local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
                uVar48 = uVar48 + 1;
                puVar37 = puVar37 + 2;
              } while (count != uVar48);
              goto LAB_00b60d3c;
            }
          }
          else if (count != 0) {
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar33 = (true_sel.ptr)->sel_vector;
            psVar59 = (false_sel.ptr)->sel_vector;
            puVar37 = (ulong *)(pdVar11 + 8);
            lVar47 = 0;
            local_4d0 = (sel_t *)0x0;
            uVar48 = 0;
            do {
              uVar31 = uVar48;
              if (psVar58 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar58[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_4a8 & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                uVar61 = *puVar37;
                uVar60 = puVar10[1];
                bVar68 = *puVar10 < puVar37[-1] && uVar61 == uVar60 ||
                         uVar61 != uVar60 && (long)uVar60 <= (long)uVar61;
              }
              psVar33[(long)local_4d0] = (sel_t)uVar31;
              local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
              psVar59[lVar47] = (sel_t)uVar31;
              lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
              uVar48 = uVar48 + 1;
              puVar37 = puVar37 + 2;
            } while (count != uVar48);
            goto LAB_00b60d3c;
          }
        }
        goto LAB_00b5dfe5;
      }
      local_328 = (undefined1  [8])null_mask.ptr;
      if (sel.ptr == (SelectionVector *)0x0) {
        sel.ptr = FlatVector::IncrementalSelectionVector();
      }
      if (local_328 != (undefined1  [8])0x0) {
        optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                  ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
        UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
        optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                  ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
        UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
      }
      VVar3 = left->vector_type;
      VVar4 = right->vector_type;
      if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar5 == (unsigned_long *)0x0) {
          bVar68 = false;
        }
        else {
          bVar68 = (*puVar5 & 1) == 0;
        }
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar5 == (unsigned_long *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = (*puVar5 & 1) == 0;
        }
        if ((bVar69 | bVar68) == 1) {
          bVar68 = (bool)(bVar68 ^ 1);
        }
        else {
          bVar68 = uhugeint_t::operator>((uhugeint_t *)left->data,(uhugeint_t *)right->data);
        }
        if (bVar68 == false) {
          if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
            return (idx_t)(sel_t *)0x0;
          }
          psVar58 = (sel.ptr)->sel_vector;
          psVar33 = (false_sel.ptr)->sel_vector;
          iVar34 = 0;
          do {
            sVar44 = (sel_t)iVar34;
            if (psVar58 != (sel_t *)0x0) {
              sVar44 = psVar58[iVar34];
            }
            psVar33[iVar34] = sVar44;
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
          return (idx_t)(sel_t *)0x0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          psVar33 = (true_sel.ptr)->sel_vector;
          iVar34 = 0;
          do {
            sVar44 = (sel_t)iVar34;
            if (psVar58 != (sel_t *)0x0) {
              sVar44 = psVar58[iVar34];
            }
            psVar33[iVar34] = sVar44;
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
          return count;
        }
        return count;
      }
      if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
        puVar41 = (uhugeint_t *)left->data;
        puVar65 = (uhugeint_t *)right->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
          local_288._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_438,(unsigned_long *)&local_288);
          peVar18 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_438;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_430._0_8_;
          _local_438 = (undefined1  [16])0x0;
          LStack_4a0._0_8_ = auVar19;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
          }
          pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar26->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          local_4a8 = (undefined1  [8])
                      _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar47 = 0;
            if (count != 0) {
              uVar48 = 0;
              do {
                uVar31 = uVar48;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  uVar31 = (ulong)(sel.ptr)->sel_vector[uVar48];
                }
                if (local_4a8 == (undefined1  [8])0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (bool)(*(byte *)local_4a8 & 1);
                }
                puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
                }
                if (bVar68 == true && !bVar69) {
                  bVar68 = uhugeint_t::operator>(puVar41,puVar65);
                }
                (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar31;
                lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
                uVar48 = uVar48 + 1;
                puVar65 = puVar65 + 1;
              } while (count != uVar48);
            }
            goto LAB_00b5e956;
          }
          if (count != 0) {
            uVar48 = 0;
            local_4d0 = (sel_t *)0x0;
            do {
              uVar31 = uVar48;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar31 = (ulong)(sel.ptr)->sel_vector[uVar48];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_4a8 & 1);
              }
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = uhugeint_t::operator>(puVar41,puVar65);
              }
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar31;
              local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
              uVar48 = uVar48 + 1;
              puVar65 = puVar65 + 1;
              local_488._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_4a0.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar48);
            goto LAB_00b60c62;
          }
        }
        else if (count != 0) {
          lVar47 = 0;
          local_4d0 = (sel_t *)0x0;
          uVar48 = 0;
          do {
            uVar31 = uVar48;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar31 = (ulong)(sel.ptr)->sel_vector[uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = uhugeint_t::operator>(puVar41,puVar65);
            }
            (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar31;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar31;
            lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
            uVar48 = uVar48 + 1;
            puVar65 = puVar65 + 1;
            local_488._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_4a0.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar48);
          goto LAB_00b60c62;
        }
      }
      else {
        if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
          if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
            puVar41 = (uhugeint_t *)left->data;
            puVar65 = (uhugeint_t *)right->data;
            FlatVector::VerifyFlatVector(left);
            FlatVector::VerifyFlatVector(right);
            if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
              if (count == 0) {
                return (idx_t)(sel_t *)0x0;
              }
              lVar47 = 0;
              local_4d0 = (sel_t *)0x0;
              uVar48 = 0;
              do {
                uVar31 = uVar48;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  uVar31 = (ulong)(sel.ptr)->sel_vector[uVar48];
                }
                puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
                }
                puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
                }
                if (bVar68 == true && !bVar69) {
                  bVar68 = uhugeint_t::operator>(puVar41,puVar65);
                }
                (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar31;
                local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
                (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar31;
                lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
                uVar48 = uVar48 + 1;
                puVar41 = puVar41 + 1;
                puVar65 = puVar65 + 1;
              } while (count != uVar48);
              return (idx_t)local_4d0;
            }
            if (true_sel.ptr != (SelectionVector *)0x0) {
              if (count == 0) {
                return (idx_t)(sel_t *)0x0;
              }
              uVar48 = 0;
              local_4d0 = (sel_t *)0x0;
              do {
                uVar31 = uVar48;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  uVar31 = (ulong)(sel.ptr)->sel_vector[uVar48];
                }
                puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
                }
                puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
                }
                if (bVar68 == true && !bVar69) {
                  bVar68 = uhugeint_t::operator>(puVar41,puVar65);
                }
                (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar31;
                local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
                uVar48 = uVar48 + 1;
                puVar41 = puVar41 + 1;
                puVar65 = puVar65 + 1;
              } while (count != uVar48);
              return (idx_t)local_4d0;
            }
            if (count != 0) {
              lVar47 = 0;
              uVar48 = 0;
              do {
                uVar31 = uVar48;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  uVar31 = (ulong)(sel.ptr)->sel_vector[uVar48];
                }
                puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
                }
                puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
                }
                if (bVar68 == true && !bVar69) {
                  bVar68 = uhugeint_t::operator>(puVar41,puVar65);
                }
                (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar31;
                lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
                uVar48 = uVar48 + 1;
                puVar41 = puVar41 + 1;
                puVar65 = puVar65 + 1;
              } while (count != uVar48);
              goto LAB_00b63ebe;
            }
            goto LAB_00b629ee;
          }
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
          Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
          Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
          uVar17 = LStack_4a0._0_8_;
          uVar20 = LStack_430._0_8_;
          if (LStack_430.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0 &&
              LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
              if (true_sel.ptr == (SelectionVector *)0x0) {
                if (count == 0) goto LAB_00b63ca7;
                psVar58 = (sel.ptr)->sel_vector;
                lVar47 = *(long *)local_4a8;
                psVar33 = *(sel_t **)local_438;
                lVar49 = 0;
                iVar34 = 0;
                do {
                  iVar23 = iVar34;
                  if (psVar58 != (sel_t *)0x0) {
                    iVar23 = (idx_t)psVar58[iVar34];
                  }
                  iVar29 = iVar34;
                  if (lVar47 != 0) {
                    iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                  }
                  iVar35 = iVar34;
                  if (psVar33 != (sel_t *)0x0) {
                    iVar35 = (idx_t)psVar33[iVar34];
                  }
                  bVar68 = uhugeint_t::operator>
                                     ((uhugeint_t *)(uVar17 + iVar29 * 0x10),
                                      (uhugeint_t *)(uVar20 + iVar35 * 0x10));
                  if (!bVar68) {
                    (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                    lVar49 = lVar49 + 1;
                  }
                  iVar34 = iVar34 + 1;
                } while (count != iVar34);
                goto LAB_00b63ca9;
              }
              if (count == 0) goto LAB_00b61f3a;
              psVar58 = (sel.ptr)->sel_vector;
              lVar47 = *(long *)local_4a8;
              psVar33 = *(sel_t **)local_438;
              iVar34 = 0;
              local_4d0 = (sel_t *)0x0;
              do {
                iVar23 = iVar34;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar34];
                }
                iVar29 = iVar34;
                if (lVar47 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar33 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar33[iVar34];
                }
                bVar68 = uhugeint_t::operator>
                                   ((uhugeint_t *)(uVar17 + iVar29 * 0x10),
                                    (uhugeint_t *)(uVar20 + iVar35 * 0x10));
                if (bVar68) {
                  (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
                  local_4d0 = (sel_t *)((long)local_4d0 + 1);
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
            }
            else {
              if (count == 0) goto LAB_00b61f3a;
              psVar58 = (sel.ptr)->sel_vector;
              lVar47 = *(long *)local_4a8;
              psVar33 = *(sel_t **)local_438;
              local_4d0 = (sel_t *)0x0;
              iVar34 = 0;
              psVar59 = (sel_t *)0x0;
              do {
                iVar23 = iVar34;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar34];
                }
                iVar29 = iVar34;
                if (lVar47 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar33 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar33[iVar34];
                }
                bVar68 = uhugeint_t::operator>
                                   ((uhugeint_t *)(uVar17 + iVar29 * 0x10),
                                    (uhugeint_t *)(uVar20 + iVar35 * 0x10));
                if (bVar68) {
                  psVar57 = local_4d0;
                  oVar30.ptr = true_sel.ptr;
                  psVar52 = psVar59;
                  local_4d0 = (sel_t *)((long)local_4d0 + 1);
                }
                else {
                  psVar52 = (sel_t *)((long)psVar59 + 1);
                  psVar57 = psVar59;
                  oVar30.ptr = false_sel.ptr;
                }
                (oVar30.ptr)->sel_vector[(long)psVar57] = (sel_t)iVar23;
                iVar34 = iVar34 + 1;
                psVar59 = psVar52;
              } while (count != iVar34);
            }
          }
          else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0
                  ) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_00b63ca7;
              psVar58 = (sel.ptr)->sel_vector;
              lVar47 = *(long *)local_4a8;
              psVar33 = *(sel_t **)local_438;
              lVar49 = 0;
              iVar34 = 0;
              do {
                iVar23 = iVar34;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar34];
                }
                iVar29 = iVar34;
                if (lVar47 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar33 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar33[iVar34];
                }
                if (LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) !=
                           0;
                }
                if (LStack_430.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f)
                           & 1) == 0;
                }
                if (bVar68 == true && !bVar69) {
                  bVar68 = uhugeint_t::operator>
                                     ((uhugeint_t *)(uVar17 + iVar29 * 0x10),
                                      (uhugeint_t *)(uVar20 + iVar35 * 0x10));
                }
                if (bVar68 == false) {
                  (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                  lVar49 = lVar49 + 1;
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
              goto LAB_00b63ca9;
            }
            if (count == 0) goto LAB_00b61f3a;
            psVar58 = (sel.ptr)->sel_vector;
            lVar47 = *(long *)local_4a8;
            psVar33 = *(sel_t **)local_438;
            iVar34 = 0;
            local_4d0 = (sel_t *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar34];
              }
              iVar29 = iVar34;
              if (lVar47 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar33 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar33[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) != 0
                ;
              }
              if (LStack_430.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) &
                         1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = uhugeint_t::operator>
                                   ((uhugeint_t *)(uVar17 + iVar29 * 0x10),
                                    (uhugeint_t *)(uVar20 + iVar35 * 0x10));
              }
              if (bVar68 != false) {
                (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
          }
          else {
            if (count == 0) goto LAB_00b61f3a;
            psVar58 = (sel.ptr)->sel_vector;
            lVar47 = *(long *)local_4a8;
            psVar33 = *(sel_t **)local_438;
            local_4d0 = (sel_t *)0x0;
            iVar34 = 0;
            psVar59 = (sel_t *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar34];
              }
              iVar29 = iVar34;
              if (lVar47 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar33 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar33[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) != 0
                ;
              }
              if (LStack_430.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) &
                         1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = uhugeint_t::operator>
                                   ((uhugeint_t *)(uVar17 + iVar29 * 0x10),
                                    (uhugeint_t *)(uVar20 + iVar35 * 0x10));
              }
              if (bVar68 == false) {
                psVar52 = (sel_t *)((long)psVar59 + 1);
                psVar57 = psVar59;
                oVar30.ptr = false_sel.ptr;
              }
              else {
                psVar57 = local_4d0;
                oVar30.ptr = true_sel.ptr;
                psVar52 = psVar59;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              (oVar30.ptr)->sel_vector[(long)psVar57] = (sel_t)iVar23;
              iVar34 = iVar34 + 1;
              psVar59 = psVar52;
            } while (count != iVar34);
          }
          goto LAB_00b63cb6;
        }
        puVar41 = (uhugeint_t *)left->data;
        puVar65 = (uhugeint_t *)right->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
          local_288._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_438,(unsigned_long *)&local_288);
          peVar18 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_438;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_430._0_8_;
          _local_438 = (undefined1  [16])0x0;
          LStack_4a0._0_8_ = auVar19;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
          }
          pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar26->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          local_4a8 = (undefined1  [8])
                      _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b60c4d;
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar31 = uVar48;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar31 = (ulong)(sel.ptr)->sel_vector[uVar48];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_4a8 & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = uhugeint_t::operator>(puVar41,puVar65);
              }
              (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar31;
              lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
              uVar48 = uVar48 + 1;
              puVar41 = puVar41 + 1;
            } while (count != uVar48);
            goto LAB_00b60c50;
          }
          if (count != 0) {
            uVar48 = 0;
            local_4d0 = (sel_t *)0x0;
            do {
              uVar31 = uVar48;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar31 = (ulong)(sel.ptr)->sel_vector[uVar48];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_4a8 & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = uhugeint_t::operator>(puVar41,puVar65);
              }
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar31;
              local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
              uVar48 = uVar48 + 1;
              puVar41 = puVar41 + 1;
              local_488._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_4a0.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar48);
            goto LAB_00b60c62;
          }
        }
        else if (count != 0) {
          lVar47 = 0;
          local_4d0 = (sel_t *)0x0;
          uVar48 = 0;
          do {
            uVar31 = uVar48;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar31 = (ulong)(sel.ptr)->sel_vector[uVar48];
            }
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = uhugeint_t::operator>(puVar41,puVar65);
            }
            (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar31;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar31;
            lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
            uVar48 = uVar48 + 1;
            puVar41 = puVar41 + 1;
            local_488._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_4a0.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar48);
          goto LAB_00b60c62;
        }
      }
    }
    goto LAB_00b5df1f;
  }
  switch(PVar2) {
  case BOOL:
  case INT8:
    local_328 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (local_328 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar68 = false;
      }
      else {
        bVar68 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar69 = false;
      }
      else {
        bVar69 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar69 | bVar68)) {
        bVar68 = (bool)(bVar68 ^ 1);
      }
      else {
        bVar68 = (char)*right->data < (char)*left->data;
      }
      if (!bVar68) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(sel_t *)0x0;
        }
        psVar58 = (sel.ptr)->sel_vector;
        psVar33 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar58 != (sel_t *)0x0) {
            sVar44 = psVar58[iVar34];
          }
          psVar33[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return (idx_t)(sel_t *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        psVar33 = (true_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar58 != (sel_t *)0x0) {
            sVar44 = psVar58[iVar34];
          }
          psVar33[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      pdVar11 = left->data;
      pdVar13 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) {
LAB_00b60d2a:
            lVar47 = 0;
          }
          else {
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar33 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar31 = uVar48;
              if (psVar58 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar58[uVar48];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_4a8 & 1);
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = (char)pdVar13[uVar48] < (char)*pdVar11;
              }
              psVar33[lVar47] = (sel_t)uVar31;
              lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
          }
LAB_00b60d2c:
          local_4d0 = (sel_t *)(count - lVar47);
          local_118.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               LStack_4a0.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          goto LAB_00b60d3c;
        }
        if (count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar33 = (true_sel.ptr)->sel_vector;
          local_4d0 = (sel_t *)0x0;
          uVar48 = 0;
          do {
            uVar31 = uVar48;
            if (psVar58 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar58[uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = (char)pdVar13[uVar48] < (char)*pdVar11;
            }
            psVar33[(long)local_4d0] = (sel_t)uVar31;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_00b60d3c;
        }
      }
      else if (count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar33 = (true_sel.ptr)->sel_vector;
        psVar59 = (false_sel.ptr)->sel_vector;
        local_4d0 = (sel_t *)0x0;
        lVar47 = 0;
        uVar48 = 0;
        do {
          uVar31 = uVar48;
          if (psVar58 != (sel_t *)0x0) {
            uVar31 = (ulong)psVar58[uVar48];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (bool)(*(byte *)local_4a8 & 1);
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
          }
          if (bVar68 == true && !bVar69) {
            bVar68 = (char)pdVar13[uVar48] < (char)*pdVar11;
          }
          psVar33[(long)local_4d0] = (sel_t)uVar31;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          psVar59[lVar47] = (sel_t)uVar31;
          lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
          uVar48 = uVar48 + 1;
        } while (count != uVar48);
        goto LAB_00b60d3c;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar11 = left->data;
          pdVar13 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar33 = (true_sel.ptr)->sel_vector;
            psVar59 = (false_sel.ptr)->sel_vector;
            psVar57 = (sel_t *)0x0;
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar31 = uVar48;
              if (psVar58 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar58[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = (char)pdVar13[uVar48] < (char)pdVar11[uVar48];
              }
              psVar33[(long)psVar57] = (sel_t)uVar31;
              psVar57 = (sel_t *)((long)psVar57 + (ulong)bVar68);
              psVar59[lVar47] = (sel_t)uVar31;
              lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            return (idx_t)psVar57;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar33 = (true_sel.ptr)->sel_vector;
            psVar59 = (sel_t *)0x0;
            uVar48 = 0;
            do {
              uVar31 = uVar48;
              if (psVar58 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar58[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = (char)pdVar13[uVar48] < (char)pdVar11[uVar48];
              }
              psVar33[(long)psVar59] = (sel_t)uVar31;
              psVar59 = (sel_t *)((long)psVar59 + (ulong)bVar68);
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            return (idx_t)psVar59;
          }
          if (count != 0) {
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar33 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar31 = uVar48;
              if (psVar58 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar58[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = (char)pdVar13[uVar48] < (char)pdVar11[uVar48];
              }
              psVar33[lVar47] = (sel_t)uVar31;
              lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            goto LAB_00b62ac8;
          }
LAB_00b62ac6:
          lVar47 = 0;
LAB_00b62ac8:
          return (idx_t)(sel_t *)(count - lVar47);
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) {
LAB_00b63d82:
                lVar49 = 0;
              }
              else {
                psVar58 = (sel.ptr)->sel_vector;
                lVar47 = *(long *)local_4a8;
                psVar33 = *(sel_t **)local_438;
                lVar49 = 0;
                iVar34 = 0;
                do {
                  iVar23 = iVar34;
                  if (psVar58 != (sel_t *)0x0) {
                    iVar23 = (idx_t)psVar58[iVar34];
                  }
                  iVar29 = iVar34;
                  if (lVar47 != 0) {
                    iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                  }
                  iVar35 = iVar34;
                  if (psVar33 != (sel_t *)0x0) {
                    iVar35 = (idx_t)psVar33[iVar34];
                  }
                  if ((char)*(data_ptr_t)(LStack_4a0._0_8_ + iVar29) <=
                      (char)*(data_ptr_t)(LStack_430._0_8_ + iVar35)) {
                    (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                    lVar49 = lVar49 + 1;
                  }
                  iVar34 = iVar34 + 1;
                } while (count != iVar34);
              }
LAB_00b63e71:
              local_4d0 = (sel_t *)(count - lVar49);
            }
            else {
              if (count == 0) goto LAB_00b620d9;
              psVar58 = (sel.ptr)->sel_vector;
              lVar47 = *(long *)local_4a8;
              psVar33 = *(sel_t **)local_438;
              local_4d0 = (sel_t *)0x0;
              iVar34 = 0;
              do {
                iVar23 = iVar34;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar34];
                }
                iVar29 = iVar34;
                if (lVar47 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar33 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar33[iVar34];
                }
                if ((char)*(data_ptr_t)(LStack_430._0_8_ + iVar35) <
                    (char)*(data_ptr_t)(LStack_4a0._0_8_ + iVar29)) {
                  (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
                  local_4d0 = (sel_t *)((long)local_4d0 + 1);
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
            }
          }
          else if (count == 0) {
LAB_00b620d9:
            local_4d0 = (sel_t *)0x0;
          }
          else {
            psVar58 = (sel.ptr)->sel_vector;
            lVar47 = *(long *)local_4a8;
            psVar33 = *(sel_t **)local_438;
            local_4d0 = (sel_t *)0x0;
            iVar34 = 0;
            psVar59 = (sel_t *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar34];
              }
              iVar29 = iVar34;
              if (lVar47 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar33 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar33[iVar34];
              }
              if ((char)*(data_ptr_t)(LStack_430._0_8_ + iVar35) <
                  (char)*(data_ptr_t)(LStack_4a0._0_8_ + iVar29)) {
                oVar30.ptr = true_sel.ptr;
                psVar57 = psVar59;
                psVar59 = local_4d0;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              else {
                psVar57 = (sel_t *)((long)psVar59 + 1);
                oVar30.ptr = false_sel.ptr;
              }
              (oVar30.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
              iVar34 = iVar34 + 1;
              psVar59 = psVar57;
            } while (count != iVar34);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) {
LAB_00b63e6c:
              lVar49 = 0;
            }
            else {
              psVar58 = (sel.ptr)->sel_vector;
              lVar47 = *(long *)local_4a8;
              psVar33 = *(sel_t **)local_438;
              lVar49 = 0;
              iVar34 = 0;
              do {
                iVar23 = iVar34;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar34];
                }
                iVar29 = iVar34;
                if (lVar47 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar33 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar33[iVar34];
                }
                if (LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) !=
                           0;
                }
                if (LStack_430.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f)
                           & 1) == 0;
                }
                if (bVar68 && !bVar69) {
                  bVar68 = (char)*(data_ptr_t)(LStack_430._0_8_ + iVar35) <
                           (char)*(data_ptr_t)(LStack_4a0._0_8_ + iVar29);
                }
                if (!bVar68) {
                  (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                  lVar49 = lVar49 + 1;
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
            }
            goto LAB_00b63e71;
          }
          if (count == 0) goto LAB_00b620d9;
          psVar58 = (sel.ptr)->sel_vector;
          lVar47 = *(long *)local_4a8;
          psVar33 = *(sel_t **)local_438;
          local_4d0 = (sel_t *)0x0;
          iVar34 = 0;
          do {
            iVar23 = iVar34;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar34];
            }
            iVar29 = iVar34;
            if (lVar47 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar33 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar33[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) != 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if (bVar68 && !bVar69) {
              bVar68 = (char)*(data_ptr_t)(LStack_430._0_8_ + iVar35) <
                       (char)*(data_ptr_t)(LStack_4a0._0_8_ + iVar29);
            }
            if (bVar68) {
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
              local_4d0 = (sel_t *)((long)local_4d0 + 1);
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
        else {
          if (count == 0) goto LAB_00b620d9;
          psVar58 = (sel.ptr)->sel_vector;
          lVar47 = *(long *)local_4a8;
          psVar33 = *(sel_t **)local_438;
          iVar34 = 0;
          psVar59 = (sel_t *)0x0;
          psVar57 = (sel_t *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar34];
            }
            iVar29 = iVar34;
            if (lVar47 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar33 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar33[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) != 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if (bVar68 && !bVar69) {
              bVar68 = (char)*(data_ptr_t)(LStack_430._0_8_ + iVar35) <
                       (char)*(data_ptr_t)(LStack_4a0._0_8_ + iVar29);
            }
            if (bVar68) {
              psVar52 = psVar59;
              local_4d0 = (sel_t *)((long)psVar57 + 1);
              psVar59 = psVar57;
              oVar30.ptr = true_sel.ptr;
            }
            else {
              psVar52 = (sel_t *)((long)psVar59 + 1);
              local_4d0 = psVar57;
              oVar30.ptr = false_sel.ptr;
            }
            (oVar30.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
            iVar34 = iVar34 + 1;
            psVar59 = psVar52;
            psVar57 = local_4d0;
          } while (count != iVar34);
        }
LAB_00b63e74:
        if (local_3f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f8._M_pi);
        }
        if (local_418._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_418._M_pi);
        }
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             local_488._M_pi;
        if (local_468._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_468._M_pi);
          local_118.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               local_488._M_pi;
        }
        goto LAB_00b60d3c;
      }
      pdVar11 = left->data;
      pdVar13 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b60d2a;
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar33 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar31 = uVar48;
            if (psVar58 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar58[uVar48];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = (char)*pdVar13 < (char)pdVar11[uVar48];
            }
            psVar33[lVar47] = (sel_t)uVar31;
            lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_00b60d2c;
        }
        if (count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar33 = (true_sel.ptr)->sel_vector;
          local_4d0 = (sel_t *)0x0;
          uVar48 = 0;
          do {
            uVar31 = uVar48;
            if (psVar58 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar58[uVar48];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = (char)*pdVar13 < (char)pdVar11[uVar48];
            }
            psVar33[(long)local_4d0] = (sel_t)uVar31;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_00b60d3c;
        }
      }
      else if (count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar33 = (true_sel.ptr)->sel_vector;
        psVar59 = (false_sel.ptr)->sel_vector;
        local_4d0 = (sel_t *)0x0;
        lVar47 = 0;
        uVar48 = 0;
        do {
          uVar31 = uVar48;
          if (psVar58 != (sel_t *)0x0) {
            uVar31 = (ulong)psVar58[uVar48];
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (bVar68 == true && !bVar69) {
            bVar68 = (char)*pdVar13 < (char)pdVar11[uVar48];
          }
          psVar33[(long)local_4d0] = (sel_t)uVar31;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          psVar59[lVar47] = (sel_t)uVar31;
          lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
          uVar48 = uVar48 + 1;
        } while (count != uVar48);
        goto LAB_00b60d3c;
      }
    }
    break;
  case UINT8:
    local_328 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (local_328 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar68 = false;
      }
      else {
        bVar68 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar69 = false;
      }
      else {
        bVar69 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar69 | bVar68)) {
        bVar68 = (bool)(bVar68 ^ 1);
      }
      else {
        bVar68 = *right->data < *left->data;
      }
      if (!bVar68) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(sel_t *)0x0;
        }
        psVar58 = (sel.ptr)->sel_vector;
        psVar33 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar58 != (sel_t *)0x0) {
            sVar44 = psVar58[iVar34];
          }
          psVar33[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return (idx_t)(sel_t *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        psVar33 = (true_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar58 != (sel_t *)0x0) {
            sVar44 = psVar58[iVar34];
          }
          psVar33[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      pbVar9 = left->data;
      pdVar11 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b60d2a;
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar33 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar31 = uVar48;
            if (psVar58 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar58[uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = pdVar11[uVar48] < *pbVar9;
            }
            psVar33[lVar47] = (sel_t)uVar31;
            lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_00b60d2c;
        }
        if (count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar33 = (true_sel.ptr)->sel_vector;
          local_4d0 = (sel_t *)0x0;
          uVar48 = 0;
          do {
            uVar31 = uVar48;
            if (psVar58 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar58[uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = pdVar11[uVar48] < *pbVar9;
            }
            psVar33[(long)local_4d0] = (sel_t)uVar31;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_00b60d3c;
        }
      }
      else if (count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar33 = (true_sel.ptr)->sel_vector;
        psVar59 = (false_sel.ptr)->sel_vector;
        local_4d0 = (sel_t *)0x0;
        lVar47 = 0;
        uVar48 = 0;
        do {
          uVar31 = uVar48;
          if (psVar58 != (sel_t *)0x0) {
            uVar31 = (ulong)psVar58[uVar48];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (bool)(*(byte *)local_4a8 & 1);
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
          }
          if (bVar68 == true && !bVar69) {
            bVar68 = pdVar11[uVar48] < *pbVar9;
          }
          psVar33[(long)local_4d0] = (sel_t)uVar31;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          psVar59[lVar47] = (sel_t)uVar31;
          lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
          uVar48 = uVar48 + 1;
        } while (count != uVar48);
        goto LAB_00b60d3c;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar11 = left->data;
          pdVar13 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar33 = (true_sel.ptr)->sel_vector;
            psVar59 = (false_sel.ptr)->sel_vector;
            psVar57 = (sel_t *)0x0;
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar31 = uVar48;
              if (psVar58 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar58[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = pdVar13[uVar48] < pdVar11[uVar48];
              }
              psVar33[(long)psVar57] = (sel_t)uVar31;
              psVar57 = (sel_t *)((long)psVar57 + (ulong)bVar68);
              psVar59[lVar47] = (sel_t)uVar31;
              lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            return (idx_t)psVar57;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar33 = (true_sel.ptr)->sel_vector;
            psVar59 = (sel_t *)0x0;
            uVar48 = 0;
            do {
              uVar31 = uVar48;
              if (psVar58 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar58[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = pdVar13[uVar48] < pdVar11[uVar48];
              }
              psVar33[(long)psVar59] = (sel_t)uVar31;
              psVar59 = (sel_t *)((long)psVar59 + (ulong)bVar68);
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            return (idx_t)psVar59;
          }
          if (count != 0) {
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar33 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar31 = uVar48;
              if (psVar58 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar58[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = pdVar13[uVar48] < pdVar11[uVar48];
              }
              psVar33[lVar47] = (sel_t)uVar31;
              lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            goto LAB_00b62ac8;
          }
          goto LAB_00b62ac6;
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_00b63d82;
              psVar58 = (sel.ptr)->sel_vector;
              lVar47 = *(long *)local_4a8;
              psVar33 = *(sel_t **)local_438;
              lVar49 = 0;
              iVar34 = 0;
              do {
                iVar23 = iVar34;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar34];
                }
                iVar29 = iVar34;
                if (lVar47 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar33 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar33[iVar34];
                }
                if (*(byte *)(LStack_4a0._0_8_ + iVar29) <= *(byte *)(LStack_430._0_8_ + iVar35)) {
                  (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                  lVar49 = lVar49 + 1;
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
              goto LAB_00b63e71;
            }
            if (count == 0) goto LAB_00b620d9;
            psVar58 = (sel.ptr)->sel_vector;
            lVar47 = *(long *)local_4a8;
            psVar33 = *(sel_t **)local_438;
            iVar34 = 0;
            local_4d0 = (sel_t *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar34];
              }
              iVar29 = iVar34;
              if (lVar47 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar33 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar33[iVar34];
              }
              if (*(byte *)(LStack_430._0_8_ + iVar35) < *(byte *)(LStack_4a0._0_8_ + iVar29)) {
                (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
          }
          else {
            if (count == 0) goto LAB_00b620d9;
            psVar58 = (sel.ptr)->sel_vector;
            lVar47 = *(long *)local_4a8;
            psVar33 = *(sel_t **)local_438;
            local_4d0 = (sel_t *)0x0;
            iVar34 = 0;
            psVar59 = (sel_t *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar34];
              }
              iVar29 = iVar34;
              if (lVar47 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar33 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar33[iVar34];
              }
              if (*(byte *)(LStack_430._0_8_ + iVar35) < *(byte *)(LStack_4a0._0_8_ + iVar29)) {
                oVar30.ptr = true_sel.ptr;
                psVar57 = psVar59;
                psVar59 = local_4d0;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              else {
                psVar57 = (sel_t *)((long)psVar59 + 1);
                oVar30.ptr = false_sel.ptr;
              }
              (oVar30.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
              iVar34 = iVar34 + 1;
              psVar59 = psVar57;
            } while (count != iVar34);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b63e6c;
            psVar58 = (sel.ptr)->sel_vector;
            lVar47 = *(long *)local_4a8;
            psVar33 = *(sel_t **)local_438;
            lVar49 = 0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar34];
              }
              iVar29 = iVar34;
              if (lVar47 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar33 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar33[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) != 0
                ;
              }
              if (LStack_430.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) &
                         1) == 0;
              }
              if (bVar68 && !bVar69) {
                bVar68 = *(byte *)(LStack_430._0_8_ + iVar35) < *(byte *)(LStack_4a0._0_8_ + iVar29)
                ;
              }
              if (!bVar68) {
                (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                lVar49 = lVar49 + 1;
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            goto LAB_00b63e71;
          }
          if (count == 0) goto LAB_00b620d9;
          psVar58 = (sel.ptr)->sel_vector;
          lVar47 = *(long *)local_4a8;
          psVar33 = *(sel_t **)local_438;
          iVar34 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar34];
            }
            iVar29 = iVar34;
            if (lVar47 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar33 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar33[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) != 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if (bVar68 && !bVar69) {
              bVar68 = *(byte *)(LStack_430._0_8_ + iVar35) < *(byte *)(LStack_4a0._0_8_ + iVar29);
            }
            if (bVar68) {
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
              local_4d0 = (sel_t *)((long)local_4d0 + 1);
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
        else {
          if (count == 0) goto LAB_00b620d9;
          psVar58 = (sel.ptr)->sel_vector;
          lVar47 = *(long *)local_4a8;
          psVar33 = *(sel_t **)local_438;
          iVar34 = 0;
          psVar59 = (sel_t *)0x0;
          psVar57 = (sel_t *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar34];
            }
            iVar29 = iVar34;
            if (lVar47 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar33 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar33[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) != 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if (bVar68 && !bVar69) {
              bVar68 = *(byte *)(LStack_430._0_8_ + iVar35) < *(byte *)(LStack_4a0._0_8_ + iVar29);
            }
            if (bVar68) {
              psVar52 = psVar59;
              local_4d0 = (sel_t *)((long)psVar57 + 1);
              psVar59 = psVar57;
              oVar30.ptr = true_sel.ptr;
            }
            else {
              psVar52 = (sel_t *)((long)psVar59 + 1);
              local_4d0 = psVar57;
              oVar30.ptr = false_sel.ptr;
            }
            (oVar30.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
            iVar34 = iVar34 + 1;
            psVar59 = psVar52;
            psVar57 = local_4d0;
          } while (count != iVar34);
        }
        goto LAB_00b63e74;
      }
      pdVar11 = left->data;
      pbVar9 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b60d2a;
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar33 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar31 = uVar48;
            if (psVar58 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar58[uVar48];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = *pbVar9 < pdVar11[uVar48];
            }
            psVar33[lVar47] = (sel_t)uVar31;
            lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_00b60d2c;
        }
        if (count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar33 = (true_sel.ptr)->sel_vector;
          local_4d0 = (sel_t *)0x0;
          uVar48 = 0;
          do {
            uVar31 = uVar48;
            if (psVar58 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar58[uVar48];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = *pbVar9 < pdVar11[uVar48];
            }
            psVar33[(long)local_4d0] = (sel_t)uVar31;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_00b60d3c;
        }
      }
      else if (count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar33 = (true_sel.ptr)->sel_vector;
        psVar59 = (false_sel.ptr)->sel_vector;
        local_4d0 = (sel_t *)0x0;
        lVar47 = 0;
        uVar48 = 0;
        do {
          uVar31 = uVar48;
          if (psVar58 != (sel_t *)0x0) {
            uVar31 = (ulong)psVar58[uVar48];
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (bVar68 == true && !bVar69) {
            bVar68 = *pbVar9 < pdVar11[uVar48];
          }
          psVar33[(long)local_4d0] = (sel_t)uVar31;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          psVar59[lVar47] = (sel_t)uVar31;
          lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
          uVar48 = uVar48 + 1;
        } while (count != uVar48);
        goto LAB_00b60d3c;
      }
    }
    break;
  case UINT16:
    local_328 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (local_328 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar68 = false;
      }
      else {
        bVar68 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar69 = false;
      }
      else {
        bVar69 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar69 | bVar68)) {
        bVar68 = (bool)(bVar68 ^ 1);
      }
      else {
        bVar68 = *(ushort *)right->data < *(ushort *)left->data;
      }
      if (!bVar68) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(sel_t *)0x0;
        }
        psVar58 = (sel.ptr)->sel_vector;
        psVar33 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar58 != (sel_t *)0x0) {
            sVar44 = psVar58[iVar34];
          }
          psVar33[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return (idx_t)(sel_t *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        psVar33 = (true_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar58 != (sel_t *)0x0) {
            sVar44 = psVar58[iVar34];
          }
          psVar33[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      puVar8 = (ushort *)left->data;
      pdVar11 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b60d2a;
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar33 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar31 = uVar48;
            if (psVar58 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar58[uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = *(ushort *)(pdVar11 + uVar48 * 2) < *puVar8;
            }
            psVar33[lVar47] = (sel_t)uVar31;
            lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_00b60d2c;
        }
        if (count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar33 = (true_sel.ptr)->sel_vector;
          uVar48 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            uVar31 = uVar48;
            if (psVar58 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar58[uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = *(ushort *)(pdVar11 + uVar48 * 2) < *puVar8;
            }
            psVar33[(long)local_4d0] = (sel_t)uVar31;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_00b60d3c;
        }
      }
      else if (count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar33 = (true_sel.ptr)->sel_vector;
        psVar59 = (false_sel.ptr)->sel_vector;
        lVar47 = 0;
        local_4d0 = (sel_t *)0x0;
        uVar48 = 0;
        do {
          uVar31 = uVar48;
          if (psVar58 != (sel_t *)0x0) {
            uVar31 = (ulong)psVar58[uVar48];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (bool)(*(byte *)local_4a8 & 1);
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
          }
          if (bVar68 == true && !bVar69) {
            bVar68 = *(ushort *)(pdVar11 + uVar48 * 2) < *puVar8;
          }
          psVar33[(long)local_4d0] = (sel_t)uVar31;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          psVar59[lVar47] = (sel_t)uVar31;
          lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
          uVar48 = uVar48 + 1;
        } while (count != uVar48);
        goto LAB_00b60d3c;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar11 = left->data;
          pdVar13 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar33 = (true_sel.ptr)->sel_vector;
            psVar59 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            psVar57 = (sel_t *)0x0;
            uVar48 = 0;
            do {
              uVar31 = uVar48;
              if (psVar58 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar58[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = *(ushort *)(pdVar13 + uVar48 * 2) < *(ushort *)(pdVar11 + uVar48 * 2);
              }
              psVar33[(long)psVar57] = (sel_t)uVar31;
              psVar57 = (sel_t *)((long)psVar57 + (ulong)bVar68);
              psVar59[lVar47] = (sel_t)uVar31;
              lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            return (idx_t)psVar57;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar33 = (true_sel.ptr)->sel_vector;
            uVar48 = 0;
            psVar59 = (sel_t *)0x0;
            do {
              uVar31 = uVar48;
              if (psVar58 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar58[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = *(ushort *)(pdVar13 + uVar48 * 2) < *(ushort *)(pdVar11 + uVar48 * 2);
              }
              psVar33[(long)psVar59] = (sel_t)uVar31;
              psVar59 = (sel_t *)((long)psVar59 + (ulong)bVar68);
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            return (idx_t)psVar59;
          }
          if (count != 0) {
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar33 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar31 = uVar48;
              if (psVar58 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar58[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = *(ushort *)(pdVar13 + uVar48 * 2) < *(ushort *)(pdVar11 + uVar48 * 2);
              }
              psVar33[lVar47] = (sel_t)uVar31;
              lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            goto LAB_00b62ac8;
          }
          goto LAB_00b62ac6;
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_00b63d82;
              psVar58 = (sel.ptr)->sel_vector;
              lVar47 = *(long *)local_4a8;
              psVar33 = *(sel_t **)local_438;
              lVar49 = 0;
              iVar34 = 0;
              do {
                iVar23 = iVar34;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar34];
                }
                iVar29 = iVar34;
                if (lVar47 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar33 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar33[iVar34];
                }
                if (*(ushort *)(LStack_4a0._0_8_ + iVar29 * 2) <=
                    *(ushort *)(LStack_430._0_8_ + iVar35 * 2)) {
                  (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                  lVar49 = lVar49 + 1;
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
              goto LAB_00b63e71;
            }
            if (count == 0) goto LAB_00b620d9;
            psVar58 = (sel.ptr)->sel_vector;
            lVar47 = *(long *)local_4a8;
            psVar33 = *(sel_t **)local_438;
            iVar34 = 0;
            local_4d0 = (sel_t *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar34];
              }
              iVar29 = iVar34;
              if (lVar47 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar33 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar33[iVar34];
              }
              if (*(ushort *)(LStack_430._0_8_ + iVar35 * 2) <
                  *(ushort *)(LStack_4a0._0_8_ + iVar29 * 2)) {
                (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
          }
          else {
            if (count == 0) goto LAB_00b620d9;
            psVar58 = (sel.ptr)->sel_vector;
            lVar47 = *(long *)local_4a8;
            psVar33 = *(sel_t **)local_438;
            local_4d0 = (sel_t *)0x0;
            iVar34 = 0;
            psVar59 = (sel_t *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar34];
              }
              iVar29 = iVar34;
              if (lVar47 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar33 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar33[iVar34];
              }
              if (*(ushort *)(LStack_430._0_8_ + iVar35 * 2) <
                  *(ushort *)(LStack_4a0._0_8_ + iVar29 * 2)) {
                oVar30.ptr = true_sel.ptr;
                psVar57 = psVar59;
                psVar59 = local_4d0;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              else {
                psVar57 = (sel_t *)((long)psVar59 + 1);
                oVar30.ptr = false_sel.ptr;
              }
              (oVar30.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
              iVar34 = iVar34 + 1;
              psVar59 = psVar57;
            } while (count != iVar34);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b63e6c;
            psVar58 = (sel.ptr)->sel_vector;
            lVar47 = *(long *)local_4a8;
            psVar33 = *(sel_t **)local_438;
            lVar49 = 0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar34];
              }
              iVar29 = iVar34;
              if (lVar47 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar33 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar33[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) != 0
                ;
              }
              if (LStack_430.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) &
                         1) == 0;
              }
              if (bVar68 && !bVar69) {
                bVar68 = *(ushort *)(LStack_430._0_8_ + iVar35 * 2) <
                         *(ushort *)(LStack_4a0._0_8_ + iVar29 * 2);
              }
              if (!bVar68) {
                (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                lVar49 = lVar49 + 1;
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            goto LAB_00b63e71;
          }
          if (count == 0) goto LAB_00b620d9;
          psVar58 = (sel.ptr)->sel_vector;
          lVar47 = *(long *)local_4a8;
          psVar33 = *(sel_t **)local_438;
          iVar34 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar34];
            }
            iVar29 = iVar34;
            if (lVar47 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar33 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar33[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) != 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if (bVar68 && !bVar69) {
              bVar68 = *(ushort *)(LStack_430._0_8_ + iVar35 * 2) <
                       *(ushort *)(LStack_4a0._0_8_ + iVar29 * 2);
            }
            if (bVar68) {
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
              local_4d0 = (sel_t *)((long)local_4d0 + 1);
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
        else {
          if (count == 0) goto LAB_00b620d9;
          psVar58 = (sel.ptr)->sel_vector;
          lVar47 = *(long *)local_4a8;
          psVar33 = *(sel_t **)local_438;
          iVar34 = 0;
          psVar59 = (sel_t *)0x0;
          psVar57 = (sel_t *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar34];
            }
            iVar29 = iVar34;
            if (lVar47 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar33 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar33[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) != 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if (bVar68 && !bVar69) {
              bVar68 = *(ushort *)(LStack_430._0_8_ + iVar35 * 2) <
                       *(ushort *)(LStack_4a0._0_8_ + iVar29 * 2);
            }
            if (bVar68) {
              psVar52 = psVar59;
              local_4d0 = (sel_t *)((long)psVar57 + 1);
              psVar59 = psVar57;
              oVar30.ptr = true_sel.ptr;
            }
            else {
              psVar52 = (sel_t *)((long)psVar59 + 1);
              local_4d0 = psVar57;
              oVar30.ptr = false_sel.ptr;
            }
            (oVar30.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
            iVar34 = iVar34 + 1;
            psVar59 = psVar52;
            psVar57 = local_4d0;
          } while (count != iVar34);
        }
        goto LAB_00b63e74;
      }
      pdVar11 = left->data;
      puVar8 = (ushort *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b60d2a;
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar33 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar31 = uVar48;
            if (psVar58 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar58[uVar48];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = *puVar8 < *(ushort *)(pdVar11 + uVar48 * 2);
            }
            psVar33[lVar47] = (sel_t)uVar31;
            lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_00b60d2c;
        }
        if (count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar33 = (true_sel.ptr)->sel_vector;
          uVar48 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            uVar31 = uVar48;
            if (psVar58 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar58[uVar48];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = *puVar8 < *(ushort *)(pdVar11 + uVar48 * 2);
            }
            psVar33[(long)local_4d0] = (sel_t)uVar31;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_00b60d3c;
        }
      }
      else if (count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar33 = (true_sel.ptr)->sel_vector;
        psVar59 = (false_sel.ptr)->sel_vector;
        lVar47 = 0;
        local_4d0 = (sel_t *)0x0;
        uVar48 = 0;
        do {
          uVar31 = uVar48;
          if (psVar58 != (sel_t *)0x0) {
            uVar31 = (ulong)psVar58[uVar48];
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (bVar68 == true && !bVar69) {
            bVar68 = *puVar8 < *(ushort *)(pdVar11 + uVar48 * 2);
          }
          psVar33[(long)local_4d0] = (sel_t)uVar31;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          psVar59[lVar47] = (sel_t)uVar31;
          lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
          uVar48 = uVar48 + 1;
        } while (count != uVar48);
        goto LAB_00b60d3c;
      }
    }
    break;
  case INT16:
    local_328 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (local_328 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar68 = false;
      }
      else {
        bVar68 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar69 = false;
      }
      else {
        bVar69 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar69 | bVar68)) {
        bVar68 = (bool)(bVar68 ^ 1);
      }
      else {
        bVar68 = *(short *)right->data < *(short *)left->data;
      }
      if (!bVar68) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(sel_t *)0x0;
        }
        psVar58 = (sel.ptr)->sel_vector;
        psVar33 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar58 != (sel_t *)0x0) {
            sVar44 = psVar58[iVar34];
          }
          psVar33[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return (idx_t)(sel_t *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        psVar33 = (true_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar58 != (sel_t *)0x0) {
            sVar44 = psVar58[iVar34];
          }
          psVar33[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      psVar7 = (short *)left->data;
      pdVar11 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b60d2a;
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar33 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar31 = uVar48;
            if (psVar58 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar58[uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = *(short *)(pdVar11 + uVar48 * 2) < *psVar7;
            }
            psVar33[lVar47] = (sel_t)uVar31;
            lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_00b60d2c;
        }
        if (count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar33 = (true_sel.ptr)->sel_vector;
          local_4d0 = (sel_t *)0x0;
          uVar48 = 0;
          do {
            uVar31 = uVar48;
            if (psVar58 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar58[uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = *(short *)(pdVar11 + uVar48 * 2) < *psVar7;
            }
            psVar33[(long)local_4d0] = (sel_t)uVar31;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_00b60d3c;
        }
      }
      else if (count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar33 = (true_sel.ptr)->sel_vector;
        psVar59 = (false_sel.ptr)->sel_vector;
        local_4d0 = (sel_t *)0x0;
        lVar47 = 0;
        uVar48 = 0;
        do {
          uVar31 = uVar48;
          if (psVar58 != (sel_t *)0x0) {
            uVar31 = (ulong)psVar58[uVar48];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (bool)(*(byte *)local_4a8 & 1);
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
          }
          if (bVar68 == true && !bVar69) {
            bVar68 = *(short *)(pdVar11 + uVar48 * 2) < *psVar7;
          }
          psVar33[(long)local_4d0] = (sel_t)uVar31;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          psVar59[lVar47] = (sel_t)uVar31;
          lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
          uVar48 = uVar48 + 1;
        } while (count != uVar48);
        goto LAB_00b60d3c;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar11 = left->data;
          pdVar13 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar33 = (true_sel.ptr)->sel_vector;
            psVar59 = (false_sel.ptr)->sel_vector;
            psVar57 = (sel_t *)0x0;
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar31 = uVar48;
              if (psVar58 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar58[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = *(short *)(pdVar13 + uVar48 * 2) < *(short *)(pdVar11 + uVar48 * 2);
              }
              psVar33[(long)psVar57] = (sel_t)uVar31;
              psVar57 = (sel_t *)((long)psVar57 + (ulong)bVar68);
              psVar59[lVar47] = (sel_t)uVar31;
              lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            return (idx_t)psVar57;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar33 = (true_sel.ptr)->sel_vector;
            psVar59 = (sel_t *)0x0;
            uVar48 = 0;
            do {
              uVar31 = uVar48;
              if (psVar58 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar58[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = *(short *)(pdVar13 + uVar48 * 2) < *(short *)(pdVar11 + uVar48 * 2);
              }
              psVar33[(long)psVar59] = (sel_t)uVar31;
              psVar59 = (sel_t *)((long)psVar59 + (ulong)bVar68);
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            return (idx_t)psVar59;
          }
          if (count != 0) {
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar33 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar31 = uVar48;
              if (psVar58 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar58[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = *(short *)(pdVar13 + uVar48 * 2) < *(short *)(pdVar11 + uVar48 * 2);
              }
              psVar33[lVar47] = (sel_t)uVar31;
              lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            goto LAB_00b62ac8;
          }
          goto LAB_00b62ac6;
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_00b63d82;
              psVar58 = (sel.ptr)->sel_vector;
              lVar47 = *(long *)local_4a8;
              psVar33 = *(sel_t **)local_438;
              lVar49 = 0;
              iVar34 = 0;
              do {
                iVar23 = iVar34;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar34];
                }
                iVar29 = iVar34;
                if (lVar47 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar33 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar33[iVar34];
                }
                if (*(short *)(LStack_4a0._0_8_ + iVar29 * 2) <=
                    *(short *)(LStack_430._0_8_ + iVar35 * 2)) {
                  (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                  lVar49 = lVar49 + 1;
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
              goto LAB_00b63e71;
            }
            if (count == 0) goto LAB_00b620d9;
            psVar58 = (sel.ptr)->sel_vector;
            lVar47 = *(long *)local_4a8;
            psVar33 = *(sel_t **)local_438;
            local_4d0 = (sel_t *)0x0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar34];
              }
              iVar29 = iVar34;
              if (lVar47 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar33 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar33[iVar34];
              }
              if (*(short *)(LStack_430._0_8_ + iVar35 * 2) <
                  *(short *)(LStack_4a0._0_8_ + iVar29 * 2)) {
                (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
          }
          else {
            if (count == 0) goto LAB_00b620d9;
            psVar58 = (sel.ptr)->sel_vector;
            lVar47 = *(long *)local_4a8;
            psVar33 = *(sel_t **)local_438;
            local_4d0 = (sel_t *)0x0;
            iVar34 = 0;
            psVar59 = (sel_t *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar34];
              }
              iVar29 = iVar34;
              if (lVar47 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar33 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar33[iVar34];
              }
              if (*(short *)(LStack_430._0_8_ + iVar35 * 2) <
                  *(short *)(LStack_4a0._0_8_ + iVar29 * 2)) {
                oVar30.ptr = true_sel.ptr;
                psVar57 = psVar59;
                psVar59 = local_4d0;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              else {
                psVar57 = (sel_t *)((long)psVar59 + 1);
                oVar30.ptr = false_sel.ptr;
              }
              (oVar30.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
              iVar34 = iVar34 + 1;
              psVar59 = psVar57;
            } while (count != iVar34);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b63e6c;
            psVar58 = (sel.ptr)->sel_vector;
            lVar47 = *(long *)local_4a8;
            psVar33 = *(sel_t **)local_438;
            lVar49 = 0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar34];
              }
              iVar29 = iVar34;
              if (lVar47 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar33 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar33[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) != 0
                ;
              }
              if (LStack_430.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) &
                         1) == 0;
              }
              if (bVar68 && !bVar69) {
                bVar68 = *(short *)(LStack_430._0_8_ + iVar35 * 2) <
                         *(short *)(LStack_4a0._0_8_ + iVar29 * 2);
              }
              if (!bVar68) {
                (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                lVar49 = lVar49 + 1;
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            goto LAB_00b63e71;
          }
          if (count == 0) goto LAB_00b620d9;
          psVar58 = (sel.ptr)->sel_vector;
          lVar47 = *(long *)local_4a8;
          psVar33 = *(sel_t **)local_438;
          local_4d0 = (sel_t *)0x0;
          iVar34 = 0;
          do {
            iVar23 = iVar34;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar34];
            }
            iVar29 = iVar34;
            if (lVar47 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar33 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar33[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) != 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if (bVar68 && !bVar69) {
              bVar68 = *(short *)(LStack_430._0_8_ + iVar35 * 2) <
                       *(short *)(LStack_4a0._0_8_ + iVar29 * 2);
            }
            if (bVar68) {
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
              local_4d0 = (sel_t *)((long)local_4d0 + 1);
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
        else {
          if (count == 0) goto LAB_00b620d9;
          psVar58 = (sel.ptr)->sel_vector;
          lVar47 = *(long *)local_4a8;
          psVar33 = *(sel_t **)local_438;
          iVar34 = 0;
          psVar59 = (sel_t *)0x0;
          psVar57 = (sel_t *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar34];
            }
            iVar29 = iVar34;
            if (lVar47 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar33 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar33[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) != 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if (bVar68 && !bVar69) {
              bVar68 = *(short *)(LStack_430._0_8_ + iVar35 * 2) <
                       *(short *)(LStack_4a0._0_8_ + iVar29 * 2);
            }
            if (bVar68) {
              psVar52 = psVar59;
              local_4d0 = (sel_t *)((long)psVar57 + 1);
              psVar59 = psVar57;
              oVar30.ptr = true_sel.ptr;
            }
            else {
              psVar52 = (sel_t *)((long)psVar59 + 1);
              local_4d0 = psVar57;
              oVar30.ptr = false_sel.ptr;
            }
            (oVar30.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
            iVar34 = iVar34 + 1;
            psVar59 = psVar52;
            psVar57 = local_4d0;
          } while (count != iVar34);
        }
        goto LAB_00b63e74;
      }
      pdVar11 = left->data;
      psVar7 = (short *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b60d2a;
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar33 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar31 = uVar48;
            if (psVar58 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar58[uVar48];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = *psVar7 < *(short *)(pdVar11 + uVar48 * 2);
            }
            psVar33[lVar47] = (sel_t)uVar31;
            lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_00b60d2c;
        }
        if (count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar33 = (true_sel.ptr)->sel_vector;
          local_4d0 = (sel_t *)0x0;
          uVar48 = 0;
          do {
            uVar31 = uVar48;
            if (psVar58 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar58[uVar48];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = *psVar7 < *(short *)(pdVar11 + uVar48 * 2);
            }
            psVar33[(long)local_4d0] = (sel_t)uVar31;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_00b60d3c;
        }
      }
      else if (count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar33 = (true_sel.ptr)->sel_vector;
        psVar59 = (false_sel.ptr)->sel_vector;
        local_4d0 = (sel_t *)0x0;
        lVar47 = 0;
        uVar48 = 0;
        do {
          uVar31 = uVar48;
          if (psVar58 != (sel_t *)0x0) {
            uVar31 = (ulong)psVar58[uVar48];
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (bVar68 == true && !bVar69) {
            bVar68 = *psVar7 < *(short *)(pdVar11 + uVar48 * 2);
          }
          psVar33[(long)local_4d0] = (sel_t)uVar31;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          psVar59[lVar47] = (sel_t)uVar31;
          lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
          uVar48 = uVar48 + 1;
        } while (count != uVar48);
        goto LAB_00b60d3c;
      }
    }
    break;
  case UINT32:
    local_328 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (local_328 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar68 = false;
      }
      else {
        bVar68 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar69 = false;
      }
      else {
        bVar69 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar69 | bVar68)) {
        bVar68 = (bool)(bVar68 ^ 1);
      }
      else {
        bVar68 = *(uint *)right->data < *(uint *)left->data;
      }
      if (!bVar68) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(sel_t *)0x0;
        }
        psVar58 = (sel.ptr)->sel_vector;
        psVar33 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar58 != (sel_t *)0x0) {
            sVar44 = psVar58[iVar34];
          }
          psVar33[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return (idx_t)(sel_t *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        psVar33 = (true_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar58 != (sel_t *)0x0) {
            sVar44 = psVar58[iVar34];
          }
          psVar33[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      puVar6 = (uint *)left->data;
      pdVar11 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b60d2a;
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar33 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar31 = uVar48;
            if (psVar58 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar58[uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = *(uint *)(pdVar11 + uVar48 * 4) < *puVar6;
            }
            psVar33[lVar47] = (sel_t)uVar31;
            lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_00b60d2c;
        }
        if (count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar33 = (true_sel.ptr)->sel_vector;
          uVar48 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            uVar31 = uVar48;
            if (psVar58 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar58[uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = *(uint *)(pdVar11 + uVar48 * 4) < *puVar6;
            }
            psVar33[(long)local_4d0] = (sel_t)uVar31;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_00b60d3c;
        }
      }
      else if (count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar33 = (true_sel.ptr)->sel_vector;
        psVar59 = (false_sel.ptr)->sel_vector;
        lVar47 = 0;
        local_4d0 = (sel_t *)0x0;
        uVar48 = 0;
        do {
          uVar31 = uVar48;
          if (psVar58 != (sel_t *)0x0) {
            uVar31 = (ulong)psVar58[uVar48];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (bool)(*(byte *)local_4a8 & 1);
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
          }
          if (bVar68 == true && !bVar69) {
            bVar68 = *(uint *)(pdVar11 + uVar48 * 4) < *puVar6;
          }
          psVar33[(long)local_4d0] = (sel_t)uVar31;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          psVar59[lVar47] = (sel_t)uVar31;
          lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
          uVar48 = uVar48 + 1;
        } while (count != uVar48);
        goto LAB_00b60d3c;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar11 = left->data;
          pdVar13 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar33 = (true_sel.ptr)->sel_vector;
            psVar59 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            psVar57 = (sel_t *)0x0;
            uVar48 = 0;
            do {
              uVar31 = uVar48;
              if (psVar58 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar58[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = *(uint *)(pdVar13 + uVar48 * 4) < *(uint *)(pdVar11 + uVar48 * 4);
              }
              psVar33[(long)psVar57] = (sel_t)uVar31;
              psVar57 = (sel_t *)((long)psVar57 + (ulong)bVar68);
              psVar59[lVar47] = (sel_t)uVar31;
              lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            return (idx_t)psVar57;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar33 = (true_sel.ptr)->sel_vector;
            uVar48 = 0;
            psVar59 = (sel_t *)0x0;
            do {
              uVar31 = uVar48;
              if (psVar58 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar58[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = *(uint *)(pdVar13 + uVar48 * 4) < *(uint *)(pdVar11 + uVar48 * 4);
              }
              psVar33[(long)psVar59] = (sel_t)uVar31;
              psVar59 = (sel_t *)((long)psVar59 + (ulong)bVar68);
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            return (idx_t)psVar59;
          }
          if (count != 0) {
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar33 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar31 = uVar48;
              if (psVar58 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar58[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = *(uint *)(pdVar13 + uVar48 * 4) < *(uint *)(pdVar11 + uVar48 * 4);
              }
              psVar33[lVar47] = (sel_t)uVar31;
              lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            goto LAB_00b62ac8;
          }
          goto LAB_00b62ac6;
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_00b63d82;
              psVar58 = (sel.ptr)->sel_vector;
              lVar47 = *(long *)local_4a8;
              psVar33 = *(sel_t **)local_438;
              lVar49 = 0;
              iVar34 = 0;
              do {
                iVar23 = iVar34;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar34];
                }
                iVar29 = iVar34;
                if (lVar47 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar33 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar33[iVar34];
                }
                if (*(uint *)(LStack_4a0._0_8_ + iVar29 * 4) <=
                    *(uint *)(LStack_430._0_8_ + iVar35 * 4)) {
                  (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                  lVar49 = lVar49 + 1;
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
              goto LAB_00b63e71;
            }
            if (count == 0) goto LAB_00b620d9;
            psVar58 = (sel.ptr)->sel_vector;
            lVar47 = *(long *)local_4a8;
            psVar33 = *(sel_t **)local_438;
            iVar34 = 0;
            local_4d0 = (sel_t *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar34];
              }
              iVar29 = iVar34;
              if (lVar47 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar33 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar33[iVar34];
              }
              if (*(uint *)(LStack_430._0_8_ + iVar35 * 4) <
                  *(uint *)(LStack_4a0._0_8_ + iVar29 * 4)) {
                (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
          }
          else {
            if (count == 0) goto LAB_00b620d9;
            psVar58 = (sel.ptr)->sel_vector;
            lVar47 = *(long *)local_4a8;
            psVar33 = *(sel_t **)local_438;
            local_4d0 = (sel_t *)0x0;
            iVar34 = 0;
            psVar59 = (sel_t *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar34];
              }
              iVar29 = iVar34;
              if (lVar47 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar33 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar33[iVar34];
              }
              if (*(uint *)(LStack_430._0_8_ + iVar35 * 4) <
                  *(uint *)(LStack_4a0._0_8_ + iVar29 * 4)) {
                oVar30.ptr = true_sel.ptr;
                psVar57 = psVar59;
                psVar59 = local_4d0;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              else {
                psVar57 = (sel_t *)((long)psVar59 + 1);
                oVar30.ptr = false_sel.ptr;
              }
              (oVar30.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
              iVar34 = iVar34 + 1;
              psVar59 = psVar57;
            } while (count != iVar34);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b63e6c;
            psVar58 = (sel.ptr)->sel_vector;
            lVar47 = *(long *)local_4a8;
            psVar33 = *(sel_t **)local_438;
            lVar49 = 0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar34];
              }
              iVar29 = iVar34;
              if (lVar47 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar33 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar33[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) != 0
                ;
              }
              if (LStack_430.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) &
                         1) == 0;
              }
              if (bVar68 && !bVar69) {
                bVar68 = *(uint *)(LStack_430._0_8_ + iVar35 * 4) <
                         *(uint *)(LStack_4a0._0_8_ + iVar29 * 4);
              }
              if (!bVar68) {
                (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                lVar49 = lVar49 + 1;
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            goto LAB_00b63e71;
          }
          if (count == 0) goto LAB_00b620d9;
          psVar58 = (sel.ptr)->sel_vector;
          lVar47 = *(long *)local_4a8;
          psVar33 = *(sel_t **)local_438;
          iVar34 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar34];
            }
            iVar29 = iVar34;
            if (lVar47 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar33 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar33[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) != 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if (bVar68 && !bVar69) {
              bVar68 = *(uint *)(LStack_430._0_8_ + iVar35 * 4) <
                       *(uint *)(LStack_4a0._0_8_ + iVar29 * 4);
            }
            if (bVar68) {
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
              local_4d0 = (sel_t *)((long)local_4d0 + 1);
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
        else {
          if (count == 0) goto LAB_00b620d9;
          psVar58 = (sel.ptr)->sel_vector;
          lVar47 = *(long *)local_4a8;
          psVar33 = *(sel_t **)local_438;
          iVar34 = 0;
          psVar59 = (sel_t *)0x0;
          psVar57 = (sel_t *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar34];
            }
            iVar29 = iVar34;
            if (lVar47 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar33 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar33[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) != 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if (bVar68 && !bVar69) {
              bVar68 = *(uint *)(LStack_430._0_8_ + iVar35 * 4) <
                       *(uint *)(LStack_4a0._0_8_ + iVar29 * 4);
            }
            if (bVar68) {
              psVar52 = psVar59;
              local_4d0 = (sel_t *)((long)psVar57 + 1);
              psVar59 = psVar57;
              oVar30.ptr = true_sel.ptr;
            }
            else {
              psVar52 = (sel_t *)((long)psVar59 + 1);
              local_4d0 = psVar57;
              oVar30.ptr = false_sel.ptr;
            }
            (oVar30.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
            iVar34 = iVar34 + 1;
            psVar59 = psVar52;
            psVar57 = local_4d0;
          } while (count != iVar34);
        }
        goto LAB_00b63e74;
      }
      pdVar11 = left->data;
      puVar6 = (uint *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b60d2a;
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar33 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar31 = uVar48;
            if (psVar58 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar58[uVar48];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = *puVar6 < *(uint *)(pdVar11 + uVar48 * 4);
            }
            psVar33[lVar47] = (sel_t)uVar31;
            lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_00b60d2c;
        }
        if (count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar33 = (true_sel.ptr)->sel_vector;
          uVar48 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            uVar31 = uVar48;
            if (psVar58 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar58[uVar48];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = *puVar6 < *(uint *)(pdVar11 + uVar48 * 4);
            }
            psVar33[(long)local_4d0] = (sel_t)uVar31;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_00b60d3c;
        }
      }
      else if (count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar33 = (true_sel.ptr)->sel_vector;
        psVar59 = (false_sel.ptr)->sel_vector;
        lVar47 = 0;
        local_4d0 = (sel_t *)0x0;
        uVar48 = 0;
        do {
          uVar31 = uVar48;
          if (psVar58 != (sel_t *)0x0) {
            uVar31 = (ulong)psVar58[uVar48];
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (bVar68 == true && !bVar69) {
            bVar68 = *puVar6 < *(uint *)(pdVar11 + uVar48 * 4);
          }
          psVar33[(long)local_4d0] = (sel_t)uVar31;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          psVar59[lVar47] = (sel_t)uVar31;
          lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
          uVar48 = uVar48 + 1;
        } while (count != uVar48);
        goto LAB_00b60d3c;
      }
    }
    break;
  case INT32:
    local_328 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (local_328 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar68 = false;
      }
      else {
        bVar68 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar69 = false;
      }
      else {
        bVar69 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar69 | bVar68)) {
        bVar68 = (bool)(bVar68 ^ 1);
      }
      else {
        bVar68 = *(int *)right->data < *(int *)left->data;
      }
      if (!bVar68) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(sel_t *)0x0;
        }
        psVar58 = (sel.ptr)->sel_vector;
        psVar33 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar58 != (sel_t *)0x0) {
            sVar44 = psVar58[iVar34];
          }
          psVar33[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return (idx_t)(sel_t *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        psVar33 = (true_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar58 != (sel_t *)0x0) {
            sVar44 = psVar58[iVar34];
          }
          psVar33[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      piVar43 = (int *)left->data;
      pdVar11 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b60d2a;
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar33 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar31 = uVar48;
            if (psVar58 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar58[uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = *(int *)(pdVar11 + uVar48 * 4) < *piVar43;
            }
            psVar33[lVar47] = (sel_t)uVar31;
            lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_00b60d2c;
        }
        if (count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar33 = (true_sel.ptr)->sel_vector;
          local_4d0 = (sel_t *)0x0;
          uVar48 = 0;
          do {
            uVar31 = uVar48;
            if (psVar58 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar58[uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = *(int *)(pdVar11 + uVar48 * 4) < *piVar43;
            }
            psVar33[(long)local_4d0] = (sel_t)uVar31;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_00b60d3c;
        }
      }
      else if (count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar33 = (true_sel.ptr)->sel_vector;
        psVar59 = (false_sel.ptr)->sel_vector;
        local_4d0 = (sel_t *)0x0;
        lVar47 = 0;
        uVar48 = 0;
        do {
          uVar31 = uVar48;
          if (psVar58 != (sel_t *)0x0) {
            uVar31 = (ulong)psVar58[uVar48];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (bool)(*(byte *)local_4a8 & 1);
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
          }
          if (bVar68 == true && !bVar69) {
            bVar68 = *(int *)(pdVar11 + uVar48 * 4) < *piVar43;
          }
          psVar33[(long)local_4d0] = (sel_t)uVar31;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          psVar59[lVar47] = (sel_t)uVar31;
          lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
          uVar48 = uVar48 + 1;
        } while (count != uVar48);
        goto LAB_00b60d3c;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar11 = left->data;
          pdVar13 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar33 = (true_sel.ptr)->sel_vector;
            psVar59 = (false_sel.ptr)->sel_vector;
            psVar57 = (sel_t *)0x0;
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar31 = uVar48;
              if (psVar58 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar58[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = *(int *)(pdVar13 + uVar48 * 4) < *(int *)(pdVar11 + uVar48 * 4);
              }
              psVar33[(long)psVar57] = (sel_t)uVar31;
              psVar57 = (sel_t *)((long)psVar57 + (ulong)bVar68);
              psVar59[lVar47] = (sel_t)uVar31;
              lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            return (idx_t)psVar57;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar33 = (true_sel.ptr)->sel_vector;
            psVar59 = (sel_t *)0x0;
            uVar48 = 0;
            do {
              uVar31 = uVar48;
              if (psVar58 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar58[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = *(int *)(pdVar13 + uVar48 * 4) < *(int *)(pdVar11 + uVar48 * 4);
              }
              psVar33[(long)psVar59] = (sel_t)uVar31;
              psVar59 = (sel_t *)((long)psVar59 + (ulong)bVar68);
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            return (idx_t)psVar59;
          }
          if (count != 0) {
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar33 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar31 = uVar48;
              if (psVar58 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar58[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = *(int *)(pdVar13 + uVar48 * 4) < *(int *)(pdVar11 + uVar48 * 4);
              }
              psVar33[lVar47] = (sel_t)uVar31;
              lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            goto LAB_00b62ac8;
          }
          goto LAB_00b62ac6;
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_00b63d82;
              psVar58 = (sel.ptr)->sel_vector;
              lVar47 = *(long *)local_4a8;
              psVar33 = *(sel_t **)local_438;
              lVar49 = 0;
              iVar34 = 0;
              do {
                iVar23 = iVar34;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar34];
                }
                iVar29 = iVar34;
                if (lVar47 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar33 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar33[iVar34];
                }
                if (*(int *)(LStack_4a0._0_8_ + iVar29 * 4) <=
                    *(int *)(LStack_430._0_8_ + iVar35 * 4)) {
                  (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                  lVar49 = lVar49 + 1;
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
              goto LAB_00b63e71;
            }
            if (count == 0) goto LAB_00b620d9;
            psVar58 = (sel.ptr)->sel_vector;
            lVar47 = *(long *)local_4a8;
            psVar33 = *(sel_t **)local_438;
            local_4d0 = (sel_t *)0x0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar34];
              }
              iVar29 = iVar34;
              if (lVar47 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar33 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar33[iVar34];
              }
              if (*(int *)(LStack_430._0_8_ + iVar35 * 4) < *(int *)(LStack_4a0._0_8_ + iVar29 * 4))
              {
                (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
          }
          else {
            if (count == 0) goto LAB_00b620d9;
            psVar58 = (sel.ptr)->sel_vector;
            lVar47 = *(long *)local_4a8;
            psVar33 = *(sel_t **)local_438;
            local_4d0 = (sel_t *)0x0;
            iVar34 = 0;
            psVar59 = (sel_t *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar34];
              }
              iVar29 = iVar34;
              if (lVar47 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar33 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar33[iVar34];
              }
              if (*(int *)(LStack_430._0_8_ + iVar35 * 4) < *(int *)(LStack_4a0._0_8_ + iVar29 * 4))
              {
                oVar30.ptr = true_sel.ptr;
                psVar57 = psVar59;
                psVar59 = local_4d0;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              else {
                psVar57 = (sel_t *)((long)psVar59 + 1);
                oVar30.ptr = false_sel.ptr;
              }
              (oVar30.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
              iVar34 = iVar34 + 1;
              psVar59 = psVar57;
            } while (count != iVar34);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b63e6c;
            psVar58 = (sel.ptr)->sel_vector;
            lVar47 = *(long *)local_4a8;
            psVar33 = *(sel_t **)local_438;
            lVar49 = 0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar34];
              }
              iVar29 = iVar34;
              if (lVar47 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar33 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar33[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) != 0
                ;
              }
              if (LStack_430.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) &
                         1) == 0;
              }
              if (bVar68 && !bVar69) {
                bVar68 = *(int *)(LStack_430._0_8_ + iVar35 * 4) <
                         *(int *)(LStack_4a0._0_8_ + iVar29 * 4);
              }
              if (!bVar68) {
                (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                lVar49 = lVar49 + 1;
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            goto LAB_00b63e71;
          }
          if (count == 0) goto LAB_00b620d9;
          psVar58 = (sel.ptr)->sel_vector;
          lVar47 = *(long *)local_4a8;
          psVar33 = *(sel_t **)local_438;
          local_4d0 = (sel_t *)0x0;
          iVar34 = 0;
          do {
            iVar23 = iVar34;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar34];
            }
            iVar29 = iVar34;
            if (lVar47 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar33 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar33[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) != 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if (bVar68 && !bVar69) {
              bVar68 = *(int *)(LStack_430._0_8_ + iVar35 * 4) <
                       *(int *)(LStack_4a0._0_8_ + iVar29 * 4);
            }
            if (bVar68) {
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
              local_4d0 = (sel_t *)((long)local_4d0 + 1);
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
        else {
          if (count == 0) goto LAB_00b620d9;
          psVar58 = (sel.ptr)->sel_vector;
          lVar47 = *(long *)local_4a8;
          psVar33 = *(sel_t **)local_438;
          iVar34 = 0;
          psVar59 = (sel_t *)0x0;
          psVar57 = (sel_t *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar34];
            }
            iVar29 = iVar34;
            if (lVar47 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar33 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar33[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) != 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if (bVar68 && !bVar69) {
              bVar68 = *(int *)(LStack_430._0_8_ + iVar35 * 4) <
                       *(int *)(LStack_4a0._0_8_ + iVar29 * 4);
            }
            if (bVar68) {
              psVar52 = psVar59;
              local_4d0 = (sel_t *)((long)psVar57 + 1);
              psVar59 = psVar57;
              oVar30.ptr = true_sel.ptr;
            }
            else {
              psVar52 = (sel_t *)((long)psVar59 + 1);
              local_4d0 = psVar57;
              oVar30.ptr = false_sel.ptr;
            }
            (oVar30.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
            iVar34 = iVar34 + 1;
            psVar59 = psVar52;
            psVar57 = local_4d0;
          } while (count != iVar34);
        }
        goto LAB_00b63e74;
      }
      pdVar11 = left->data;
      piVar43 = (int *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b60d2a;
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar33 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar31 = uVar48;
            if (psVar58 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar58[uVar48];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = *piVar43 < *(int *)(pdVar11 + uVar48 * 4);
            }
            psVar33[lVar47] = (sel_t)uVar31;
            lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_00b60d2c;
        }
        if (count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar33 = (true_sel.ptr)->sel_vector;
          local_4d0 = (sel_t *)0x0;
          uVar48 = 0;
          do {
            uVar31 = uVar48;
            if (psVar58 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar58[uVar48];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = *piVar43 < *(int *)(pdVar11 + uVar48 * 4);
            }
            psVar33[(long)local_4d0] = (sel_t)uVar31;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_00b60d3c;
        }
      }
      else if (count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar33 = (true_sel.ptr)->sel_vector;
        psVar59 = (false_sel.ptr)->sel_vector;
        local_4d0 = (sel_t *)0x0;
        lVar47 = 0;
        uVar48 = 0;
        do {
          uVar31 = uVar48;
          if (psVar58 != (sel_t *)0x0) {
            uVar31 = (ulong)psVar58[uVar48];
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (bVar68 == true && !bVar69) {
            bVar68 = *piVar43 < *(int *)(pdVar11 + uVar48 * 4);
          }
          psVar33[(long)local_4d0] = (sel_t)uVar31;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          psVar59[lVar47] = (sel_t)uVar31;
          lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
          uVar48 = uVar48 + 1;
        } while (count != uVar48);
        goto LAB_00b60d3c;
      }
    }
    break;
  case UINT64:
    local_328 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (local_328 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar68 = false;
      }
      else {
        bVar68 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar69 = false;
      }
      else {
        bVar69 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar69 | bVar68)) {
        bVar68 = (bool)(bVar68 ^ 1);
      }
      else {
        bVar68 = *(ulong *)right->data < *(ulong *)left->data;
      }
      if (!bVar68) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(sel_t *)0x0;
        }
        psVar58 = (sel.ptr)->sel_vector;
        psVar33 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar58 != (sel_t *)0x0) {
            sVar44 = psVar58[iVar34];
          }
          psVar33[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return (idx_t)(sel_t *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        psVar33 = (true_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar58 != (sel_t *)0x0) {
            sVar44 = psVar58[iVar34];
          }
          psVar33[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      puVar10 = (ulong *)left->data;
      pdVar11 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b60d2a;
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar33 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar31 = uVar48;
            if (psVar58 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar58[uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = *(ulong *)(pdVar11 + uVar48 * 8) < *puVar10;
            }
            psVar33[lVar47] = (sel_t)uVar31;
            lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_00b60d2c;
        }
        if (count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar33 = (true_sel.ptr)->sel_vector;
          uVar48 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            uVar31 = uVar48;
            if (psVar58 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar58[uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = *(ulong *)(pdVar11 + uVar48 * 8) < *puVar10;
            }
            psVar33[(long)local_4d0] = (sel_t)uVar31;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_00b60d3c;
        }
      }
      else if (count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar33 = (true_sel.ptr)->sel_vector;
        psVar59 = (false_sel.ptr)->sel_vector;
        lVar47 = 0;
        local_4d0 = (sel_t *)0x0;
        uVar48 = 0;
        do {
          uVar31 = uVar48;
          if (psVar58 != (sel_t *)0x0) {
            uVar31 = (ulong)psVar58[uVar48];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (bool)(*(byte *)local_4a8 & 1);
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
          }
          if (bVar68 == true && !bVar69) {
            bVar68 = *(ulong *)(pdVar11 + uVar48 * 8) < *puVar10;
          }
          psVar33[(long)local_4d0] = (sel_t)uVar31;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          psVar59[lVar47] = (sel_t)uVar31;
          lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
          uVar48 = uVar48 + 1;
        } while (count != uVar48);
        goto LAB_00b60d3c;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar11 = left->data;
          pdVar13 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar33 = (true_sel.ptr)->sel_vector;
            psVar59 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            psVar57 = (sel_t *)0x0;
            uVar48 = 0;
            do {
              uVar31 = uVar48;
              if (psVar58 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar58[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = *(ulong *)(pdVar13 + uVar48 * 8) < *(ulong *)(pdVar11 + uVar48 * 8);
              }
              psVar33[(long)psVar57] = (sel_t)uVar31;
              psVar57 = (sel_t *)((long)psVar57 + (ulong)bVar68);
              psVar59[lVar47] = (sel_t)uVar31;
              lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            return (idx_t)psVar57;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar33 = (true_sel.ptr)->sel_vector;
            uVar48 = 0;
            psVar59 = (sel_t *)0x0;
            do {
              uVar31 = uVar48;
              if (psVar58 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar58[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = *(ulong *)(pdVar13 + uVar48 * 8) < *(ulong *)(pdVar11 + uVar48 * 8);
              }
              psVar33[(long)psVar59] = (sel_t)uVar31;
              psVar59 = (sel_t *)((long)psVar59 + (ulong)bVar68);
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            return (idx_t)psVar59;
          }
          if (count != 0) {
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar33 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar31 = uVar48;
              if (psVar58 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar58[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = *(ulong *)(pdVar13 + uVar48 * 8) < *(ulong *)(pdVar11 + uVar48 * 8);
              }
              psVar33[lVar47] = (sel_t)uVar31;
              lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            goto LAB_00b62ac8;
          }
          goto LAB_00b62ac6;
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_00b63d82;
              psVar58 = (sel.ptr)->sel_vector;
              lVar47 = *(long *)local_4a8;
              psVar33 = *(sel_t **)local_438;
              lVar49 = 0;
              iVar34 = 0;
              do {
                iVar23 = iVar34;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar34];
                }
                iVar29 = iVar34;
                if (lVar47 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar33 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar33[iVar34];
                }
                if (*(ulong *)(LStack_4a0._0_8_ + iVar29 * 8) <=
                    *(ulong *)(LStack_430._0_8_ + iVar35 * 8)) {
                  (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                  lVar49 = lVar49 + 1;
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
              goto LAB_00b63e71;
            }
            if (count == 0) goto LAB_00b620d9;
            psVar58 = (sel.ptr)->sel_vector;
            lVar47 = *(long *)local_4a8;
            psVar33 = *(sel_t **)local_438;
            iVar34 = 0;
            local_4d0 = (sel_t *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar34];
              }
              iVar29 = iVar34;
              if (lVar47 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar33 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar33[iVar34];
              }
              if (*(ulong *)(LStack_430._0_8_ + iVar35 * 8) <
                  *(ulong *)(LStack_4a0._0_8_ + iVar29 * 8)) {
                (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
          }
          else {
            if (count == 0) goto LAB_00b620d9;
            psVar58 = (sel.ptr)->sel_vector;
            lVar47 = *(long *)local_4a8;
            psVar33 = *(sel_t **)local_438;
            local_4d0 = (sel_t *)0x0;
            iVar34 = 0;
            psVar59 = (sel_t *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar34];
              }
              iVar29 = iVar34;
              if (lVar47 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar33 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar33[iVar34];
              }
              if (*(ulong *)(LStack_430._0_8_ + iVar35 * 8) <
                  *(ulong *)(LStack_4a0._0_8_ + iVar29 * 8)) {
                oVar30.ptr = true_sel.ptr;
                psVar57 = psVar59;
                psVar59 = local_4d0;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              else {
                psVar57 = (sel_t *)((long)psVar59 + 1);
                oVar30.ptr = false_sel.ptr;
              }
              (oVar30.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
              iVar34 = iVar34 + 1;
              psVar59 = psVar57;
            } while (count != iVar34);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b63e6c;
            psVar58 = (sel.ptr)->sel_vector;
            lVar47 = *(long *)local_4a8;
            psVar33 = *(sel_t **)local_438;
            lVar49 = 0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar34];
              }
              iVar29 = iVar34;
              if (lVar47 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar33 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar33[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) != 0
                ;
              }
              if (LStack_430.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) &
                         1) == 0;
              }
              if (bVar68 && !bVar69) {
                bVar68 = *(ulong *)(LStack_430._0_8_ + iVar35 * 8) <
                         *(ulong *)(LStack_4a0._0_8_ + iVar29 * 8);
              }
              if (!bVar68) {
                (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                lVar49 = lVar49 + 1;
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            goto LAB_00b63e71;
          }
          if (count == 0) goto LAB_00b620d9;
          psVar58 = (sel.ptr)->sel_vector;
          lVar47 = *(long *)local_4a8;
          psVar33 = *(sel_t **)local_438;
          iVar34 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar34];
            }
            iVar29 = iVar34;
            if (lVar47 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar33 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar33[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) != 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if (bVar68 && !bVar69) {
              bVar68 = *(ulong *)(LStack_430._0_8_ + iVar35 * 8) <
                       *(ulong *)(LStack_4a0._0_8_ + iVar29 * 8);
            }
            if (bVar68) {
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
              local_4d0 = (sel_t *)((long)local_4d0 + 1);
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
        else {
          if (count == 0) goto LAB_00b620d9;
          psVar58 = (sel.ptr)->sel_vector;
          lVar47 = *(long *)local_4a8;
          psVar33 = *(sel_t **)local_438;
          iVar34 = 0;
          psVar59 = (sel_t *)0x0;
          psVar57 = (sel_t *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar34];
            }
            iVar29 = iVar34;
            if (lVar47 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar33 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar33[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) != 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if (bVar68 && !bVar69) {
              bVar68 = *(ulong *)(LStack_430._0_8_ + iVar35 * 8) <
                       *(ulong *)(LStack_4a0._0_8_ + iVar29 * 8);
            }
            if (bVar68) {
              psVar52 = psVar59;
              local_4d0 = (sel_t *)((long)psVar57 + 1);
              psVar59 = psVar57;
              oVar30.ptr = true_sel.ptr;
            }
            else {
              psVar52 = (sel_t *)((long)psVar59 + 1);
              local_4d0 = psVar57;
              oVar30.ptr = false_sel.ptr;
            }
            (oVar30.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
            iVar34 = iVar34 + 1;
            psVar59 = psVar52;
            psVar57 = local_4d0;
          } while (count != iVar34);
        }
        goto LAB_00b63e74;
      }
      pdVar11 = left->data;
      puVar10 = (ulong *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b60d2a;
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar33 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar31 = uVar48;
            if (psVar58 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar58[uVar48];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = *puVar10 < *(ulong *)(pdVar11 + uVar48 * 8);
            }
            psVar33[lVar47] = (sel_t)uVar31;
            lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_00b60d2c;
        }
        if (count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar33 = (true_sel.ptr)->sel_vector;
          uVar48 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            uVar31 = uVar48;
            if (psVar58 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar58[uVar48];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = *puVar10 < *(ulong *)(pdVar11 + uVar48 * 8);
            }
            psVar33[(long)local_4d0] = (sel_t)uVar31;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_00b60d3c;
        }
      }
      else if (count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar33 = (true_sel.ptr)->sel_vector;
        psVar59 = (false_sel.ptr)->sel_vector;
        lVar47 = 0;
        local_4d0 = (sel_t *)0x0;
        uVar48 = 0;
        do {
          uVar31 = uVar48;
          if (psVar58 != (sel_t *)0x0) {
            uVar31 = (ulong)psVar58[uVar48];
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (bVar68 == true && !bVar69) {
            bVar68 = *puVar10 < *(ulong *)(pdVar11 + uVar48 * 8);
          }
          psVar33[(long)local_4d0] = (sel_t)uVar31;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          psVar59[lVar47] = (sel_t)uVar31;
          lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
          uVar48 = uVar48 + 1;
        } while (count != uVar48);
        goto LAB_00b60d3c;
      }
    }
    break;
  case INT64:
    local_328 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (local_328 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar68 = false;
      }
      else {
        bVar68 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar69 = false;
      }
      else {
        bVar69 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar69 | bVar68)) {
        bVar68 = (bool)(bVar68 ^ 1);
      }
      else {
        bVar68 = *(long *)right->data < *(long *)left->data;
      }
      if (!bVar68) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(sel_t *)0x0;
        }
        psVar58 = (sel.ptr)->sel_vector;
        psVar33 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar58 != (sel_t *)0x0) {
            sVar44 = psVar58[iVar34];
          }
          psVar33[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return (idx_t)(sel_t *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        psVar33 = (true_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar58 != (sel_t *)0x0) {
            sVar44 = psVar58[iVar34];
          }
          psVar33[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      plVar36 = (long *)left->data;
      pdVar11 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b60d2a;
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar33 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar31 = uVar48;
            if (psVar58 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar58[uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = *(long *)(pdVar11 + uVar48 * 8) < *plVar36;
            }
            psVar33[lVar47] = (sel_t)uVar31;
            lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_00b60d2c;
        }
        if (count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar33 = (true_sel.ptr)->sel_vector;
          local_4d0 = (sel_t *)0x0;
          uVar48 = 0;
          do {
            uVar31 = uVar48;
            if (psVar58 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar58[uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = *(long *)(pdVar11 + uVar48 * 8) < *plVar36;
            }
            psVar33[(long)local_4d0] = (sel_t)uVar31;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_00b60d3c;
        }
      }
      else if (count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar33 = (true_sel.ptr)->sel_vector;
        psVar59 = (false_sel.ptr)->sel_vector;
        local_4d0 = (sel_t *)0x0;
        lVar47 = 0;
        uVar48 = 0;
        do {
          uVar31 = uVar48;
          if (psVar58 != (sel_t *)0x0) {
            uVar31 = (ulong)psVar58[uVar48];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (bool)(*(byte *)local_4a8 & 1);
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
          }
          if (bVar68 == true && !bVar69) {
            bVar68 = *(long *)(pdVar11 + uVar48 * 8) < *plVar36;
          }
          psVar33[(long)local_4d0] = (sel_t)uVar31;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          psVar59[lVar47] = (sel_t)uVar31;
          lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
          uVar48 = uVar48 + 1;
        } while (count != uVar48);
        goto LAB_00b60d3c;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar11 = left->data;
          pdVar13 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar33 = (true_sel.ptr)->sel_vector;
            psVar59 = (false_sel.ptr)->sel_vector;
            psVar57 = (sel_t *)0x0;
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar31 = uVar48;
              if (psVar58 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar58[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = *(long *)(pdVar13 + uVar48 * 8) < *(long *)(pdVar11 + uVar48 * 8);
              }
              psVar33[(long)psVar57] = (sel_t)uVar31;
              psVar57 = (sel_t *)((long)psVar57 + (ulong)bVar68);
              psVar59[lVar47] = (sel_t)uVar31;
              lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            return (idx_t)psVar57;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar33 = (true_sel.ptr)->sel_vector;
            psVar59 = (sel_t *)0x0;
            uVar48 = 0;
            do {
              uVar31 = uVar48;
              if (psVar58 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar58[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = *(long *)(pdVar13 + uVar48 * 8) < *(long *)(pdVar11 + uVar48 * 8);
              }
              psVar33[(long)psVar59] = (sel_t)uVar31;
              psVar59 = (sel_t *)((long)psVar59 + (ulong)bVar68);
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            return (idx_t)psVar59;
          }
          if (count != 0) {
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar33 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar31 = uVar48;
              if (psVar58 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar58[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = *(long *)(pdVar13 + uVar48 * 8) < *(long *)(pdVar11 + uVar48 * 8);
              }
              psVar33[lVar47] = (sel_t)uVar31;
              lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
            goto LAB_00b62ac8;
          }
          goto LAB_00b62ac6;
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_00b63d82;
              psVar58 = (sel.ptr)->sel_vector;
              lVar47 = *(long *)local_4a8;
              psVar33 = *(sel_t **)local_438;
              lVar49 = 0;
              iVar34 = 0;
              do {
                iVar23 = iVar34;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar34];
                }
                iVar29 = iVar34;
                if (lVar47 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar33 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar33[iVar34];
                }
                if (*(long *)(LStack_4a0._0_8_ + iVar29 * 8) <=
                    *(long *)(LStack_430._0_8_ + iVar35 * 8)) {
                  (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                  lVar49 = lVar49 + 1;
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
              goto LAB_00b63e71;
            }
            if (count == 0) goto LAB_00b620d9;
            psVar58 = (sel.ptr)->sel_vector;
            lVar47 = *(long *)local_4a8;
            psVar33 = *(sel_t **)local_438;
            local_4d0 = (sel_t *)0x0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar34];
              }
              iVar29 = iVar34;
              if (lVar47 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar33 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar33[iVar34];
              }
              if (*(long *)(LStack_430._0_8_ + iVar35 * 8) <
                  *(long *)(LStack_4a0._0_8_ + iVar29 * 8)) {
                (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
          }
          else {
            if (count == 0) goto LAB_00b620d9;
            psVar58 = (sel.ptr)->sel_vector;
            lVar47 = *(long *)local_4a8;
            psVar33 = *(sel_t **)local_438;
            local_4d0 = (sel_t *)0x0;
            iVar34 = 0;
            psVar59 = (sel_t *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar34];
              }
              iVar29 = iVar34;
              if (lVar47 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar33 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar33[iVar34];
              }
              if (*(long *)(LStack_430._0_8_ + iVar35 * 8) <
                  *(long *)(LStack_4a0._0_8_ + iVar29 * 8)) {
                oVar30.ptr = true_sel.ptr;
                psVar57 = psVar59;
                psVar59 = local_4d0;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              else {
                psVar57 = (sel_t *)((long)psVar59 + 1);
                oVar30.ptr = false_sel.ptr;
              }
              (oVar30.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
              iVar34 = iVar34 + 1;
              psVar59 = psVar57;
            } while (count != iVar34);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b63e6c;
            psVar58 = (sel.ptr)->sel_vector;
            lVar47 = *(long *)local_4a8;
            psVar33 = *(sel_t **)local_438;
            lVar49 = 0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar34];
              }
              iVar29 = iVar34;
              if (lVar47 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar33 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar33[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) != 0
                ;
              }
              if (LStack_430.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) &
                         1) == 0;
              }
              if (bVar68 && !bVar69) {
                bVar68 = *(long *)(LStack_430._0_8_ + iVar35 * 8) <
                         *(long *)(LStack_4a0._0_8_ + iVar29 * 8);
              }
              if (!bVar68) {
                (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                lVar49 = lVar49 + 1;
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            goto LAB_00b63e71;
          }
          if (count == 0) goto LAB_00b620d9;
          psVar58 = (sel.ptr)->sel_vector;
          lVar47 = *(long *)local_4a8;
          psVar33 = *(sel_t **)local_438;
          local_4d0 = (sel_t *)0x0;
          iVar34 = 0;
          do {
            iVar23 = iVar34;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar34];
            }
            iVar29 = iVar34;
            if (lVar47 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar33 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar33[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) != 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if (bVar68 && !bVar69) {
              bVar68 = *(long *)(LStack_430._0_8_ + iVar35 * 8) <
                       *(long *)(LStack_4a0._0_8_ + iVar29 * 8);
            }
            if (bVar68) {
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
              local_4d0 = (sel_t *)((long)local_4d0 + 1);
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
        else {
          if (count == 0) goto LAB_00b620d9;
          psVar58 = (sel.ptr)->sel_vector;
          lVar47 = *(long *)local_4a8;
          psVar33 = *(sel_t **)local_438;
          iVar34 = 0;
          psVar59 = (sel_t *)0x0;
          psVar57 = (sel_t *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar34];
            }
            iVar29 = iVar34;
            if (lVar47 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar33 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar33[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) != 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if (bVar68 && !bVar69) {
              bVar68 = *(long *)(LStack_430._0_8_ + iVar35 * 8) <
                       *(long *)(LStack_4a0._0_8_ + iVar29 * 8);
            }
            if (bVar68) {
              psVar52 = psVar59;
              local_4d0 = (sel_t *)((long)psVar57 + 1);
              psVar59 = psVar57;
              oVar30.ptr = true_sel.ptr;
            }
            else {
              psVar52 = (sel_t *)((long)psVar59 + 1);
              local_4d0 = psVar57;
              oVar30.ptr = false_sel.ptr;
            }
            (oVar30.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
            iVar34 = iVar34 + 1;
            psVar59 = psVar52;
            psVar57 = local_4d0;
          } while (count != iVar34);
        }
        goto LAB_00b63e74;
      }
      pdVar11 = left->data;
      plVar36 = (long *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b60d2a;
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar33 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar31 = uVar48;
            if (psVar58 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar58[uVar48];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = *plVar36 < *(long *)(pdVar11 + uVar48 * 8);
            }
            psVar33[lVar47] = (sel_t)uVar31;
            lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_00b60d2c;
        }
        if (count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar33 = (true_sel.ptr)->sel_vector;
          local_4d0 = (sel_t *)0x0;
          uVar48 = 0;
          do {
            uVar31 = uVar48;
            if (psVar58 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar58[uVar48];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = *plVar36 < *(long *)(pdVar11 + uVar48 * 8);
            }
            psVar33[(long)local_4d0] = (sel_t)uVar31;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar48 = uVar48 + 1;
          } while (count != uVar48);
          goto LAB_00b60d3c;
        }
      }
      else if (count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar33 = (true_sel.ptr)->sel_vector;
        psVar59 = (false_sel.ptr)->sel_vector;
        local_4d0 = (sel_t *)0x0;
        lVar47 = 0;
        uVar48 = 0;
        do {
          uVar31 = uVar48;
          if (psVar58 != (sel_t *)0x0) {
            uVar31 = (ulong)psVar58[uVar48];
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (bVar68 == true && !bVar69) {
            bVar68 = *plVar36 < *(long *)(pdVar11 + uVar48 * 8);
          }
          psVar33[(long)local_4d0] = (sel_t)uVar31;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          psVar59[lVar47] = (sel_t)uVar31;
          lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
          uVar48 = uVar48 + 1;
        } while (count != uVar48);
        goto LAB_00b60d3c;
      }
    }
    break;
  default:
switchD_00b54a14_caseD_a:
    this_02 = (InternalException *)__cxa_allocate_exception(0x10);
    local_4a8 = (undefined1  [8])&LStack_4a0.type_info_;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_4a8,"Invalid type for distinct selection","");
    InternalException::InternalException(this_02,(string *)local_4a8);
    __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    local_328 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (local_328 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar68 = false;
      }
      else {
        bVar68 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar69 = false;
      }
      else {
        bVar69 = (*puVar5 & 1) == 0;
      }
      if ((bVar69 | bVar68) == 1) {
        bVar68 = (bool)(bVar68 ^ 1);
      }
      else {
        bVar68 = GreaterThan::Operation<float>((float *)left->data,(float *)right->data);
      }
      if (bVar68 == false) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(sel_t *)0x0;
        }
        psVar58 = (sel.ptr)->sel_vector;
        psVar33 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar58 != (sel_t *)0x0) {
            sVar44 = psVar58[iVar34];
          }
          psVar33[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return (idx_t)(sel_t *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        psVar33 = (true_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar58 != (sel_t *)0x0) {
            sVar44 = psVar58[iVar34];
          }
          psVar33[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      pfVar38 = (float *)left->data;
      pfVar62 = (float *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          lVar47 = 0;
          if (count != 0) {
            uVar48 = 0;
            lVar47 = 0;
            do {
              uVar31 = uVar48;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar31 = (ulong)(sel.ptr)->sel_vector[uVar48];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_4a8 & 1);
              }
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = GreaterThan::Operation<float>(pfVar38,pfVar62);
              }
              (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar31;
              lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
              uVar48 = uVar48 + 1;
              pfVar62 = pfVar62 + 1;
            } while (count != uVar48);
          }
LAB_00b5e956:
          local_4d0 = (sel_t *)(count - lVar47);
          local_488._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               LStack_4a0.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          goto LAB_00b60c62;
        }
        if (count != 0) {
          uVar48 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            uVar31 = uVar48;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar31 = (ulong)(sel.ptr)->sel_vector[uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = GreaterThan::Operation<float>(pfVar38,pfVar62);
            }
            (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar31;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar48 = uVar48 + 1;
            pfVar62 = pfVar62 + 1;
            local_488._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_4a0.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar48);
          goto LAB_00b60c62;
        }
      }
      else if (count != 0) {
        lVar47 = 0;
        local_4d0 = (sel_t *)0x0;
        uVar48 = 0;
        do {
          uVar31 = uVar48;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            uVar31 = (ulong)(sel.ptr)->sel_vector[uVar48];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (bool)(*(byte *)local_4a8 & 1);
          }
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar5 == (unsigned_long *)0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
          }
          if (bVar68 == true && !bVar69) {
            bVar68 = GreaterThan::Operation<float>(pfVar38,pfVar62);
          }
          (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar31;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar31;
          lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
          uVar48 = uVar48 + 1;
          pfVar62 = pfVar62 + 1;
          local_488._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               LStack_4a0.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        } while (count != uVar48);
        goto LAB_00b60c62;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pfVar38 = (float *)left->data;
          pfVar62 = (float *)right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            lVar47 = 0;
            local_4d0 = (sel_t *)0x0;
            uVar48 = 0;
            do {
              uVar31 = uVar48;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar31 = (ulong)(sel.ptr)->sel_vector[uVar48];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = GreaterThan::Operation<float>(pfVar38,pfVar62);
              }
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar31;
              local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
              (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar31;
              lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
              uVar48 = uVar48 + 1;
              pfVar38 = pfVar38 + 1;
              pfVar62 = pfVar62 + 1;
            } while (count != uVar48);
            return (idx_t)local_4d0;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            uVar48 = 0;
            local_4d0 = (sel_t *)0x0;
            do {
              uVar31 = uVar48;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar31 = (ulong)(sel.ptr)->sel_vector[uVar48];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = GreaterThan::Operation<float>(pfVar38,pfVar62);
              }
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar31;
              local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
              uVar48 = uVar48 + 1;
              pfVar38 = pfVar38 + 1;
              pfVar62 = pfVar62 + 1;
            } while (count != uVar48);
            return (idx_t)local_4d0;
          }
          if (count != 0) {
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar31 = uVar48;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar31 = (ulong)(sel.ptr)->sel_vector[uVar48];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = GreaterThan::Operation<float>(pfVar38,pfVar62);
              }
              (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar31;
              lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
              uVar48 = uVar48 + 1;
              pfVar38 = pfVar38 + 1;
              pfVar62 = pfVar62 + 1;
            } while (count != uVar48);
            goto LAB_00b63ebe;
          }
LAB_00b629ee:
          lVar47 = 0;
LAB_00b63ebe:
          return (idx_t)(sel_t *)(count - lVar47);
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
        uVar17 = LStack_4a0._0_8_;
        uVar20 = LStack_430._0_8_;
        if (LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) {
LAB_00b63ca7:
                lVar49 = 0;
              }
              else {
                psVar58 = (sel.ptr)->sel_vector;
                lVar47 = *(long *)local_4a8;
                psVar33 = *(sel_t **)local_438;
                lVar49 = 0;
                uVar48 = 0;
                do {
                  uVar31 = uVar48;
                  if (psVar58 != (sel_t *)0x0) {
                    uVar31 = (ulong)psVar58[uVar48];
                  }
                  uVar61 = uVar48;
                  if (lVar47 != 0) {
                    uVar61 = (ulong)*(uint *)(lVar47 + uVar48 * 4);
                  }
                  uVar60 = uVar48;
                  if (psVar33 != (sel_t *)0x0) {
                    uVar60 = (ulong)psVar33[uVar48];
                  }
                  bVar68 = GreaterThan::Operation<float>
                                     ((float *)(uVar17 + uVar61 * 4),(float *)(uVar20 + uVar60 * 4))
                  ;
                  if (!bVar68) {
                    (false_sel.ptr)->sel_vector[lVar49] = (sel_t)uVar31;
                    lVar49 = lVar49 + 1;
                  }
                  uVar48 = uVar48 + 1;
                } while (count != uVar48);
              }
LAB_00b63ca9:
              local_4d0 = (sel_t *)(count - lVar49);
            }
            else {
              if (count == 0) goto LAB_00b61f3a;
              psVar58 = (sel.ptr)->sel_vector;
              lVar47 = *(long *)local_4a8;
              psVar33 = *(sel_t **)local_438;
              uVar48 = 0;
              local_4d0 = (sel_t *)0x0;
              do {
                uVar31 = uVar48;
                if (psVar58 != (sel_t *)0x0) {
                  uVar31 = (ulong)psVar58[uVar48];
                }
                uVar61 = uVar48;
                if (lVar47 != 0) {
                  uVar61 = (ulong)*(uint *)(lVar47 + uVar48 * 4);
                }
                uVar60 = uVar48;
                if (psVar33 != (sel_t *)0x0) {
                  uVar60 = (ulong)psVar33[uVar48];
                }
                bVar68 = GreaterThan::Operation<float>
                                   ((float *)(uVar17 + uVar61 * 4),(float *)(uVar20 + uVar60 * 4));
                if (bVar68) {
                  (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar31;
                  local_4d0 = (sel_t *)((long)local_4d0 + 1);
                }
                uVar48 = uVar48 + 1;
              } while (count != uVar48);
            }
          }
          else if (count == 0) {
LAB_00b61f3a:
            local_4d0 = (sel_t *)0x0;
          }
          else {
            psVar58 = (sel.ptr)->sel_vector;
            lVar47 = *(long *)local_4a8;
            psVar33 = *(sel_t **)local_438;
            local_4d0 = (sel_t *)0x0;
            uVar48 = 0;
            psVar59 = (sel_t *)0x0;
            do {
              uVar31 = uVar48;
              if (psVar58 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar58[uVar48];
              }
              uVar61 = uVar48;
              if (lVar47 != 0) {
                uVar61 = (ulong)*(uint *)(lVar47 + uVar48 * 4);
              }
              uVar60 = uVar48;
              if (psVar33 != (sel_t *)0x0) {
                uVar60 = (ulong)psVar33[uVar48];
              }
              bVar68 = GreaterThan::Operation<float>
                                 ((float *)(uVar17 + uVar61 * 4),(float *)(uVar20 + uVar60 * 4));
              if (bVar68) {
                psVar57 = local_4d0;
                oVar30.ptr = true_sel.ptr;
                psVar52 = psVar59;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              else {
                psVar52 = (sel_t *)((long)psVar59 + 1);
                psVar57 = psVar59;
                oVar30.ptr = false_sel.ptr;
              }
              (oVar30.ptr)->sel_vector[(long)psVar57] = (sel_t)uVar31;
              uVar48 = uVar48 + 1;
              psVar59 = psVar52;
            } while (count != uVar48);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b63ca7;
            psVar58 = (sel.ptr)->sel_vector;
            lVar47 = *(long *)local_4a8;
            psVar33 = *(sel_t **)local_438;
            lVar49 = 0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar34];
              }
              iVar29 = iVar34;
              if (lVar47 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar33 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar33[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) != 0
                ;
              }
              if (LStack_430.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) &
                         1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = GreaterThan::Operation<float>
                                   ((float *)(uVar17 + iVar29 * 4),(float *)(uVar20 + iVar35 * 4));
              }
              if (bVar68 == false) {
                (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                lVar49 = lVar49 + 1;
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            goto LAB_00b63ca9;
          }
          if (count == 0) goto LAB_00b61f3a;
          psVar58 = (sel.ptr)->sel_vector;
          lVar47 = *(long *)local_4a8;
          psVar33 = *(sel_t **)local_438;
          iVar34 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar34];
            }
            iVar29 = iVar34;
            if (lVar47 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar33 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar33[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) != 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = GreaterThan::Operation<float>
                                 ((float *)(uVar17 + iVar29 * 4),(float *)(uVar20 + iVar35 * 4));
            }
            if (bVar68 != false) {
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
              local_4d0 = (sel_t *)((long)local_4d0 + 1);
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
        else {
          if (count == 0) goto LAB_00b61f3a;
          psVar58 = (sel.ptr)->sel_vector;
          lVar47 = *(long *)local_4a8;
          psVar33 = *(sel_t **)local_438;
          local_4b8 = (sel_t *)0x0;
          local_4d0 = (sel_t *)0x0;
          iVar34 = 0;
          do {
            iVar23 = iVar34;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar34];
            }
            iVar29 = iVar34;
            if (lVar47 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar33 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar33[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) != 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = GreaterThan::Operation<float>
                                 ((float *)(uVar17 + iVar29 * 4),(float *)(uVar20 + iVar35 * 4));
            }
            if (bVar68 == false) {
              psVar59 = local_4b8;
              oVar30.ptr = false_sel.ptr;
              local_4b8 = (sel_t *)((long)local_4b8 + 1);
            }
            else {
              psVar59 = local_4d0;
              oVar30.ptr = true_sel.ptr;
              local_4d0 = (sel_t *)((long)local_4d0 + 1);
            }
            (oVar30.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
LAB_00b63cb6:
        if (local_3f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f8._M_pi);
        }
        if (local_418._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_418._M_pi);
        }
        if (local_468._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_468._M_pi);
        }
        goto LAB_00b60c62;
      }
      pfVar38 = (float *)left->data;
      pfVar62 = (float *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b60c4d;
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar31 = uVar48;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar31 = (ulong)(sel.ptr)->sel_vector[uVar48];
            }
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = GreaterThan::Operation<float>(pfVar38,pfVar62);
            }
            (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar31;
            lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
            uVar48 = uVar48 + 1;
            pfVar38 = pfVar38 + 1;
          } while (count != uVar48);
          goto LAB_00b60c50;
        }
        if (count != 0) {
          uVar48 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            uVar31 = uVar48;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar31 = (ulong)(sel.ptr)->sel_vector[uVar48];
            }
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = GreaterThan::Operation<float>(pfVar38,pfVar62);
            }
            (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar31;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar48 = uVar48 + 1;
            pfVar38 = pfVar38 + 1;
            local_488._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_4a0.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar48);
          goto LAB_00b60c62;
        }
      }
      else if (count != 0) {
        lVar47 = 0;
        local_4d0 = (sel_t *)0x0;
        uVar48 = 0;
        do {
          uVar31 = uVar48;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            uVar31 = (ulong)(sel.ptr)->sel_vector[uVar48];
          }
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar5 == (unsigned_long *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (bVar68 == true && !bVar69) {
            bVar68 = GreaterThan::Operation<float>(pfVar38,pfVar62);
          }
          (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar31;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar31;
          lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
          uVar48 = uVar48 + 1;
          pfVar38 = pfVar38 + 1;
          local_488._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               LStack_4a0.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        } while (count != uVar48);
        goto LAB_00b60c62;
      }
    }
    goto LAB_00b5df1f;
  case DOUBLE:
    local_328 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (local_328 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar68 = false;
      }
      else {
        bVar68 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar69 = false;
      }
      else {
        bVar69 = (*puVar5 & 1) == 0;
      }
      if ((bVar69 | bVar68) == 1) {
        bVar68 = (bool)(bVar68 ^ 1);
      }
      else {
        bVar68 = GreaterThan::Operation<double>((double *)left->data,(double *)right->data);
      }
      if (bVar68 == false) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(sel_t *)0x0;
        }
        psVar58 = (sel.ptr)->sel_vector;
        psVar33 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar58 != (sel_t *)0x0) {
            sVar44 = psVar58[iVar34];
          }
          psVar33[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return (idx_t)(sel_t *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        psVar33 = (true_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar58 != (sel_t *)0x0) {
            sVar44 = psVar58[iVar34];
          }
          psVar33[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      pdVar39 = (double *)left->data;
      pdVar63 = (double *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          lVar47 = 0;
          if (count != 0) {
            uVar48 = 0;
            do {
              uVar31 = uVar48;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar31 = (ulong)(sel.ptr)->sel_vector[uVar48];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_4a8 & 1);
              }
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = GreaterThan::Operation<double>(pdVar39,pdVar63);
              }
              (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar31;
              lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
              uVar48 = uVar48 + 1;
              pdVar63 = pdVar63 + 1;
            } while (count != uVar48);
          }
          goto LAB_00b5e956;
        }
        if (count != 0) {
          uVar48 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            uVar31 = uVar48;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar31 = (ulong)(sel.ptr)->sel_vector[uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = GreaterThan::Operation<double>(pdVar39,pdVar63);
            }
            (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar31;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar48 = uVar48 + 1;
            pdVar63 = pdVar63 + 1;
            local_488._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_4a0.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar48);
          goto LAB_00b60c62;
        }
      }
      else if (count != 0) {
        lVar47 = 0;
        local_4d0 = (sel_t *)0x0;
        uVar48 = 0;
        do {
          uVar31 = uVar48;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            uVar31 = (ulong)(sel.ptr)->sel_vector[uVar48];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (bool)(*(byte *)local_4a8 & 1);
          }
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar5 == (unsigned_long *)0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
          }
          if (bVar68 == true && !bVar69) {
            bVar68 = GreaterThan::Operation<double>(pdVar39,pdVar63);
          }
          (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar31;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar31;
          lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
          uVar48 = uVar48 + 1;
          pdVar63 = pdVar63 + 1;
          local_488._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               LStack_4a0.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        } while (count != uVar48);
        goto LAB_00b60c62;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar39 = (double *)left->data;
          pdVar63 = (double *)right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            lVar47 = 0;
            local_4d0 = (sel_t *)0x0;
            uVar48 = 0;
            do {
              uVar31 = uVar48;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar31 = (ulong)(sel.ptr)->sel_vector[uVar48];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = GreaterThan::Operation<double>(pdVar39,pdVar63);
              }
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar31;
              local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
              (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar31;
              lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
              uVar48 = uVar48 + 1;
              pdVar39 = pdVar39 + 1;
              pdVar63 = pdVar63 + 1;
            } while (count != uVar48);
            return (idx_t)local_4d0;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            uVar48 = 0;
            local_4d0 = (sel_t *)0x0;
            do {
              uVar31 = uVar48;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar31 = (ulong)(sel.ptr)->sel_vector[uVar48];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = GreaterThan::Operation<double>(pdVar39,pdVar63);
              }
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar31;
              local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
              uVar48 = uVar48 + 1;
              pdVar39 = pdVar39 + 1;
              pdVar63 = pdVar63 + 1;
            } while (count != uVar48);
            return (idx_t)local_4d0;
          }
          if (count != 0) {
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar31 = uVar48;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar31 = (ulong)(sel.ptr)->sel_vector[uVar48];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = GreaterThan::Operation<double>(pdVar39,pdVar63);
              }
              (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar31;
              lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
              uVar48 = uVar48 + 1;
              pdVar39 = pdVar39 + 1;
              pdVar63 = pdVar63 + 1;
            } while (count != uVar48);
            goto LAB_00b63ebe;
          }
          goto LAB_00b629ee;
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
        uVar17 = LStack_4a0._0_8_;
        uVar20 = LStack_430._0_8_;
        if (LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_00b63ca7;
              psVar58 = (sel.ptr)->sel_vector;
              lVar47 = *(long *)local_4a8;
              psVar33 = *(sel_t **)local_438;
              lVar49 = 0;
              uVar48 = 0;
              do {
                uVar31 = uVar48;
                if (psVar58 != (sel_t *)0x0) {
                  uVar31 = (ulong)psVar58[uVar48];
                }
                uVar61 = uVar48;
                if (lVar47 != 0) {
                  uVar61 = (ulong)*(uint *)(lVar47 + uVar48 * 4);
                }
                uVar60 = uVar48;
                if (psVar33 != (sel_t *)0x0) {
                  uVar60 = (ulong)psVar33[uVar48];
                }
                bVar68 = GreaterThan::Operation<double>
                                   ((double *)(uVar17 + uVar61 * 8),(double *)(uVar20 + uVar60 * 8))
                ;
                if (!bVar68) {
                  (false_sel.ptr)->sel_vector[lVar49] = (sel_t)uVar31;
                  lVar49 = lVar49 + 1;
                }
                uVar48 = uVar48 + 1;
              } while (count != uVar48);
              goto LAB_00b63ca9;
            }
            if (count == 0) goto LAB_00b61f3a;
            psVar58 = (sel.ptr)->sel_vector;
            lVar47 = *(long *)local_4a8;
            psVar33 = *(sel_t **)local_438;
            uVar48 = 0;
            local_4d0 = (sel_t *)0x0;
            do {
              uVar31 = uVar48;
              if (psVar58 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar58[uVar48];
              }
              uVar61 = uVar48;
              if (lVar47 != 0) {
                uVar61 = (ulong)*(uint *)(lVar47 + uVar48 * 4);
              }
              uVar60 = uVar48;
              if (psVar33 != (sel_t *)0x0) {
                uVar60 = (ulong)psVar33[uVar48];
              }
              bVar68 = GreaterThan::Operation<double>
                                 ((double *)(uVar17 + uVar61 * 8),(double *)(uVar20 + uVar60 * 8));
              if (bVar68) {
                (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar31;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              uVar48 = uVar48 + 1;
            } while (count != uVar48);
          }
          else {
            if (count == 0) goto LAB_00b61f3a;
            psVar58 = (sel.ptr)->sel_vector;
            lVar47 = *(long *)local_4a8;
            psVar33 = *(sel_t **)local_438;
            local_4d0 = (sel_t *)0x0;
            uVar48 = 0;
            psVar59 = (sel_t *)0x0;
            do {
              uVar31 = uVar48;
              if (psVar58 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar58[uVar48];
              }
              uVar61 = uVar48;
              if (lVar47 != 0) {
                uVar61 = (ulong)*(uint *)(lVar47 + uVar48 * 4);
              }
              uVar60 = uVar48;
              if (psVar33 != (sel_t *)0x0) {
                uVar60 = (ulong)psVar33[uVar48];
              }
              bVar68 = GreaterThan::Operation<double>
                                 ((double *)(uVar17 + uVar61 * 8),(double *)(uVar20 + uVar60 * 8));
              if (bVar68) {
                psVar57 = local_4d0;
                oVar30.ptr = true_sel.ptr;
                psVar52 = psVar59;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              else {
                psVar52 = (sel_t *)((long)psVar59 + 1);
                psVar57 = psVar59;
                oVar30.ptr = false_sel.ptr;
              }
              (oVar30.ptr)->sel_vector[(long)psVar57] = (sel_t)uVar31;
              uVar48 = uVar48 + 1;
              psVar59 = psVar52;
            } while (count != uVar48);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b63ca7;
            psVar58 = (sel.ptr)->sel_vector;
            lVar47 = *(long *)local_4a8;
            psVar33 = *(sel_t **)local_438;
            lVar49 = 0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar34];
              }
              iVar29 = iVar34;
              if (lVar47 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar33 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar33[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) != 0
                ;
              }
              if (LStack_430.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) &
                         1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = GreaterThan::Operation<double>
                                   ((double *)(uVar17 + iVar29 * 8),(double *)(uVar20 + iVar35 * 8))
                ;
              }
              if (bVar68 == false) {
                (false_sel.ptr)->sel_vector[lVar49] = (sel_t)iVar23;
                lVar49 = lVar49 + 1;
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            goto LAB_00b63ca9;
          }
          if (count == 0) goto LAB_00b61f3a;
          psVar58 = (sel.ptr)->sel_vector;
          lVar47 = *(long *)local_4a8;
          psVar33 = *(sel_t **)local_438;
          iVar34 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar34];
            }
            iVar29 = iVar34;
            if (lVar47 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar33 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar33[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) != 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = GreaterThan::Operation<double>
                                 ((double *)(uVar17 + iVar29 * 8),(double *)(uVar20 + iVar35 * 8));
            }
            if (bVar68 != false) {
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
              local_4d0 = (sel_t *)((long)local_4d0 + 1);
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
        else {
          if (count == 0) goto LAB_00b61f3a;
          psVar58 = (sel.ptr)->sel_vector;
          lVar47 = *(long *)local_4a8;
          psVar33 = *(sel_t **)local_438;
          local_4b8 = (sel_t *)0x0;
          local_4d0 = (sel_t *)0x0;
          iVar34 = 0;
          do {
            iVar23 = iVar34;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar34];
            }
            iVar29 = iVar34;
            if (lVar47 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar33 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar33[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) != 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = GreaterThan::Operation<double>
                                 ((double *)(uVar17 + iVar29 * 8),(double *)(uVar20 + iVar35 * 8));
            }
            if (bVar68 == false) {
              psVar59 = local_4b8;
              oVar30.ptr = false_sel.ptr;
              local_4b8 = (sel_t *)((long)local_4b8 + 1);
            }
            else {
              psVar59 = local_4d0;
              oVar30.ptr = true_sel.ptr;
              local_4d0 = (sel_t *)((long)local_4d0 + 1);
            }
            (oVar30.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
        goto LAB_00b63cb6;
      }
      pdVar39 = (double *)left->data;
      pdVar63 = (double *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b60c4d;
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar31 = uVar48;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar31 = (ulong)(sel.ptr)->sel_vector[uVar48];
            }
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = GreaterThan::Operation<double>(pdVar39,pdVar63);
            }
            (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar31;
            lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
            uVar48 = uVar48 + 1;
            pdVar39 = pdVar39 + 1;
          } while (count != uVar48);
          goto LAB_00b60c50;
        }
        if (count != 0) {
          uVar48 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            uVar31 = uVar48;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar31 = (ulong)(sel.ptr)->sel_vector[uVar48];
            }
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = GreaterThan::Operation<double>(pdVar39,pdVar63);
            }
            (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar31;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar48 = uVar48 + 1;
            pdVar39 = pdVar39 + 1;
            local_488._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_4a0.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar48);
          goto LAB_00b60c62;
        }
      }
      else if (count != 0) {
        lVar47 = 0;
        local_4d0 = (sel_t *)0x0;
        uVar48 = 0;
        do {
          uVar31 = uVar48;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            uVar31 = (ulong)(sel.ptr)->sel_vector[uVar48];
          }
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar5 == (unsigned_long *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (bVar68 == true && !bVar69) {
            bVar68 = GreaterThan::Operation<double>(pdVar39,pdVar63);
          }
          (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar31;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar31;
          lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
          uVar48 = uVar48 + 1;
          pdVar39 = pdVar39 + 1;
          local_488._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               LStack_4a0.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        } while (count != uVar48);
        goto LAB_00b60c62;
      }
    }
    goto LAB_00b5df1f;
  case INTERVAL:
    local_328 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (local_328 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar68 = false;
      }
      else {
        bVar68 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar69 = false;
      }
      else {
        bVar69 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar69 | bVar68)) {
        bVar68 = (bool)(bVar68 ^ 1);
      }
      else {
        piVar43 = (int *)left->data;
        piVar55 = (int *)right->data;
        lVar47 = (long)piVar43[1] + *(long *)(piVar43 + 2) / 86400000000;
        lVar51 = lVar47 % 0x1e;
        lVar54 = (long)*piVar43 + lVar47 / 0x1e;
        lVar49 = (long)piVar55[1] + *(long *)(piVar55 + 2) / 86400000000;
        lVar47 = lVar49 % 0x1e;
        lVar49 = (long)*piVar55 + lVar49 / 0x1e;
        if (lVar49 < lVar54) goto LAB_00b5a375;
        if (lVar54 < lVar49) goto LAB_00b5aea5;
        if (lVar47 < lVar51) goto LAB_00b5a375;
        bVar68 = *(long *)(piVar55 + 2) % 86400000000 < *(long *)(piVar43 + 2) % 86400000000 &&
                 lVar47 <= lVar51;
      }
      if (!bVar68) {
LAB_00b5aea5:
        if (count != 0 && false_sel.ptr != (SelectionVector *)0x0) {
          psVar58 = (sel.ptr)->sel_vector;
          psVar33 = (false_sel.ptr)->sel_vector;
          iVar34 = 0;
          do {
            sVar44 = (sel_t)iVar34;
            if (psVar58 != (sel_t *)0x0) {
              sVar44 = psVar58[iVar34];
            }
            psVar33[iVar34] = sVar44;
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
        return (idx_t)(sel_t *)0x0;
      }
LAB_00b5a375:
      if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
        psVar58 = (sel.ptr)->sel_vector;
        psVar33 = (true_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar58 != (sel_t *)0x0) {
            sVar44 = psVar58[iVar34];
          }
          psVar33[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      piVar43 = (int *)left->data;
      pdVar11 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      local_488._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) {
LAB_00b60c4d:
            lVar47 = 0;
          }
          else {
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar33 = (false_sel.ptr)->sel_vector;
            plVar36 = (long *)(pdVar11 + 8);
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar31 = uVar48;
              if (psVar58 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar58[uVar48];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_4a8 & 1);
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                lVar54 = (long)piVar43[1] + *(long *)(piVar43 + 2) / 86400000000;
                lVar66 = (long)*piVar43 + lVar54 / 0x1e;
                lVar49 = (long)*(int *)((long)plVar36 + -4) + *plVar36 / 86400000000;
                lVar51 = (long)(int)plVar36[-1] + lVar49 / 0x1e;
                bVar68 = true;
                if (lVar66 <= lVar51) {
                  if (lVar66 < lVar51) {
                    bVar68 = false;
                  }
                  else {
                    lVar54 = lVar54 % 0x1e;
                    lVar49 = lVar49 % 0x1e;
                    if (lVar54 <= lVar49) {
                      bVar68 = *plVar36 % 86400000000 < *(long *)(piVar43 + 2) % 86400000000 &&
                               lVar49 <= lVar54;
                    }
                  }
                }
              }
              psVar33[lVar47] = (sel_t)uVar31;
              lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
              uVar48 = uVar48 + 1;
              plVar36 = plVar36 + 2;
            } while (count != uVar48);
          }
LAB_00b60c50:
          local_4d0 = (sel_t *)(count - lVar47);
          local_488._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               LStack_4a0.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          goto LAB_00b60c62;
        }
        if (count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar33 = (true_sel.ptr)->sel_vector;
          plVar36 = (long *)(pdVar11 + 8);
          uVar48 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            uVar31 = uVar48;
            if (psVar58 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar58[uVar48];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              lVar51 = (long)piVar43[1] + *(long *)(piVar43 + 2) / 86400000000;
              lVar54 = (long)*piVar43 + lVar51 / 0x1e;
              lVar47 = (long)*(int *)((long)plVar36 + -4) + *plVar36 / 86400000000;
              lVar49 = (long)(int)plVar36[-1] + lVar47 / 0x1e;
              bVar68 = true;
              if (lVar54 <= lVar49) {
                if (lVar54 < lVar49) {
                  bVar68 = false;
                }
                else {
                  lVar51 = lVar51 % 0x1e;
                  lVar47 = lVar47 % 0x1e;
                  if (lVar51 <= lVar47) {
                    bVar68 = *plVar36 % 86400000000 < *(long *)(piVar43 + 2) % 86400000000 &&
                             lVar47 <= lVar51;
                  }
                }
              }
            }
            psVar33[(long)local_4d0] = (sel_t)uVar31;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar48 = uVar48 + 1;
            plVar36 = plVar36 + 2;
          } while (count != uVar48);
          goto LAB_00b60c62;
        }
      }
      else if (count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar33 = (true_sel.ptr)->sel_vector;
        psVar59 = (false_sel.ptr)->sel_vector;
        plVar36 = (long *)(pdVar11 + 8);
        lVar47 = 0;
        local_4d0 = (sel_t *)0x0;
        uVar48 = 0;
        do {
          uVar31 = uVar48;
          if (psVar58 != (sel_t *)0x0) {
            uVar31 = (ulong)psVar58[uVar48];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (bool)(*(byte *)local_4a8 & 1);
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
          }
          if (bVar68 == true && !bVar69) {
            lVar54 = (long)piVar43[1] + *(long *)(piVar43 + 2) / 86400000000;
            lVar51 = (long)*piVar43 + lVar54 / 0x1e;
            lVar49 = (long)*(int *)((long)plVar36 + -4) + *plVar36 / 86400000000;
            lVar66 = (long)(int)plVar36[-1] + lVar49 / 0x1e;
            bVar68 = true;
            if (lVar51 <= lVar66) {
              if (lVar51 < lVar66) {
                bVar68 = false;
              }
              else {
                lVar54 = lVar54 % 0x1e;
                lVar49 = lVar49 % 0x1e;
                if (lVar54 <= lVar49) {
                  bVar68 = *plVar36 % 86400000000 < *(long *)(piVar43 + 2) % 86400000000 &&
                           lVar49 <= lVar54;
                }
              }
            }
          }
          psVar33[(long)local_4d0] = (sel_t)uVar31;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          psVar59[lVar47] = (sel_t)uVar31;
          lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
          uVar48 = uVar48 + 1;
          plVar36 = plVar36 + 2;
        } while (count != uVar48);
        goto LAB_00b60c62;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar11 = left->data;
          pdVar13 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar33 = (true_sel.ptr)->sel_vector;
            psVar59 = (false_sel.ptr)->sel_vector;
            lVar49 = 8;
            lVar47 = 0;
            local_4d0 = (sel_t *)0x0;
            uVar48 = 0;
            do {
              uVar31 = uVar48;
              if (psVar58 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar58[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                lVar66 = (long)*(int *)(pdVar11 + lVar49 + -4) +
                         *(long *)(pdVar11 + lVar49) / 86400000000;
                lVar54 = (long)*(int *)(pdVar11 + lVar49 + -8) + lVar66 / 0x1e;
                lVar51 = (long)*(int *)(pdVar13 + lVar49 + -4) +
                         *(long *)(pdVar13 + lVar49) / 86400000000;
                lVar67 = (long)*(int *)(pdVar13 + lVar49 + -8) + lVar51 / 0x1e;
                bVar68 = true;
                if (lVar54 <= lVar67) {
                  if (lVar54 < lVar67) {
                    bVar68 = false;
                  }
                  else {
                    lVar66 = lVar66 % 0x1e;
                    lVar51 = lVar51 % 0x1e;
                    if (lVar66 <= lVar51) {
                      bVar68 = *(long *)(pdVar13 + lVar49) % 86400000000 <
                               *(long *)(pdVar11 + lVar49) % 86400000000 && lVar51 <= lVar66;
                    }
                  }
                }
              }
              psVar33[(long)local_4d0] = (sel_t)uVar31;
              local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
              psVar59[lVar47] = (sel_t)uVar31;
              lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
              uVar48 = uVar48 + 1;
              lVar49 = lVar49 + 0x10;
            } while (count != uVar48);
            return (idx_t)local_4d0;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar33 = (true_sel.ptr)->sel_vector;
            lVar47 = 8;
            uVar48 = 0;
            local_4d0 = (sel_t *)0x0;
            do {
              uVar31 = uVar48;
              if (psVar58 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar58[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                lVar54 = (long)*(int *)(pdVar11 + lVar47 + -4) +
                         *(long *)(pdVar11 + lVar47) / 86400000000;
                lVar66 = (long)*(int *)(pdVar11 + lVar47 + -8) + lVar54 / 0x1e;
                lVar49 = (long)*(int *)(pdVar13 + lVar47 + -4) +
                         *(long *)(pdVar13 + lVar47) / 86400000000;
                lVar51 = (long)*(int *)(pdVar13 + lVar47 + -8) + lVar49 / 0x1e;
                bVar68 = true;
                if (lVar66 <= lVar51) {
                  if (lVar66 < lVar51) {
                    bVar68 = false;
                  }
                  else {
                    lVar54 = lVar54 % 0x1e;
                    lVar49 = lVar49 % 0x1e;
                    if (lVar54 <= lVar49) {
                      bVar68 = *(long *)(pdVar13 + lVar47) % 86400000000 <
                               *(long *)(pdVar11 + lVar47) % 86400000000 && lVar49 <= lVar54;
                    }
                  }
                }
              }
              psVar33[(long)local_4d0] = (sel_t)uVar31;
              local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
              uVar48 = uVar48 + 1;
              lVar47 = lVar47 + 0x10;
            } while (count != uVar48);
            return (idx_t)local_4d0;
          }
          if (count == 0) {
            lVar47 = 0;
          }
          else {
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar33 = (false_sel.ptr)->sel_vector;
            lVar49 = 8;
            lVar47 = 0;
            uVar48 = 0;
            do {
              uVar31 = uVar48;
              if (psVar58 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar58[uVar48];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar14[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                lVar66 = (long)*(int *)(pdVar11 + lVar49 + -4) +
                         *(long *)(pdVar11 + lVar49) / 86400000000;
                lVar54 = (long)*(int *)(pdVar11 + lVar49 + -8) + lVar66 / 0x1e;
                lVar51 = (long)*(int *)(pdVar13 + lVar49 + -4) +
                         *(long *)(pdVar13 + lVar49) / 86400000000;
                lVar67 = (long)*(int *)(pdVar13 + lVar49 + -8) + lVar51 / 0x1e;
                bVar68 = true;
                if (lVar54 <= lVar67) {
                  if (lVar54 < lVar67) {
                    bVar68 = false;
                  }
                  else {
                    lVar66 = lVar66 % 0x1e;
                    lVar51 = lVar51 % 0x1e;
                    if (lVar66 <= lVar51) {
                      bVar68 = *(long *)(pdVar13 + lVar49) % 86400000000 <
                               *(long *)(pdVar11 + lVar49) % 86400000000 && lVar51 <= lVar66;
                    }
                  }
                }
              }
              psVar33[lVar47] = (sel_t)uVar31;
              lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
              uVar48 = uVar48 + 1;
              lVar49 = lVar49 + 0x10;
            } while (count != uVar48);
          }
          goto LAB_00b63ebe;
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) {
                local_4b0 = 0;
                local_4c8 = local_4b0;
              }
              else {
                psVar58 = (sel.ptr)->sel_vector;
                lVar47 = *(long *)local_4a8;
                psVar33 = *(sel_t **)local_438;
                local_4b0 = 0;
                uVar48 = 0;
                do {
                  uVar31 = uVar48;
                  if (psVar58 != (sel_t *)0x0) {
                    uVar31 = (ulong)psVar58[uVar48];
                  }
                  uVar61 = uVar48;
                  if (lVar47 != 0) {
                    uVar61 = (ulong)*(uint *)(lVar47 + uVar48 * 4);
                  }
                  uVar60 = uVar48;
                  if (psVar33 != (sel_t *)0x0) {
                    uVar60 = (ulong)psVar33[uVar48];
                  }
                  lVar54 = uVar60 * 0x10;
                  lVar49 = (long)*(int *)(LStack_4a0._0_8_ + uVar61 * 0x10 + 4) +
                           *(long *)(LStack_4a0._0_8_ + (uVar61 * 2 + 1) * 8) / 86400000000;
                  lVar66 = lVar49 % 0x1e;
                  lVar67 = (long)*(int *)(LStack_4a0._0_8_ + uVar61 * 0x10) + lVar49 / 0x1e;
                  lVar51 = (long)*(int *)(LStack_430._0_8_ + lVar54 + 4) +
                           *(long *)(LStack_430._0_8_ + lVar54 + 8) / 86400000000;
                  lVar49 = lVar51 % 0x1e;
                  lVar51 = (long)*(int *)(LStack_430._0_8_ + lVar54) + lVar51 / 0x1e;
                  if ((lVar67 <= lVar51) &&
                     ((lVar67 < lVar51 ||
                      ((lVar66 <= lVar49 &&
                       ((lVar66 < lVar49 ||
                        (*(long *)(LStack_4a0._0_8_ + (uVar61 * 2 + 1) * 8) % 86400000000 <=
                         *(long *)(LStack_430._0_8_ + lVar54 + 8) % 86400000000)))))))) {
                    (false_sel.ptr)->sel_vector[local_4b0] = (sel_t)uVar31;
                    local_4b0 = local_4b0 + 1;
                  }
                  uVar48 = uVar48 + 1;
                  local_4c8 = local_4b0;
                } while (count != uVar48);
              }
LAB_00b63ef0:
              local_4d0 = (sel_t *)(count - local_4c8);
            }
            else {
              if (count == 0) goto LAB_00b6121b;
              psVar58 = (sel.ptr)->sel_vector;
              lVar47 = *(long *)local_4a8;
              psVar33 = *(sel_t **)local_438;
              iVar34 = 0;
              local_4d0 = (sel_t *)0x0;
              do {
                iVar23 = iVar34;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar34];
                }
                iVar29 = iVar34;
                if (lVar47 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar33 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar33[iVar34];
                }
                lVar54 = iVar35 * 0x10;
                lVar49 = (long)*(int *)(LStack_4a0._0_8_ + iVar29 * 0x10 + 4) +
                         *(long *)(LStack_4a0._0_8_ + (iVar29 * 2 + 1) * 8) / 86400000000;
                lVar66 = lVar49 % 0x1e;
                lVar67 = (long)*(int *)(LStack_4a0._0_8_ + iVar29 * 0x10) + lVar49 / 0x1e;
                lVar51 = (long)*(int *)(LStack_430._0_8_ + lVar54 + 4) +
                         *(long *)(LStack_430._0_8_ + lVar54 + 8) / 86400000000;
                lVar49 = lVar51 % 0x1e;
                lVar51 = (long)*(int *)(LStack_430._0_8_ + lVar54) + lVar51 / 0x1e;
                if ((lVar51 < lVar67) ||
                   ((lVar51 <= lVar67 &&
                    ((lVar49 < lVar66 ||
                     ((lVar49 <= lVar66 &&
                      (*(long *)(LStack_430._0_8_ + lVar54 + 8) % 86400000000 <
                       *(long *)(LStack_4a0._0_8_ + (iVar29 * 2 + 1) * 8) % 86400000000)))))))) {
                  (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
                  local_4d0 = (sel_t *)((long)local_4d0 + 1);
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
            }
          }
          else if (count == 0) {
LAB_00b6121b:
            local_4d0 = (sel_t *)0x0;
          }
          else {
            psVar58 = (sel.ptr)->sel_vector;
            lVar47 = *(long *)local_4a8;
            local_3c8 = *(sel_t **)local_438;
            local_388 = (sel_t *)0x0;
            local_4d0 = (sel_t *)0x0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar34];
              }
              iVar29 = iVar34;
              if (lVar47 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (local_3c8 != (sel_t *)0x0) {
                iVar35 = (idx_t)local_3c8[iVar34];
              }
              lVar66 = iVar35 * 0x10;
              lVar49 = (long)*(int *)(LStack_4a0._0_8_ + iVar29 * 0x10 + 4) +
                       *(long *)(LStack_4a0._0_8_ + (iVar29 * 2 + 1) * 8) / 86400000000;
              lVar67 = lVar49 % 0x1e;
              lVar54 = (long)*(int *)(LStack_4a0._0_8_ + iVar29 * 0x10) + lVar49 / 0x1e;
              lVar51 = (long)*(int *)(LStack_430._0_8_ + lVar66 + 4) +
                       *(long *)(LStack_430._0_8_ + lVar66 + 8) / 86400000000;
              lVar49 = lVar51 % 0x1e;
              lVar51 = (long)*(int *)(LStack_430._0_8_ + lVar66) + lVar51 / 0x1e;
              if ((lVar51 < lVar54) ||
                 ((lVar51 <= lVar54 &&
                  ((lVar49 < lVar67 ||
                   ((lVar49 <= lVar67 &&
                    (*(long *)(LStack_430._0_8_ + lVar66 + 8) % 86400000000 <
                     *(long *)(LStack_4a0._0_8_ + (iVar29 * 2 + 1) * 8) % 86400000000)))))))) {
                psVar33 = local_4d0;
                oVar30.ptr = true_sel.ptr;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              else {
                psVar33 = local_388;
                oVar30.ptr = false_sel.ptr;
                local_388 = (sel_t *)((long)local_388 + 1);
              }
              (oVar30.ptr)->sel_vector[(long)psVar33] = (sel_t)iVar23;
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) {
              local_4c8 = 0;
            }
            else {
              psVar58 = (sel.ptr)->sel_vector;
              lVar47 = *(long *)local_4a8;
              psVar33 = *(sel_t **)local_438;
              local_4c8 = 0;
              iVar34 = 0;
              do {
                iVar23 = iVar34;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar34];
                }
                iVar29 = iVar34;
                if (lVar47 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar33 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar33[iVar34];
                }
                if (LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) !=
                           0;
                }
                if (LStack_430.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f)
                           & 1) == 0;
                }
                if (bVar68 && !bVar69) {
                  piVar55 = (int *)(LStack_4a0._0_8_ + iVar29 * 0x10);
                  piVar43 = (int *)(LStack_430._0_8_ + iVar35 * 0x10);
                  lVar49 = (long)piVar55[1] + *(long *)(piVar55 + 2) / 86400000000;
                  lVar54 = lVar49 % 0x1e;
                  lVar66 = (long)*piVar55 + lVar49 / 0x1e;
                  lVar51 = (long)piVar43[1] + *(long *)(piVar43 + 2) / 86400000000;
                  lVar49 = lVar51 % 0x1e;
                  lVar51 = (long)*piVar43 + lVar51 / 0x1e;
                  if (lVar66 <= lVar51) {
                    if (lVar66 < lVar51) goto LAB_00b63055;
                    if (lVar54 <= lVar49) {
                      bVar68 = *(long *)(piVar43 + 2) % 86400000000 <
                               *(long *)(piVar55 + 2) % 86400000000 && lVar49 <= lVar54;
                      goto LAB_00b62f58;
                    }
                  }
                }
                else {
LAB_00b62f58:
                  if (!bVar68) {
LAB_00b63055:
                    (false_sel.ptr)->sel_vector[local_4c8] = (sel_t)iVar23;
                    local_4c8 = local_4c8 + 1;
                  }
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
            }
            goto LAB_00b63ef0;
          }
          if (count == 0) goto LAB_00b6121b;
          psVar58 = (sel.ptr)->sel_vector;
          lVar47 = *(long *)local_4a8;
          psVar33 = *(sel_t **)local_438;
          iVar34 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar34];
            }
            iVar29 = iVar34;
            if (lVar47 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar33 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar33[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) != 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if (bVar68 && !bVar69) {
              piVar43 = (int *)(LStack_4a0._0_8_ + iVar29 * 0x10);
              piVar55 = (int *)(LStack_430._0_8_ + iVar35 * 0x10);
              lVar49 = (long)piVar43[1] + *(long *)(piVar43 + 2) / 86400000000;
              lVar54 = lVar49 % 0x1e;
              lVar66 = (long)*piVar43 + lVar49 / 0x1e;
              lVar51 = (long)piVar55[1] + *(long *)(piVar55 + 2) / 86400000000;
              lVar49 = lVar51 % 0x1e;
              lVar51 = (long)*piVar55 + lVar51 / 0x1e;
              if (lVar66 <= lVar51) {
                if (lVar66 < lVar51) goto LAB_00b611ee;
                if (lVar54 <= lVar49) {
                  bVar68 = *(long *)(piVar55 + 2) % 86400000000 <
                           *(long *)(piVar43 + 2) % 86400000000 && lVar49 <= lVar54;
                  goto LAB_00b610d4;
                }
              }
LAB_00b611d1:
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
              local_4d0 = (sel_t *)((long)local_4d0 + 1);
            }
            else {
LAB_00b610d4:
              if (bVar68) goto LAB_00b611d1;
            }
LAB_00b611ee:
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
        else {
          if (count == 0) goto LAB_00b6121b;
          psVar58 = (sel.ptr)->sel_vector;
          lVar47 = *(long *)local_4a8;
          psVar33 = *(sel_t **)local_438;
          local_3c8 = (sel_t *)0x0;
          iVar34 = 0;
          psVar59 = (sel_t *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar34];
            }
            iVar29 = iVar34;
            if (lVar47 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar47 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar33 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar33[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) != 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if (bVar68 && !bVar69) {
              piVar55 = (int *)(LStack_4a0._0_8_ + iVar29 * 0x10);
              piVar43 = (int *)(LStack_430._0_8_ + iVar35 * 0x10);
              lVar49 = (long)piVar55[1] + *(long *)(piVar55 + 2) / 86400000000;
              lVar54 = lVar49 % 0x1e;
              lVar66 = (long)*piVar55 + lVar49 / 0x1e;
              lVar51 = (long)piVar43[1] + *(long *)(piVar43 + 2) / 86400000000;
              lVar49 = lVar51 % 0x1e;
              lVar51 = (long)*piVar43 + lVar51 / 0x1e;
              if (lVar66 <= lVar51) {
                if (lVar66 < lVar51) goto LAB_00b5f749;
                if (lVar54 <= lVar49) {
                  bVar68 = *(long *)(piVar43 + 2) % 86400000000 <
                           *(long *)(piVar55 + 2) % 86400000000 && lVar49 <= lVar54;
                  goto LAB_00b5f635;
                }
              }
LAB_00b5f734:
              local_4d0 = (sel_t *)((long)psVar59 + 1);
              psVar57 = psVar59;
              oVar30.ptr = true_sel.ptr;
            }
            else {
LAB_00b5f635:
              if (bVar68) goto LAB_00b5f734;
LAB_00b5f749:
              psVar57 = local_3c8;
              oVar30.ptr = false_sel.ptr;
              local_4d0 = psVar59;
              local_3c8 = (sel_t *)((long)local_3c8 + 1);
            }
            (oVar30.ptr)->sel_vector[(long)psVar57] = (sel_t)iVar23;
            iVar34 = iVar34 + 1;
            psVar59 = local_4d0;
          } while (count != iVar34);
        }
        if (local_3f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f8._M_pi);
        }
        if (local_418._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_418._M_pi);
        }
        if (local_468._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_468._M_pi);
        }
        goto LAB_00b60c62;
      }
      pdVar11 = left->data;
      piVar43 = (int *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      local_488._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b60c4d;
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar33 = (false_sel.ptr)->sel_vector;
          plVar36 = (long *)(pdVar11 + 8);
          lVar47 = 0;
          uVar48 = 0;
          do {
            uVar31 = uVar48;
            if (psVar58 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar58[uVar48];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              lVar54 = (long)*(int *)((long)plVar36 + -4) + *plVar36 / 86400000000;
              lVar66 = (long)(int)plVar36[-1] + lVar54 / 0x1e;
              lVar49 = (long)piVar43[1] + *(long *)(piVar43 + 2) / 86400000000;
              lVar51 = (long)*piVar43 + lVar49 / 0x1e;
              bVar68 = true;
              if (lVar66 <= lVar51) {
                if (lVar66 < lVar51) {
                  bVar68 = false;
                }
                else {
                  lVar54 = lVar54 % 0x1e;
                  lVar49 = lVar49 % 0x1e;
                  if (lVar54 <= lVar49) {
                    bVar68 = *(long *)(piVar43 + 2) % 86400000000 < *plVar36 % 86400000000 &&
                             lVar49 <= lVar54;
                  }
                }
              }
            }
            psVar33[lVar47] = (sel_t)uVar31;
            lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
            uVar48 = uVar48 + 1;
            plVar36 = plVar36 + 2;
          } while (count != uVar48);
          goto LAB_00b60c50;
        }
        if (count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar33 = (true_sel.ptr)->sel_vector;
          plVar36 = (long *)(pdVar11 + 8);
          uVar48 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            uVar31 = uVar48;
            if (psVar58 != (sel_t *)0x0) {
              uVar31 = (ulong)psVar58[uVar48];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              lVar49 = (long)*(int *)((long)plVar36 + -4) + *plVar36 / 86400000000;
              lVar54 = (long)(int)plVar36[-1] + lVar49 / 0x1e;
              lVar47 = (long)piVar43[1] + *(long *)(piVar43 + 2) / 86400000000;
              lVar51 = (long)*piVar43 + lVar47 / 0x1e;
              bVar68 = true;
              if (lVar54 <= lVar51) {
                if (lVar54 < lVar51) {
                  bVar68 = false;
                }
                else {
                  lVar49 = lVar49 % 0x1e;
                  lVar47 = lVar47 % 0x1e;
                  if (lVar49 <= lVar47) {
                    bVar68 = *(long *)(piVar43 + 2) % 86400000000 < *plVar36 % 86400000000 &&
                             lVar47 <= lVar49;
                  }
                }
              }
            }
            psVar33[(long)local_4d0] = (sel_t)uVar31;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar48 = uVar48 + 1;
            plVar36 = plVar36 + 2;
          } while (count != uVar48);
          goto LAB_00b60c62;
        }
      }
      else if (count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_3c8 = (true_sel.ptr)->sel_vector;
        psVar33 = (false_sel.ptr)->sel_vector;
        plVar36 = (long *)(pdVar11 + 8);
        lVar47 = 0;
        local_4d0 = (sel_t *)0x0;
        uVar48 = 0;
        do {
          uVar31 = uVar48;
          if (psVar58 != (sel_t *)0x0) {
            uVar31 = (ulong)psVar58[uVar48];
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (puVar5[uVar48 >> 6] >> (uVar48 & 0x3f) & 1) != 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (bVar68 == true && !bVar69) {
            lVar54 = (long)*(int *)((long)plVar36 + -4) + *plVar36 / 86400000000;
            lVar51 = (long)(int)plVar36[-1] + lVar54 / 0x1e;
            lVar49 = (long)piVar43[1] + *(long *)(piVar43 + 2) / 86400000000;
            lVar66 = (long)*piVar43 + lVar49 / 0x1e;
            bVar68 = true;
            if (lVar51 <= lVar66) {
              if (lVar51 < lVar66) {
                bVar68 = false;
              }
              else {
                lVar54 = lVar54 % 0x1e;
                lVar49 = lVar49 % 0x1e;
                if (lVar54 <= lVar49) {
                  bVar68 = *(long *)(piVar43 + 2) % 86400000000 < *plVar36 % 86400000000 &&
                           lVar49 <= lVar54;
                }
              }
            }
          }
          local_3c8[(long)local_4d0] = (sel_t)uVar31;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          psVar33[lVar47] = (sel_t)uVar31;
          lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
          uVar48 = uVar48 + 1;
          plVar36 = plVar36 + 2;
        } while (count != uVar48);
        goto LAB_00b60c62;
      }
    }
LAB_00b5df1f:
    local_4d0 = (sel_t *)0x0;
    local_488._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         LStack_4a0.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_00b60c62:
    if ((element_type *)local_488._M_pi != (element_type *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_488._M_pi);
      return (idx_t)local_4d0;
    }
    return (idx_t)local_4d0;
  case LIST:
  case STRUCT:
  case ARRAY:
    local_218.ptr = false_sel.ptr;
    local_210.ptr = true_sel.ptr;
    local_208.ptr = sel.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_208.ptr = FlatVector::IncrementalSelectionVector();
    }
    SelectionVector::SelectionVector(&local_118,count);
    OptionalSelection::OptionalSelection(&local_150,&local_118);
    SelectionVector::SelectionVector(&local_130,count);
    OptionalSelection::OptionalSelection(&local_1b8,&local_130);
    SelectionVector::SelectionVector((SelectionVector *)(local_368 + 0x28),count);
    Vector::Vector(&local_100,left);
    Vector::Vector(&local_98,right);
    optional_ptr<const_duckdb::SelectionVector,_true>::CheckValid(&local_208);
    oVar46.ptr = local_208.ptr;
    local_200.sel = (SelectionVector *)null_mask.ptr;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
    Vector::ToUnifiedFormat(&local_100,count,(UnifiedVectorFormat *)local_4a8);
    Vector::ToUnifiedFormat(&local_98,count,(UnifiedVectorFormat *)local_438);
    if (LStack_430.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (count == 0) {
        local_4b0 = 0;
        uVar48 = 0;
      }
      else {
        psVar58 = (oVar46.ptr)->sel_vector;
        local_4b0 = 0;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar58 != (sel_t *)0x0) {
            sVar44 = psVar58[iVar34];
          }
          *(sel_t *)(local_368._40_8_ + iVar34 * 4) = sVar44;
          iVar34 = iVar34 + 1;
          uVar48 = count;
        } while (count != iVar34);
      }
    }
    else {
      SelectionVector::SelectionVector((SelectionVector *)&local_288,count);
      if (count == 0) {
        local_4b0 = 0;
        local_4d8.ptr = (ValidityMask *)0x0;
        uVar48 = 0;
      }
      else {
        local_4b0 = 0;
        uVar48 = 0;
        uVar31 = 0;
        local_4d8.ptr = (ValidityMask *)0x0;
        do {
          psVar58 = (oVar46.ptr)->sel_vector;
          uVar61 = uVar31;
          if (psVar58 != (sel_t *)0x0) {
            uVar61 = (ulong)psVar58[uVar31];
          }
          uVar60 = uVar31;
          if (*(long *)local_4a8 != 0) {
            uVar60 = (ulong)*(uint *)(*(long *)local_4a8 + uVar31 * 4);
          }
          uVar21 = uVar31;
          if (*(sel_t **)local_438 != (sel_t *)0x0) {
            uVar21 = (ulong)(*(sel_t **)local_438)[uVar31];
          }
          if (LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (uVar60 >> 6) * 8) >> (uVar60 & 0x3f) & 1) != 0;
          }
          if (LStack_430.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = ((ulong)(&(LStack_430.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[uVar21 >> 6] >> (uVar21 & 0x3f) & 1)
                     == 0;
          }
          sVar44 = (sel_t)uVar61;
          if ((bool)(bVar68 ^ 1U | bVar69)) {
            if (local_200.sel != (SelectionVector *)0x0) {
              optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                        ((optional_ptr<duckdb::ValidityMask,_true> *)&local_200);
              pSVar1 = local_200.sel;
              if (((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)->
                  validity_mask == (unsigned_long *)0x0) {
                local_198.sel = (SelectionVector *)local_200.sel[1].sel_vector;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)local_328,(unsigned_long *)&local_198);
                auVar19 = local_328;
                uVar17 = aLStack_320[0]._0_8_;
                _local_328 = (undefined1  [16])0x0;
                p_Var25 = (pSVar1->selection_data).internal.
                          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
                (pSVar1->selection_data).internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)auVar19;
                (pSVar1->selection_data).internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar17;
                if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var25);
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_320[0]._0_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_320[0]._0_8_);
                }
                pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                      *)&pSVar1->selection_data);
                ((TemplatedValidityMask<unsigned_long> *)&pSVar1->sel_vector)->validity_mask =
                     (unsigned_long *)
                     (pTVar26->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>;
              }
              bVar15 = (byte)uVar61 & 0x3f;
              puVar10 = ((TemplatedValidityMask<unsigned_long> *)&pSVar1->sel_vector)->validity_mask
                        + (uVar61 >> 6);
              *puVar10 = *puVar10 & (-2L << bVar15 | 0xfffffffffffffffeU >> 0x40 - bVar15);
            }
            if (bVar68) {
              if (local_150.sel != (SelectionVector *)0x0) {
                (local_150.sel)->sel_vector[local_4b0] = sVar44;
              }
              local_4b0 = local_4b0 + 1;
            }
            else {
              if (local_1b8.sel != (SelectionVector *)0x0) {
                (local_1b8.sel)->sel_vector[(long)local_4d8.ptr] = sVar44;
              }
              local_4d8.ptr = (ValidityMask *)((long)local_4d8.ptr + 1);
            }
          }
          else {
            *(sel_t *)(local_288._0_8_ + uVar48 * 4) = (sel_t)uVar31;
            *(sel_t *)(local_368._40_8_ + uVar48 * 4) = sVar44;
            uVar48 = uVar48 + 1;
          }
          uVar31 = uVar31 + 1;
        } while (count != uVar31);
      }
      pSVar1 = local_150.sel;
      if (local_150.sel != (SelectionVector *)0x0) {
        psVar58 = (local_150.sel)->sel_vector;
        p_Var25 = ((local_150.sel)->selection_data).internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        ((local_150.sel)->selection_data).internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> =
             (__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>)0x0;
        if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var25);
        }
        pSVar1->sel_vector = psVar58 + local_4b0;
      }
      pSVar1 = local_1b8.sel;
      if (local_1b8.sel != (SelectionVector *)0x0) {
        psVar58 = (local_1b8.sel)->sel_vector;
        p_Var25 = ((local_1b8.sel)->selection_data).internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        ((local_1b8.sel)->selection_data).internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> =
             (__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>)0x0;
        if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var25);
        }
        pSVar1->sel_vector = psVar58 + (long)local_4d8.ptr;
      }
      if (uVar48 < count && uVar48 != 0) {
        Vector::Slice(&local_100,(SelectionVector *)&local_288,uVar48);
        Vector::Slice(&local_98,(SelectionVector *)&local_288,uVar48);
      }
      if (local_288.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_288.type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
    }
    if (local_3f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f8._M_pi);
    }
    if (local_418._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_418._M_pi);
    }
    if (local_468._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_468._M_pi);
    }
    if (local_488._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_488._M_pi);
    }
    PVar2 = (left->type).physical_type_;
    if (PVar2 == LIST) {
      local_3c0 = (optional_ptr<duckdb::ValidityMask,_true>)
                  (optional_ptr<duckdb::ValidityMask,_true>)null_mask.ptr;
      if (uVar48 == 0) goto LAB_00b56087;
      SelectionVector::SelectionVector(&local_3b8,uVar48);
      SelectionVector::SelectionVector(&local_380,uVar48);
      pVVar22 = ListVector::GetEntry(&local_100);
      Vector::Vector((Vector *)local_4a8,pVVar22);
      pVVar22 = ListVector::GetEntry(&local_98);
      Vector::Vector((Vector *)local_438,pVVar22);
      iVar34 = ListVector::GetListSize(&local_100);
      Vector::Flatten((Vector *)local_4a8,iVar34);
      iVar34 = ListVector::GetListSize(&local_98);
      Vector::Flatten((Vector *)local_438,iVar34);
      Vector::Vector(&local_288,(Vector *)local_4a8,&local_3b8,uVar48);
      Vector::Vector((Vector *)local_328,(Vector *)local_438,&local_380,uVar48);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_198);
      Vector::ToUnifiedFormat(&local_100,uVar48,&local_198);
      pdVar13 = local_198.data;
      UnifiedVectorFormat::UnifiedVectorFormat(&local_200);
      Vector::ToUnifiedFormat(&local_98,uVar48,&local_200);
      pdVar11 = local_200.data;
      SelectionVector::SelectionVector(&local_3a0,uVar48);
      auVar16 = _DAT_01352200;
      lVar47 = uVar48 - 1;
      auVar72._8_4_ = (int)lVar47;
      auVar72._0_8_ = lVar47;
      auVar72._12_4_ = (int)((ulong)lVar47 >> 0x20);
      uVar31 = 0;
      auVar72 = auVar72 ^ _DAT_01352200;
      auVar74 = _DAT_0135a310;
      do {
        auVar75 = auVar74 ^ auVar16;
        if ((bool)(~(auVar75._4_4_ == auVar72._4_4_ && auVar72._0_4_ < auVar75._0_4_ ||
                    auVar72._4_4_ < auVar75._4_4_) & 1)) {
          local_3a0.sel_vector[uVar31] = (sel_t)uVar31;
        }
        if ((auVar75._12_4_ != auVar72._12_4_ || auVar75._8_4_ <= auVar72._8_4_) &&
            auVar75._12_4_ <= auVar72._12_4_) {
          local_3a0.sel_vector[uVar31 + 1] = (sel_t)uVar31 + 1;
        }
        uVar31 = uVar31 + 2;
        lVar47 = auVar74._8_8_;
        auVar74._0_8_ = auVar74._0_8_ + 2;
        auVar74._8_8_ = lVar47 + 2;
      } while ((uVar48 + 1 & 0xfffffffffffffffe) != uVar31);
      SelectionVector::SelectionVector(&local_2a0,uVar48);
      SelectionVector::SelectionVector(&local_2b8,uVar48);
      local_368._0_16_ = (undefined1  [16])0x0;
      local_368._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_368._24_8_ = (element_type *)0x800;
      if (local_3c0.ptr == (ValidityMask *)0x0) {
        oVar32.ptr = (ValidityMask *)0x0;
      }
      else {
        optional_ptr<duckdb::ValidityMask,_true>::CheckValid(&local_3c0);
        peVar24 = (element_type *)ValidityMask::Capacity(local_3c0.ptr);
        uVar17 = local_368._16_8_;
        local_368._0_16_ = (undefined1  [16])0x0;
        local_368._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar17 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar17);
        }
        oVar32.ptr = (ValidityMask *)local_368;
        local_368._24_8_ = peVar24;
      }
      local_4d0 = (sel_t *)0x0;
      uVar31 = 0;
      do {
        pSVar1 = local_150.sel;
        psVar58 = (local_198.sel)->sel_vector;
        uVar61 = 0;
        do {
          uVar60 = uVar61;
          if (local_3a0.sel_vector != (sel_t *)0x0) {
            uVar60 = (ulong)local_3a0.sel_vector[uVar61];
          }
          if (psVar58 != (sel_t *)0x0) {
            uVar60 = (ulong)psVar58[uVar60];
          }
          iVar42 = (int)uVar31;
          local_3b8.sel_vector[uVar61] = *(int *)((long)local_198.data + uVar60 * 2 * 8) + iVar42;
          uVar61 = uVar61 + 1;
        } while (uVar48 != uVar61);
        puVar5 = ((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)->
                 validity_mask;
        uVar61 = 0;
        do {
          uVar60 = uVar61;
          if (local_3a0.sel_vector != (sel_t *)0x0) {
            uVar60 = (ulong)local_3a0.sel_vector[uVar61];
          }
          if (puVar5 != (unsigned_long *)0x0) {
            uVar60 = (ulong)*(uint *)((long)puVar5 + uVar60 * 4);
          }
          *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_380.sel_vector)->
                          validity_mask + uVar61 * 4) =
               *(int *)(local_200.data + uVar60 * 0x10) + iVar42;
          uVar61 = uVar61 + 1;
        } while (uVar48 != uVar61);
        uVar61 = 0;
        uVar60 = 0;
        lVar47 = 0;
        lVar49 = 0;
        do {
          uVar21 = uVar61;
          if (local_3a0.sel_vector != (sel_t *)0x0) {
            uVar21 = (ulong)local_3a0.sel_vector[uVar61];
          }
          uVar50 = uVar21;
          if (psVar58 != (sel_t *)0x0) {
            uVar50 = (ulong)psVar58[uVar21];
          }
          uVar53 = uVar21;
          if (puVar5 != (unsigned_long *)0x0) {
            uVar53 = (ulong)*(uint *)((long)puVar5 + uVar21 * 4);
          }
          if ((*(ulong *)((long)pdVar13 + (uVar50 * 2 + 1) * 8) == uVar31) ||
             (*(ulong *)(pdVar11 + uVar53 * 0x10 + 8) == uVar31)) {
            if (local_368._40_8_ != 0) {
              uVar21 = (ulong)*(uint *)(local_368._40_8_ + uVar21 * 4);
            }
            if (*(ulong *)(pdVar11 + uVar53 * 0x10 + 8) <
                *(ulong *)((long)pdVar13 + (uVar50 * 2 + 1) * 8)) {
              if (local_150.sel != (SelectionVector *)0x0) {
                (local_150.sel)->sel_vector[lVar47] = (sel_t)uVar21;
              }
              lVar47 = lVar47 + 1;
            }
            else {
              if (local_1b8.sel != (SelectionVector *)0x0) {
                (local_1b8.sel)->sel_vector[lVar49] = (sel_t)uVar21;
              }
              lVar49 = lVar49 + 1;
            }
          }
          else {
            local_2a0.sel_vector[uVar60] = (sel_t)uVar21;
            uVar60 = uVar60 + 1;
          }
          uVar61 = uVar61 + 1;
        } while (uVar48 != uVar61);
        if (local_150.sel != (SelectionVector *)0x0) {
          psVar58 = (local_150.sel)->sel_vector;
          p_Var25 = ((local_150.sel)->selection_data).internal.
                    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          ((local_150.sel)->selection_data).internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> =
               (__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>)0x0;
          if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var25);
          }
          pSVar1->sel_vector = psVar58 + lVar47;
        }
        pSVar1 = local_1b8.sel;
        if (local_1b8.sel != (SelectionVector *)0x0) {
          psVar58 = (local_1b8.sel)->sel_vector;
          p_Var25 = ((local_1b8.sel)->selection_data).internal.
                    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          ((local_1b8.sel)->selection_data).internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> =
               (__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>)0x0;
          if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var25);
          }
          pSVar1->sel_vector = psVar58 + lVar49;
        }
        if (uVar60 < uVar48) {
          if (uVar60 != 0) {
            uVar48 = 0;
            do {
              sVar44 = (sel_t)uVar48;
              if (local_2a0.sel_vector != (sel_t *)0x0) {
                sVar44 = local_2a0.sel_vector[uVar48];
              }
              local_3a0.sel_vector[uVar48] = sVar44;
              uVar48 = uVar48 + 1;
            } while (uVar60 != uVar48);
          }
          if (uVar60 != 0) {
            psVar58 = (local_198.sel)->sel_vector;
            uVar48 = 0;
            do {
              uVar61 = uVar48;
              if (local_3a0.sel_vector != (sel_t *)0x0) {
                uVar61 = (ulong)local_3a0.sel_vector[uVar48];
              }
              if (psVar58 != (sel_t *)0x0) {
                uVar61 = (ulong)psVar58[uVar61];
              }
              local_3b8.sel_vector[uVar48] =
                   *(int *)((long)local_198.data + uVar61 * 2 * 8) + iVar42;
              uVar48 = uVar48 + 1;
            } while (uVar60 != uVar48);
          }
          uVar48 = uVar60;
          if (uVar60 != 0) {
            puVar5 = ((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)->
                     validity_mask;
            uVar61 = 0;
            do {
              uVar21 = uVar61;
              if (local_3a0.sel_vector != (sel_t *)0x0) {
                uVar21 = (ulong)local_3a0.sel_vector[uVar61];
              }
              if (puVar5 != (unsigned_long *)0x0) {
                uVar21 = (ulong)*(uint *)((long)puVar5 + uVar21 * 4);
              }
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_380.sel_vector)->
                              validity_mask + uVar61 * 4) =
                   *(int *)(local_200.data + uVar21 * 0x10) + iVar42;
              uVar61 = uVar61 + 1;
            } while (uVar60 != uVar61);
          }
        }
        iVar34 = TemplatedDistinctSelectOperation<duckdb::DistinctGreaterThan>
                           (&local_288,(Vector *)local_328,&local_3a0,uVar48,&local_2a0,&local_2b8,
                            oVar32);
        ExtractNestedMask(&local_3a0,uVar48,(SelectionVector *)(local_368 + 0x28),oVar32.ptr,
                          local_3c0);
        local_4d0 = (sel_t *)((long)local_4d0 + lVar47);
        if (iVar34 != 0) {
          oVar30.ptr = &local_2a0;
          if (uVar48 == iVar34) {
            oVar30.ptr = &local_3a0;
          }
          ExtractNestedSelection(oVar30.ptr,iVar34,(SelectionVector *)(local_368 + 0x28),&local_150)
          ;
          uVar48 = uVar48 - iVar34;
          if (uVar48 != 0) {
            uVar61 = 0;
            do {
              sVar44 = (sel_t)uVar61;
              if (local_2b8.sel_vector != (sel_t *)0x0) {
                sVar44 = local_2b8.sel_vector[uVar61];
              }
              local_3a0.sel_vector[uVar61] = sVar44;
              uVar61 = uVar61 + 1;
            } while (uVar48 != uVar61);
          }
          if (uVar48 != 0) {
            psVar58 = (local_198.sel)->sel_vector;
            uVar61 = 0;
            do {
              uVar60 = uVar61;
              if (local_3a0.sel_vector != (sel_t *)0x0) {
                uVar60 = (ulong)local_3a0.sel_vector[uVar61];
              }
              if (psVar58 != (sel_t *)0x0) {
                uVar60 = (ulong)psVar58[uVar60];
              }
              local_3b8.sel_vector[uVar61] =
                   *(int *)((long)local_198.data + uVar60 * 2 * 8) + iVar42;
              uVar61 = uVar61 + 1;
            } while (uVar48 != uVar61);
          }
          local_4d0 = (sel_t *)((long)local_4d0 + iVar34);
          if (uVar48 != 0) {
            puVar5 = ((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)->
                     validity_mask;
            uVar61 = 0;
            do {
              uVar60 = uVar61;
              if (local_3a0.sel_vector != (sel_t *)0x0) {
                uVar60 = (ulong)local_3a0.sel_vector[uVar61];
              }
              if (puVar5 != (unsigned_long *)0x0) {
                uVar60 = (ulong)*(uint *)((long)puVar5 + uVar60 * 4);
              }
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_380.sel_vector)->
                              validity_mask + uVar61 * 4) =
                   *(int *)(local_200.data + uVar60 * 0x10) + iVar42;
              uVar61 = uVar61 + 1;
            } while (uVar48 != uVar61);
          }
        }
        iVar34 = TemplatedDistinctSelectOperation<duckdb::DistinctFrom>
                           (&local_288,(Vector *)local_328,&local_3a0,uVar48,&local_2b8,&local_2a0,
                            oVar32);
        ExtractNestedMask(&local_3a0,uVar48,(SelectionVector *)(local_368 + 0x28),oVar32.ptr,
                          local_3c0);
        uVar48 = uVar48 - iVar34;
        oVar46.ptr = &local_2b8;
        if (uVar48 == 0) {
          oVar46.ptr = &local_3a0;
        }
        ExtractNestedSelection(oVar46.ptr,iVar34,(SelectionVector *)(local_368 + 0x28),&local_1b8);
        if (iVar34 != 0 && uVar48 != 0) {
          uVar61 = 0;
          do {
            sVar44 = (sel_t)uVar61;
            if (local_2a0.sel_vector != (sel_t *)0x0) {
              sVar44 = local_2a0.sel_vector[uVar61];
            }
            local_3a0.sel_vector[uVar61] = sVar44;
            uVar61 = uVar61 + 1;
          } while (uVar48 != uVar61);
        }
        uVar31 = uVar31 + 1;
      } while (uVar48 != 0);
LAB_00b59e8f:
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._16_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._16_8_);
      }
      if (local_2b8.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_2b8.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_2a0.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_2a0.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_3a0.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_3a0.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_200.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_200.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_200.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_200.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_198.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_198.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_198.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_198.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_2c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c8._M_pi);
      }
      if (local_2d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2d8._M_pi);
      }
      if (local_2f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2f0._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)(local_328 + 8));
      if (local_288.auxiliary.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_288.auxiliary.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_288.buffer.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_288.buffer.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_288.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_288.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)((long)&local_288 + 8));
      if (local_3d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3d8._M_pi);
      }
      if (local_3e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3e8._M_pi);
      }
      if (local_400._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_400._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)(local_438 + 8));
      if (local_448._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_448._M_pi);
      }
      if (local_458._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_458._M_pi);
      }
      if (local_470._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_470._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)(local_4a8 + 8));
      if (local_380.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_380.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_3b8.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_3b8.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
    }
    else {
      if (PVar2 == STRUCT) {
        local_380.sel_vector = (sel_t *)null_mask.ptr;
        if (uVar48 != 0) {
          _local_328 = (undefined1  [16])0x0;
          aLStack_320[0].type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_198.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          local_198.sel = (SelectionVector *)0x0;
          local_198.data = (data_ptr_t)0x0;
          this = StructVector::GetEntries(&local_100);
          this_00 = StructVector::GetEntries(&local_98);
          SelectionVector::SelectionVector((SelectionVector *)&local_200,uVar48);
          auVar16 = _DAT_01352200;
          lVar47 = uVar48 - 1;
          auVar71._8_4_ = (int)lVar47;
          auVar71._0_8_ = lVar47;
          auVar71._12_4_ = (int)((ulong)lVar47 >> 0x20);
          uVar31 = 0;
          auVar71 = auVar71 ^ _DAT_01352200;
          auVar75 = _DAT_0135a310;
          do {
            auVar74 = auVar75 ^ auVar16;
            if ((bool)(~(auVar74._4_4_ == auVar71._4_4_ && auVar71._0_4_ < auVar74._0_4_ ||
                        auVar71._4_4_ < auVar74._4_4_) & 1)) {
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)
                              ->validity_mask + uVar31 * 4) = (int)uVar31;
            }
            if ((auVar74._12_4_ != auVar71._12_4_ || auVar74._8_4_ <= auVar71._8_4_) &&
                auVar74._12_4_ <= auVar71._12_4_) {
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)
                              ->validity_mask + uVar31 * 4 + 4) = (int)uVar31 + 1;
            }
            uVar31 = uVar31 + 2;
            lVar47 = auVar75._8_8_;
            auVar75._0_8_ = auVar75._0_8_ + 2;
            auVar75._8_8_ = lVar47 + 2;
          } while ((uVar48 + 1 & 0xfffffffffffffffe) != uVar31);
          SelectionVector::SelectionVector((SelectionVector *)local_368,uVar48);
          SelectionVector::SelectionVector(&local_3b8,uVar48);
          local_288.vector_type = FLAT_VECTOR;
          local_288._1_7_ = 0;
          local_288.type.id_ = INVALID;
          local_288.type.physical_type_ = ~INVALID;
          local_288.type._2_6_ = 0;
          local_288.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_288.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
          if ((ValidityMask *)local_380.sel_vector == (ValidityMask *)0x0) {
            oVar32.ptr = (ValidityMask *)0x0;
          }
          else {
            optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                      ((optional_ptr<duckdb::ValidityMask,_true> *)&local_380);
            p_Var25 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ValidityMask::Capacity((ValidityMask *)local_380.sel_vector);
            peVar18 = local_288.type.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_288.vector_type = FLAT_VECTOR;
            local_288._1_7_ = 0;
            local_288.type.id_ = INVALID;
            local_288.type.physical_type_ = ~INVALID;
            local_288.type._2_6_ = 0;
            local_288.type.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            if (peVar18 != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            }
            oVar32.ptr = (ValidityMask *)&local_288;
            local_288.type.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = p_Var25;
          }
          if ((this->
              super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ).
              super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              (this->
              super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ).
              super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            local_4d0 = (sel_t *)0x0;
          }
          else {
            __n = 0;
            local_4d0 = (sel_t *)0x0;
            iVar34 = uVar48;
            do {
              pvVar27 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                        ::operator[](this,__n);
              pVVar28 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                        operator*(pvVar27);
              Vector::Vector((Vector *)local_4a8,pVVar28);
              Vector::Flatten((Vector *)local_4a8,uVar48);
              Vector::Slice((Vector *)local_4a8,(SelectionVector *)&local_200,iVar34);
              pvVar27 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                        ::operator[](this_00,__n);
              pVVar28 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                        operator*(pvVar27);
              Vector::Vector((Vector *)local_438,pVVar28);
              Vector::Flatten((Vector *)local_438,uVar48);
              Vector::Slice((Vector *)local_438,(SelectionVector *)&local_200,iVar34);
              iVar23 = TemplatedDistinctSelectOperation<duckdb::DistinctGreaterThan>
                                 ((Vector *)local_4a8,(Vector *)local_438,
                                  (SelectionVector *)&local_200,iVar34,(SelectionVector *)local_368,
                                  &local_3b8,oVar32);
              ExtractNestedMask((SelectionVector *)&local_200,iVar34,
                                (SelectionVector *)(local_368 + 0x28),oVar32.ptr,
                                (optional_ptr<duckdb::ValidityMask,_true>)local_380.sel_vector);
              if (iVar23 != 0) {
                slice_sel_00 = (UnifiedVectorFormat *)local_368;
                if (iVar34 == iVar23) {
                  slice_sel_00 = &local_200;
                }
                ExtractNestedSelection
                          ((SelectionVector *)slice_sel_00,iVar23,
                           (SelectionVector *)(local_368 + 0x28),&local_150);
                iVar34 = iVar34 - iVar23;
                if (iVar34 != 0) {
                  iVar29 = 0;
                  do {
                    sVar44 = (sel_t)iVar29;
                    if (local_3b8.sel_vector != (sel_t *)0x0) {
                      sVar44 = local_3b8.sel_vector[iVar29];
                    }
                    *(sel_t *)((long)&((TemplatedValidityMask<unsigned_long> *)
                                      &(local_200.sel)->sel_vector)->validity_mask + iVar29 * 4) =
                         sVar44;
                    iVar29 = iVar29 + 1;
                  } while (iVar34 != iVar29);
                }
                local_4d0 = (sel_t *)((long)local_4d0 + iVar23);
              }
              if (__n == ((long)(this->
                                super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ).
                                super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->
                                super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ).
                                super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U) {
                iVar23 = TemplatedDistinctSelectOperation<duckdb::DistinctGreaterThan>
                                   ((Vector *)local_4a8,(Vector *)local_438,
                                    (SelectionVector *)&local_200,iVar34,
                                    (SelectionVector *)local_368,&local_3b8,oVar32);
                pSVar1 = (SelectionVector *)(local_368 + 0x28);
                ExtractNestedMask((SelectionVector *)&local_200,iVar34,pSVar1,oVar32.ptr,
                                  (optional_ptr<duckdb::ValidityMask,_true>)local_380.sel_vector);
                oVar46.ptr = (SelectionVector *)local_368;
                if (iVar34 - iVar23 == 0) {
                  oVar46.ptr = (SelectionVector *)&local_200;
                }
                ExtractNestedSelection(oVar46.ptr,iVar23,pSVar1,&local_150);
                oVar46.ptr = &local_3b8;
                if (iVar23 == 0) {
                  oVar46.ptr = (SelectionVector *)&local_200;
                }
                ExtractNestedSelection(oVar46.ptr,iVar34 - iVar23,pSVar1,&local_1b8);
                local_4d0 = (sel_t *)((long)local_4d0 + iVar23);
              }
              else {
                iVar23 = TemplatedDistinctSelectOperation<duckdb::DistinctFrom>
                                   ((Vector *)local_4a8,(Vector *)local_438,
                                    (SelectionVector *)&local_200,iVar34,&local_3b8,
                                    (SelectionVector *)local_368,oVar32);
                ExtractNestedMask((SelectionVector *)&local_200,iVar34,
                                  (SelectionVector *)(local_368 + 0x28),oVar32.ptr,
                                  (optional_ptr<duckdb::ValidityMask,_true>)local_380.sel_vector);
                iVar34 = iVar34 - iVar23;
                oVar46.ptr = &local_3b8;
                if (iVar34 == 0) {
                  oVar46.ptr = (SelectionVector *)&local_200;
                }
                ExtractNestedSelection
                          (oVar46.ptr,iVar23,(SelectionVector *)(local_368 + 0x28),&local_1b8);
                if (iVar23 != 0 && iVar34 != 0) {
                  iVar23 = 0;
                  do {
                    uVar45 = (undefined4)iVar23;
                    if ((SelectionVector *)local_368._0_8_ != (SelectionVector *)0x0) {
                      uVar45 = *(undefined4 *)((long)(sel_t **)local_368._0_8_ + iVar23 * 4);
                    }
                    *(undefined4 *)
                     ((long)&((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)
                             ->validity_mask + iVar23 * 4) = uVar45;
                    iVar23 = iVar23 + 1;
                  } while (iVar34 != iVar23);
                }
              }
              if (local_3d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3d8._M_pi);
              }
              if (local_3e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3e8._M_pi);
              }
              if (local_400._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_400._M_pi);
              }
              LogicalType::~LogicalType((LogicalType *)(local_438 + 8));
              if (local_448._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_448._M_pi);
              }
              if (local_458._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_458._M_pi);
              }
              if (local_470._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_470._M_pi);
              }
              LogicalType::~LogicalType((LogicalType *)(local_4a8 + 8));
              __n = __n + 1;
            } while (__n < (ulong)((long)(this->
                                         super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                         ).
                                         super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->
                                         super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                         ).
                                         super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3));
          }
          if (local_288.type.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_288.type.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ;
          }
          if (local_3b8.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_3b8.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._16_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._16_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_200.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_200.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask);
          }
          ::std::
          vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     *)&local_198);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     *)local_328);
          goto LAB_00b5a051;
        }
      }
      else {
        if (PVar2 != ARRAY) {
          this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_4a8 = (undefined1  [8])&LStack_4a0.type_info_;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_4a8,"Unimplemented type for DISTINCT","");
          NotImplementedException::NotImplementedException(this_01,(string *)local_4a8);
          __cxa_throw(this_01,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        local_3c0 = (optional_ptr<duckdb::ValidityMask,_true>)
                    (optional_ptr<duckdb::ValidityMask,_true>)null_mask.ptr;
        if (uVar48 != 0) {
          iVar34 = ArrayType::GetSize(&local_100.type);
          SelectionVector::SelectionVector(&local_3b8,uVar48);
          SelectionVector::SelectionVector(&local_380,uVar48);
          pVVar22 = ArrayVector::GetEntry(&local_100);
          Vector::Vector((Vector *)local_4a8,pVVar22);
          pVVar22 = ArrayVector::GetEntry(&local_98);
          Vector::Vector((Vector *)local_438,pVVar22);
          iVar23 = ArrayVector::GetTotalSize(&local_100);
          Vector::Flatten((Vector *)local_4a8,iVar23);
          iVar23 = ArrayVector::GetTotalSize(&local_98);
          Vector::Flatten((Vector *)local_438,iVar23);
          Vector::Vector(&local_288,(Vector *)local_4a8,&local_3b8,uVar48);
          Vector::Vector((Vector *)local_328,(Vector *)local_438,&local_380,uVar48);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_198);
          Vector::ToUnifiedFormat(&local_100,uVar48,&local_198);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_200);
          Vector::ToUnifiedFormat(&local_98,uVar48,&local_200);
          SelectionVector::SelectionVector(&local_3a0,uVar48);
          auVar16 = _DAT_01352200;
          lVar47 = uVar48 - 1;
          auVar70._8_4_ = (int)lVar47;
          auVar70._0_8_ = lVar47;
          auVar70._12_4_ = (int)((ulong)lVar47 >> 0x20);
          uVar31 = 0;
          auVar70 = auVar70 ^ _DAT_01352200;
          auVar73 = _DAT_0135a310;
          do {
            auVar74 = auVar73 ^ auVar16;
            if ((bool)(~(auVar74._4_4_ == auVar70._4_4_ && auVar70._0_4_ < auVar74._0_4_ ||
                        auVar70._4_4_ < auVar74._4_4_) & 1)) {
              local_3a0.sel_vector[uVar31] = (sel_t)uVar31;
            }
            if ((auVar74._12_4_ != auVar70._12_4_ || auVar74._8_4_ <= auVar70._8_4_) &&
                auVar74._12_4_ <= auVar70._12_4_) {
              local_3a0.sel_vector[uVar31 + 1] = (sel_t)uVar31 + 1;
            }
            uVar31 = uVar31 + 2;
            lVar47 = auVar73._8_8_;
            auVar73._0_8_ = auVar73._0_8_ + 2;
            auVar73._8_8_ = lVar47 + 2;
          } while ((uVar48 + 1 & 0xfffffffffffffffe) != uVar31);
          SelectionVector::SelectionVector(&local_2a0,uVar48);
          SelectionVector::SelectionVector(&local_2b8,uVar48);
          local_368._0_16_ = (undefined1  [16])0x0;
          local_368._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_368._24_8_ = (element_type *)0x800;
          if (local_3c0.ptr == (ValidityMask *)0x0) {
            local_4d8.ptr = (ValidityMask *)0x0;
          }
          else {
            optional_ptr<duckdb::ValidityMask,_true>::CheckValid(&local_3c0);
            peVar24 = (element_type *)ValidityMask::Capacity(local_3c0.ptr);
            uVar17 = local_368._16_8_;
            local_368._0_16_ = (undefined1  [16])0x0;
            local_368._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar17 !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar17);
            }
            local_4d8.ptr = (ValidityMask *)local_368;
            local_368._24_8_ = peVar24;
          }
          iVar23 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            pSVar1 = local_150.sel;
            psVar58 = (local_198.sel)->sel_vector;
            uVar31 = 0;
            do {
              uVar61 = uVar31;
              if (local_3a0.sel_vector != (sel_t *)0x0) {
                uVar61 = (ulong)local_3a0.sel_vector[uVar31];
              }
              if (psVar58 != (sel_t *)0x0) {
                uVar61 = (ulong)psVar58[uVar61];
              }
              iVar56 = (int)iVar34;
              iVar42 = (int)iVar23;
              local_3b8.sel_vector[uVar31] = (int)uVar61 * iVar56 + iVar42;
              uVar31 = uVar31 + 1;
            } while (uVar48 != uVar31);
            puVar5 = ((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)->
                     validity_mask;
            uVar31 = 0;
            do {
              uVar61 = uVar31;
              if (local_3a0.sel_vector != (sel_t *)0x0) {
                uVar61 = (ulong)local_3a0.sel_vector[uVar31];
              }
              if (puVar5 != (unsigned_long *)0x0) {
                uVar61 = (ulong)*(uint *)((long)puVar5 + uVar61 * 4);
              }
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_380.sel_vector)->
                              validity_mask + uVar31 * 4) = (int)uVar61 * iVar56 + iVar42;
              uVar31 = uVar31 + 1;
            } while (uVar48 != uVar31);
            uVar31 = 0;
            uVar61 = 0;
            lVar47 = 0;
            do {
              uVar60 = uVar31;
              if (local_3a0.sel_vector != (sel_t *)0x0) {
                uVar60 = (ulong)local_3a0.sel_vector[uVar31];
              }
              if (iVar34 == iVar23) {
                if (local_368._40_8_ != 0) {
                  uVar60 = (ulong)*(uint *)(local_368._40_8_ + uVar60 * 4);
                }
                if (local_1b8.sel != (SelectionVector *)0x0) {
                  (local_1b8.sel)->sel_vector[lVar47] = (sel_t)uVar60;
                }
                lVar47 = lVar47 + 1;
              }
              else {
                local_2a0.sel_vector[uVar61] = (sel_t)uVar60;
                uVar61 = uVar61 + 1;
              }
              uVar31 = uVar31 + 1;
            } while (uVar48 != uVar31);
            if (local_150.sel != (SelectionVector *)0x0) {
              psVar58 = (local_150.sel)->sel_vector;
              p_Var25 = ((local_150.sel)->selection_data).internal.
                        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
              ((local_150.sel)->selection_data).internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> =
                   (__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>)0x0;
              if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var25);
              }
              pSVar1->sel_vector = psVar58;
            }
            pSVar1 = local_1b8.sel;
            if (local_1b8.sel != (SelectionVector *)0x0) {
              psVar58 = (local_1b8.sel)->sel_vector;
              p_Var25 = ((local_1b8.sel)->selection_data).internal.
                        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
              ((local_1b8.sel)->selection_data).internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> =
                   (__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>)0x0;
              if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var25);
              }
              pSVar1->sel_vector = psVar58 + lVar47;
            }
            if ((uVar61 < uVar48) && (uVar48 = uVar61, uVar61 != 0)) {
              uVar31 = 0;
              do {
                sVar44 = (sel_t)uVar31;
                if (local_2a0.sel_vector != (sel_t *)0x0) {
                  sVar44 = local_2a0.sel_vector[uVar31];
                }
                local_3a0.sel_vector[uVar31] = sVar44;
                uVar31 = uVar31 + 1;
              } while (uVar61 != uVar31);
              psVar58 = (local_198.sel)->sel_vector;
              uVar31 = 0;
              do {
                uVar60 = uVar31;
                if (local_3a0.sel_vector != (sel_t *)0x0) {
                  uVar60 = (ulong)local_3a0.sel_vector[uVar31];
                }
                if (psVar58 != (sel_t *)0x0) {
                  uVar60 = (ulong)psVar58[uVar60];
                }
                local_3b8.sel_vector[uVar31] = (int)uVar60 * iVar56 + iVar42;
                uVar31 = uVar31 + 1;
              } while (uVar61 != uVar31);
              puVar5 = ((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)->
                       validity_mask;
              uVar31 = 0;
              do {
                uVar60 = uVar31;
                if (local_3a0.sel_vector != (sel_t *)0x0) {
                  uVar60 = (ulong)local_3a0.sel_vector[uVar31];
                }
                if (puVar5 != (unsigned_long *)0x0) {
                  uVar60 = (ulong)*(uint *)((long)puVar5 + uVar60 * 4);
                }
                *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_380.sel_vector)->
                                validity_mask + uVar31 * 4) = (int)uVar60 * iVar56 + iVar42;
                uVar31 = uVar31 + 1;
              } while (uVar61 != uVar31);
            }
            iVar29 = TemplatedDistinctSelectOperation<duckdb::DistinctGreaterThan>
                               (&local_288,(Vector *)local_328,&local_3a0,uVar48,&local_2a0,
                                &local_2b8,local_4d8);
            ExtractNestedMask(&local_3a0,uVar48,(SelectionVector *)(local_368 + 0x28),local_4d8.ptr,
                              local_3c0);
            if (iVar29 != 0) {
              oVar30.ptr = &local_2a0;
              if (uVar48 == iVar29) {
                oVar30.ptr = &local_3a0;
              }
              ExtractNestedSelection
                        (oVar30.ptr,iVar29,(SelectionVector *)(local_368 + 0x28),&local_150);
              local_4d0 = (sel_t *)((long)local_4d0 + iVar29);
              uVar48 = uVar48 - iVar29;
              if (uVar48 != 0) {
                uVar31 = 0;
                do {
                  sVar44 = (sel_t)uVar31;
                  if (local_2b8.sel_vector != (sel_t *)0x0) {
                    sVar44 = local_2b8.sel_vector[uVar31];
                  }
                  local_3a0.sel_vector[uVar31] = sVar44;
                  uVar31 = uVar31 + 1;
                } while (uVar48 != uVar31);
                psVar58 = (local_198.sel)->sel_vector;
                uVar31 = 0;
                do {
                  uVar61 = uVar31;
                  if (local_3a0.sel_vector != (sel_t *)0x0) {
                    uVar61 = (ulong)local_3a0.sel_vector[uVar31];
                  }
                  if (psVar58 != (sel_t *)0x0) {
                    uVar61 = (ulong)psVar58[uVar61];
                  }
                  local_3b8.sel_vector[uVar31] = (int)uVar61 * iVar56 + iVar42;
                  uVar31 = uVar31 + 1;
                } while (uVar48 != uVar31);
                puVar5 = ((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)->
                         validity_mask;
                uVar31 = 0;
                do {
                  uVar61 = uVar31;
                  if (local_3a0.sel_vector != (sel_t *)0x0) {
                    uVar61 = (ulong)local_3a0.sel_vector[uVar31];
                  }
                  if (puVar5 != (unsigned_long *)0x0) {
                    uVar61 = (ulong)*(uint *)((long)puVar5 + uVar61 * 4);
                  }
                  *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_380.sel_vector)->
                                  validity_mask + uVar31 * 4) = (int)uVar61 * iVar56 + iVar42;
                  uVar31 = uVar31 + 1;
                } while (uVar48 != uVar31);
              }
            }
            iVar29 = TemplatedDistinctSelectOperation<duckdb::DistinctFrom>
                               (&local_288,(Vector *)local_328,&local_3a0,uVar48,&local_2b8,
                                &local_2a0,local_3c0);
            ExtractNestedMask(&local_3a0,uVar48,(SelectionVector *)(local_368 + 0x28),local_4d8.ptr,
                              local_3c0);
            uVar48 = uVar48 - iVar29;
            oVar46.ptr = &local_2b8;
            if (uVar48 == 0) {
              oVar46.ptr = &local_3a0;
            }
            ExtractNestedSelection
                      (oVar46.ptr,iVar29,(SelectionVector *)(local_368 + 0x28),&local_1b8);
            if (iVar29 != 0 && uVar48 != 0) {
              uVar31 = 0;
              do {
                uVar61 = uVar31;
                if (local_2a0.sel_vector != (sel_t *)0x0) {
                  uVar61 = (ulong)local_2a0.sel_vector[uVar31];
                }
                local_3a0.sel_vector[uVar31] = (sel_t)uVar61;
                uVar31 = uVar31 + 1;
              } while (uVar48 != uVar31);
            }
            iVar23 = iVar23 + 1;
          } while (uVar48 != 0);
          goto LAB_00b59e8f;
        }
      }
LAB_00b56087:
      local_4d0 = (sel_t *)0x0;
    }
LAB_00b5a051:
    local_4d0 = (sel_t *)((long)local_4d0 + local_4b0);
    if ((local_210.ptr != (SelectionVector *)0x0) &&
       (optional_ptr<duckdb::SelectionVector,_true>::CheckValid(&local_210),
       local_4d0 != (sel_t *)0x0)) {
      psVar58 = (local_210.ptr)->sel_vector;
      psVar33 = (sel_t *)0x0;
      do {
        sVar44 = (sel_t)psVar33;
        if (local_118.sel_vector != (sel_t *)0x0) {
          sVar44 = local_118.sel_vector[(long)psVar33];
        }
        psVar58[(long)psVar33] = sVar44;
        psVar33 = (sel_t *)((long)psVar33 + 1);
      } while (local_4d0 != psVar33);
    }
    if (local_218.ptr != (SelectionVector *)0x0) {
      optional_ptr<duckdb::SelectionVector,_true>::CheckValid(&local_218);
      if ((sel_t *)count != local_4d0) {
        psVar58 = (local_218.ptr)->sel_vector;
        lVar47 = 0;
        do {
          sVar44 = (sel_t)lVar47;
          if (local_130.sel_vector != (sel_t *)0x0) {
            sVar44 = local_130.sel_vector[lVar47];
          }
          psVar58[lVar47] = sVar44;
          lVar47 = lVar47 + 1;
        } while (count - (long)local_4d0 != lVar47);
      }
    }
    if (local_98.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_98.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType(&local_98.type);
    if (local_100.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_100.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_100.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_100.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType(&local_100.type);
    if (local_330 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_330);
    }
    if (local_1b8.vec.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1b8.vec.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_130.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_130.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_150.vec.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_150.vec.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    goto LAB_00b60d3c;
  }
LAB_00b5dfe5:
  local_4d0 = (sel_t *)0x0;
  local_118.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       LStack_4a0.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_00b60d3c:
  if ((element_type *)
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    return (idx_t)local_4d0;
  }
  return (idx_t)local_4d0;
}

Assistant:

static idx_t TemplatedDistinctSelectOperation(Vector &left, Vector &right, optional_ptr<const SelectionVector> sel,
                                              idx_t count, optional_ptr<SelectionVector> true_sel,
                                              optional_ptr<SelectionVector> false_sel,
                                              optional_ptr<ValidityMask> null_mask) {

	switch (left.GetType().InternalType()) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		return DistinctSelect<int8_t, int8_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                          null_mask);
	case PhysicalType::INT16:
		return DistinctSelect<int16_t, int16_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::INT32:
		return DistinctSelect<int32_t, int32_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::INT64:
		return DistinctSelect<int64_t, int64_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::UINT8:
		return DistinctSelect<uint8_t, uint8_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::UINT16:
		return DistinctSelect<uint16_t, uint16_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::UINT32:
		return DistinctSelect<uint32_t, uint32_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::UINT64:
		return DistinctSelect<uint64_t, uint64_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::INT128:
		return DistinctSelect<hugeint_t, hugeint_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                                null_mask);
	case PhysicalType::UINT128:
		return DistinctSelect<uhugeint_t, uhugeint_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                  false_sel.get(), null_mask);
	case PhysicalType::FLOAT:
		return DistinctSelect<float, float, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                        null_mask);
	case PhysicalType::DOUBLE:
		return DistinctSelect<double, double, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                          null_mask);
	case PhysicalType::INTERVAL:
		return DistinctSelect<interval_t, interval_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                  false_sel.get(), null_mask);
	case PhysicalType::VARCHAR:
		return DistinctSelect<string_t, string_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::STRUCT:
	case PhysicalType::LIST:
	case PhysicalType::ARRAY:
		return DistinctSelectNested<OP>(left, right, sel, count, true_sel, false_sel, null_mask);
	default:
		throw InternalException("Invalid type for distinct selection");
	}
}